

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp_x86_avx512::forward
          (BinaryOp_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined1 (*pauVar1) [16];
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  __m512 y_00;
  __m512 y_01;
  __m512 y_02;
  __m512 y_03;
  __m512 y_04;
  __m512 y_05;
  __m512 y_06;
  __m512 y_07;
  __m512 x;
  __m512 x_00;
  __m512 x_01;
  __m512 x_02;
  __m512 x_03;
  __m512 x_04;
  __m512 x_05;
  __m512 x_06;
  Mat *b;
  bool bVar29;
  bool bVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  uint uVar35;
  int iVar36;
  Option *opt_00;
  ulong uVar37;
  ulong uVar38;
  int iVar39;
  uint uVar40;
  int iVar41;
  ulong uVar42;
  uint *puVar43;
  int y;
  int iVar44;
  uint uVar45;
  undefined1 (*pauVar46) [64];
  int iVar47;
  uint *puVar48;
  Mat *pMVar49;
  uint uVar50;
  undefined1 (*pauVar52) [64];
  binary_op_atan2 *__return_storage_ptr__;
  float *pfVar53;
  undefined4 *puVar54;
  Mat *m;
  int z;
  undefined1 auVar71 [16];
  uint uVar55;
  long lVar56;
  long lVar57;
  int iVar58;
  float *pfVar59;
  undefined8 *puVar60;
  int iVar61;
  uint uVar62;
  long lVar63;
  float *pfVar64;
  undefined1 (*pauVar65) [64];
  long lVar66;
  undefined1 (*pauVar67) [64];
  undefined1 (*pauVar68) [32];
  ulong uVar69;
  undefined1 (*pauVar70) [64];
  undefined1 auVar72 [32];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined8 uVar121;
  undefined8 uVar122;
  undefined8 uVar123;
  float fVar75;
  float fVar76;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar77;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar78 [16];
  undefined8 uVar125;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined8 uVar126;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined8 uVar127;
  undefined8 uVar128;
  undefined8 uVar129;
  undefined8 uVar130;
  undefined1 auVar124 [56];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar137 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  __m128 afVar154;
  binary_op_rpow op_1;
  __m128 _b;
  __m256 _b_avx;
  __m128 _b_1;
  binary_op_ratan2 op;
  undefined1 in_stack_fffffffffffffe00 [16];
  undefined4 uVar155;
  undefined8 in_stack_fffffffffffffe18;
  undefined4 uVar156;
  undefined4 uVar157;
  undefined4 in_stack_fffffffffffffe24;
  undefined4 uVar158;
  Mat *pMVar159;
  undefined4 uVar160;
  float in_stack_fffffffffffffe3c;
  undefined8 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined8 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 uVar161;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  undefined8 in_stack_fffffffffffffe78;
  float local_180 [2];
  float afStack_178 [2];
  float afStack_170 [2];
  float afStack_168 [2];
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  __m512 local_140;
  float local_100 [2];
  float afStack_f8 [2];
  float afStack_f0 [2];
  float afStack_e8 [2];
  float afStack_e0 [2];
  float afStack_d8 [2];
  float afStack_d0 [2];
  float afStack_c8 [2];
  binary_op_ratan2 local_c0 [8];
  float afStack_b8 [2];
  float afStack_b0 [2];
  float afStack_a8 [6];
  binary_op_ratan2 local_90 [8];
  float afStack_88 [22];
  binary_op_ratan2 *pbVar51;
  
  pMVar159 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
  uVar123._0_4_ = pMVar159[1].d;
  uVar123._4_4_ = pMVar159[1].c;
  auVar78._8_8_ = uVar123;
  auVar78._0_8_ = uVar123;
  auVar71._0_4_ = pMVar159[1].w;
  auVar71._4_4_ = pMVar159[1].h;
  auVar71._8_4_ = pMVar159[1].d;
  auVar71._12_4_ = pMVar159[1].c;
  auVar71 = vpmulld_avx(auVar78,auVar71);
  auVar78 = vpshufd_avx(auVar71,0x55);
  auVar138 = ZEXT1664(auVar78);
  auVar71 = vpmulld_avx(auVar71,auVar78);
  iVar47 = auVar71._0_4_ * pMVar159[1].elempack;
  b = pMVar159 + 1;
  if (((pMVar159->dims < pMVar159[1].dims) && (iVar47 != 1)) ||
     (pMVar159->c * pMVar159->elempack * pMVar159->d * pMVar159->h * pMVar159->w < iVar47)) {
    uVar35 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_avx512[-3]);
    switch(uVar35) {
    case 1:
      uVar35 = 7;
      break;
    case 3:
      uVar35 = 8;
      break;
    case 6:
      uVar35 = 9;
      break;
    case 7:
      uVar35 = 1;
      break;
    case 8:
      uVar35 = 3;
      break;
    case 9:
      uVar35 = 6;
      break;
    case 10:
      uVar35 = 0xb;
      break;
    case 0xb:
      uVar35 = 10;
    }
    m = b;
    b = pMVar159;
  }
  else {
    uVar35 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_avx512[-3]);
    m = pMVar159;
  }
  pMVar159 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
  Mat::create_like(pMVar159,m,opt->blob_allocator);
  iVar47 = -100;
  uVar160 = 0xffffffff;
  if (pMVar159->data == (void *)0x0) {
    return -100;
  }
  if ((long)pMVar159->c * pMVar159->cstep == 0) {
    return -100;
  }
  iVar61 = b->elempack;
  uVar55 = b->w;
  iVar44 = b->h;
  uVar155 = 0;
  iVar58 = b->d;
  iVar31 = iVar44 * uVar55 * iVar58;
  uVar40 = b->c;
  uVar50 = uVar40 * iVar61 * iVar31;
  pbVar51 = (binary_op_ratan2 *)(ulong)uVar50;
  uVar42 = (ulong)uVar35;
  if (uVar50 != 1) {
    uVar50 = m->dims;
    pbVar51 = (binary_op_ratan2 *)(ulong)uVar50;
    uVar45 = b->dims;
    if ((((uVar50 != uVar45) || (m->w != uVar55)) ||
        ((m->h != iVar44 || ((m->d != iVar58 || (m->c != uVar40)))))) || (m->elempack != iVar61)) {
      if ((int)uVar45 < (int)uVar50) {
LAB_0034dd02:
        binary_op_broadcast_inner(m,b,pMVar159,uVar35,(Option *)(ulong)uVar45);
        goto switchD_0034de27_default;
      }
      if (uVar50 == 2) {
        if ((uVar55 == 1) && (iVar44 == m->h)) goto LAB_0034dd02;
LAB_0034dd81:
        bVar29 = false;
LAB_0034dd84:
        bVar30 = false;
      }
      else {
        if (uVar50 == 4) {
          bVar29 = true;
          if ((uVar55 == 1) &&
             (((iVar44 == 1 &&
               (((iVar58 == 1 && (uVar40 == m->c)) || ((iVar58 == m->d && (uVar40 == m->c)))))) ||
              (((iVar44 == m->h && (iVar58 == m->d)) && (uVar40 == m->c)))))) goto LAB_0034dd02;
          goto LAB_0034dd84;
        }
        if (uVar50 != 3) goto LAB_0034dd81;
        bVar30 = true;
        if ((uVar55 == 1) &&
           (((iVar44 == 1 && (uVar40 == m->c)) || ((iVar44 == m->h && (uVar40 == m->c))))))
        goto LAB_0034dd02;
        bVar29 = false;
      }
      if ((iVar61 == 1) &&
         (((((uVar50 == 2 && (iVar44 == 1)) && (uVar55 == m->w)) ||
           ((bVar30 &&
            ((((uVar40 == 1 && (iVar44 == 1)) && (uVar55 == m->w)) ||
             (((uVar55 == m->w && (uVar40 == 1)) && (iVar44 == m->h)))))))) ||
          ((bVar29 &&
           (((((uVar40 == 1 && (iVar58 == 1)) && (iVar44 == 1)) && (uVar55 == m->w)) ||
            ((uVar55 == m->w &&
             ((((uVar40 == 1 && (iVar58 == 1)) && (iVar44 == m->h)) ||
              (((iVar44 == m->h && (uVar40 == 1)) && (iVar58 == m->d)))))))))))))) {
        iVar47 = 0;
        uVar160 = 0;
        switch(uVar42) {
        case 0:
          iVar47 = m->elempack;
          uVar35 = m->h;
          uVar40 = m->d;
          uVar45 = m->c;
          if (uVar50 == 2) {
            uVar42 = 0;
            uVar50 = 0;
            if (0 < (int)uVar55) {
              uVar50 = uVar55;
            }
            uVar37 = 0;
            if (0 < (int)uVar35) {
              uVar37 = (ulong)uVar35;
            }
            for (; uVar42 != uVar37; uVar42 = uVar42 + 1) {
              pauVar67 = (undefined1 (*) [64])((long)m->w * uVar42 * m->elemsize + (long)m->data);
              pauVar52 = (undefined1 (*) [64])
                         ((long)pMVar159->w * uVar42 * pMVar159->elemsize + (long)pMVar159->data);
              pfVar59 = (float *)b->data;
              uVar62 = uVar50;
              if (iVar47 == 0x10) {
                while (uVar62 != 0) {
                  auVar138 = vbroadcastss_avx512f(ZEXT416((uint)*pfVar59));
                  auVar138 = vaddps_avx512f(auVar138,*pauVar67);
                  *pauVar52 = auVar138;
                  pauVar67 = pauVar67 + 1;
                  pfVar59 = pfVar59 + 1;
                  pauVar52 = pauVar52 + 1;
                  uVar62 = uVar62 - 1;
                }
              }
              uVar62 = uVar50;
              if (iVar47 == 8) {
                while (uVar62 != 0) {
                  fVar77 = *pfVar59;
                  auVar99._0_4_ = fVar77 + *(float *)*pauVar67;
                  auVar99._4_4_ = fVar77 + *(float *)(*pauVar67 + 4);
                  auVar99._8_4_ = fVar77 + *(float *)(*pauVar67 + 8);
                  auVar99._12_4_ = fVar77 + *(float *)(*pauVar67 + 0xc);
                  auVar99._16_4_ = fVar77 + *(float *)(*pauVar67 + 0x10);
                  auVar99._20_4_ = fVar77 + *(float *)(*pauVar67 + 0x14);
                  auVar99._24_4_ = fVar77 + *(float *)(*pauVar67 + 0x18);
                  auVar99._28_4_ = fVar77 + *(float *)(*pauVar67 + 0x1c);
                  *(undefined1 (*) [32])*pauVar52 = auVar99;
                  pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
                  pfVar59 = pfVar59 + 1;
                  pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x20);
                  uVar62 = uVar62 - 1;
                }
              }
              uVar62 = uVar50;
              if (iVar47 == 4) {
                while (uVar62 != 0) {
                  fVar77 = *pfVar59;
                  auVar80._0_4_ = fVar77 + *(float *)*pauVar67;
                  auVar80._4_4_ = fVar77 + *(float *)(*pauVar67 + 4);
                  auVar80._8_4_ = fVar77 + *(float *)(*pauVar67 + 8);
                  auVar80._12_4_ = fVar77 + *(float *)(*pauVar67 + 0xc);
                  *(undefined1 (*) [16])*pauVar52 = auVar80;
                  pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
                  pfVar59 = pfVar59 + 1;
                  pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x10);
                  uVar62 = uVar62 - 1;
                }
              }
              if (iVar47 == 1) {
                for (lVar63 = 0; uVar50 != (uint)lVar63; lVar63 = lVar63 + 1) {
                  *(float *)((long)*pauVar52 + lVar63 * 4) =
                       pfVar59[lVar63] + *(float *)(*pauVar67 + lVar63 * 4);
                }
              }
            }
            uVar50 = m->dims;
          }
          if (1 < uVar50 - 3) {
            return 0;
          }
          uVar42 = (ulong)uVar55;
          if ((int)uVar55 < 1) {
            uVar42 = 0;
          }
          if ((int)uVar35 < 1) {
            uVar35 = 0;
          }
          if ((int)uVar40 < 1) {
            uVar40 = 0;
          }
          uVar37 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pauVar67 = (undefined1 (*) [64])(m->cstep * uVar38 * m->elemsize + (long)m->data);
            pauVar52 = (undefined1 (*) [64])
                       (pMVar159->cstep * uVar38 * pMVar159->elemsize + (long)pMVar159->data);
            for (uVar55 = 0; uVar55 != uVar40; uVar55 = uVar55 + 1) {
              uVar50 = b->d - 1;
              if ((int)uVar55 <= (int)uVar50) {
                uVar50 = uVar55;
              }
              for (uVar45 = 0; uVar45 != uVar35; uVar45 = uVar45 + 1) {
                uVar62 = b->h - 1;
                if ((int)uVar45 <= (int)uVar62) {
                  uVar62 = uVar45;
                }
                lVar63 = (long)b->w * b->elemsize;
                pfVar59 = (float *)((long)b->data +
                                   (int)uVar62 * lVar63 + (long)b->h * (long)(int)uVar50 * lVar63);
                uVar69 = uVar42;
                if (iVar47 == 0x10) {
                  while ((int)uVar69 != 0) {
                    auVar138 = vbroadcastss_avx512f(ZEXT416((uint)*pfVar59));
                    auVar138 = vaddps_avx512f(auVar138,*pauVar67);
                    *pauVar52 = auVar138;
                    pauVar67 = pauVar67 + 1;
                    pfVar59 = pfVar59 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar69 = (ulong)((int)uVar69 - 1);
                  }
                }
                uVar69 = uVar42;
                if (iVar47 == 8) {
                  while ((int)uVar69 != 0) {
                    fVar77 = *pfVar59;
                    auVar109._0_4_ = fVar77 + *(float *)*pauVar67;
                    auVar109._4_4_ = fVar77 + *(float *)(*pauVar67 + 4);
                    auVar109._8_4_ = fVar77 + *(float *)(*pauVar67 + 8);
                    auVar109._12_4_ = fVar77 + *(float *)(*pauVar67 + 0xc);
                    auVar109._16_4_ = fVar77 + *(float *)(*pauVar67 + 0x10);
                    auVar109._20_4_ = fVar77 + *(float *)(*pauVar67 + 0x14);
                    auVar109._24_4_ = fVar77 + *(float *)(*pauVar67 + 0x18);
                    auVar109._28_4_ = fVar77 + *(float *)(*pauVar67 + 0x1c);
                    *(undefined1 (*) [32])*pauVar52 = auVar109;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
                    pfVar59 = pfVar59 + 1;
                    pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x20);
                    uVar69 = (ulong)((int)uVar69 - 1);
                  }
                }
                uVar69 = uVar42;
                if (iVar47 == 4) {
                  while ((int)uVar69 != 0) {
                    fVar77 = *pfVar59;
                    auVar93._0_4_ = fVar77 + *(float *)*pauVar67;
                    auVar93._4_4_ = fVar77 + *(float *)(*pauVar67 + 4);
                    auVar93._8_4_ = fVar77 + *(float *)(*pauVar67 + 8);
                    auVar93._12_4_ = fVar77 + *(float *)(*pauVar67 + 0xc);
                    *(undefined1 (*) [16])*pauVar52 = auVar93;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
                    pfVar59 = pfVar59 + 1;
                    pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x10);
                    uVar69 = (ulong)((int)uVar69 - 1);
                  }
                }
                if (iVar47 == 1) {
                  lVar56 = 0;
                  for (lVar63 = 0; (int)uVar42 != (int)lVar63; lVar63 = lVar63 + 1) {
                    *(float *)((long)*pauVar52 + lVar63 * 4) =
                         pfVar59[lVar63] + *(float *)(*pauVar67 + lVar63 * 4);
                    lVar56 = lVar56 + -4;
                  }
                  pauVar67 = (undefined1 (*) [64])((long)pauVar67 - lVar56);
                  pauVar52 = (undefined1 (*) [64])((long)pauVar52 - lVar56);
                }
              }
            }
          }
          return 0;
        case 1:
          iVar47 = m->elempack;
          uVar35 = m->h;
          uVar40 = m->d;
          uVar45 = m->c;
          if (uVar50 == 2) {
            uVar42 = 0;
            uVar50 = 0;
            if (0 < (int)uVar55) {
              uVar50 = uVar55;
            }
            uVar37 = 0;
            if (0 < (int)uVar35) {
              uVar37 = (ulong)uVar35;
            }
            for (; uVar42 != uVar37; uVar42 = uVar42 + 1) {
              pauVar67 = (undefined1 (*) [64])((long)m->w * uVar42 * m->elemsize + (long)m->data);
              pauVar52 = (undefined1 (*) [64])
                         ((long)pMVar159->w * uVar42 * pMVar159->elemsize + (long)pMVar159->data);
              puVar54 = (undefined4 *)b->data;
              uVar62 = uVar50;
              if (iVar47 == 0x10) {
                while (uVar62 != 0) {
                  uVar160 = *puVar54;
                  auVar22._4_4_ = uVar160;
                  auVar22._0_4_ = uVar160;
                  auVar22._8_4_ = uVar160;
                  auVar22._12_4_ = uVar160;
                  auVar22._16_4_ = uVar160;
                  auVar22._20_4_ = uVar160;
                  auVar22._24_4_ = uVar160;
                  auVar22._28_4_ = uVar160;
                  auVar22._32_4_ = uVar160;
                  auVar22._36_4_ = uVar160;
                  auVar22._40_4_ = uVar160;
                  auVar22._44_4_ = uVar160;
                  auVar22._48_4_ = uVar160;
                  auVar22._52_4_ = uVar160;
                  auVar22._56_4_ = uVar160;
                  auVar22._60_4_ = uVar160;
                  auVar138 = vsubps_avx512f(*pauVar67,auVar22);
                  *pauVar52 = auVar138;
                  pauVar67 = pauVar67 + 1;
                  puVar54 = puVar54 + 1;
                  pauVar52 = pauVar52 + 1;
                  uVar62 = uVar62 - 1;
                }
              }
              uVar62 = uVar50;
              if (iVar47 == 8) {
                while (uVar62 != 0) {
                  uVar160 = *puVar54;
                  auVar16._4_4_ = uVar160;
                  auVar16._0_4_ = uVar160;
                  auVar16._8_4_ = uVar160;
                  auVar16._12_4_ = uVar160;
                  auVar16._16_4_ = uVar160;
                  auVar16._20_4_ = uVar160;
                  auVar16._24_4_ = uVar160;
                  auVar16._28_4_ = uVar160;
                  auVar72 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar67,auVar16);
                  *(undefined1 (*) [32])*pauVar52 = auVar72;
                  pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
                  puVar54 = puVar54 + 1;
                  pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x20);
                  uVar62 = uVar62 - 1;
                }
              }
              uVar62 = uVar50;
              if (iVar47 == 4) {
                while (uVar62 != 0) {
                  uVar160 = *puVar54;
                  auVar10._4_4_ = uVar160;
                  auVar10._0_4_ = uVar160;
                  auVar10._8_4_ = uVar160;
                  auVar10._12_4_ = uVar160;
                  auVar71 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar67,auVar10);
                  *(undefined1 (*) [16])*pauVar52 = auVar71;
                  pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
                  puVar54 = puVar54 + 1;
                  pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x10);
                  uVar62 = uVar62 - 1;
                }
              }
              if (iVar47 == 1) {
                for (lVar63 = 0; uVar50 != (uint)lVar63; lVar63 = lVar63 + 1) {
                  *(float *)((long)*pauVar52 + lVar63 * 4) =
                       *(float *)(*pauVar67 + lVar63 * 4) - (float)puVar54[lVar63];
                }
              }
            }
            uVar50 = m->dims;
          }
          if (1 < uVar50 - 3) {
            return 0;
          }
          uVar42 = (ulong)uVar55;
          if ((int)uVar55 < 1) {
            uVar42 = 0;
          }
          if ((int)uVar35 < 1) {
            uVar35 = 0;
          }
          if ((int)uVar40 < 1) {
            uVar40 = 0;
          }
          uVar37 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pauVar67 = (undefined1 (*) [64])(m->cstep * uVar38 * m->elemsize + (long)m->data);
            pauVar52 = (undefined1 (*) [64])
                       (pMVar159->cstep * uVar38 * pMVar159->elemsize + (long)pMVar159->data);
            for (uVar55 = 0; uVar55 != uVar40; uVar55 = uVar55 + 1) {
              uVar50 = b->d - 1;
              if ((int)uVar55 <= (int)uVar50) {
                uVar50 = uVar55;
              }
              for (uVar45 = 0; uVar45 != uVar35; uVar45 = uVar45 + 1) {
                uVar62 = b->h - 1;
                if ((int)uVar45 <= (int)uVar62) {
                  uVar62 = uVar45;
                }
                lVar63 = (long)b->w * b->elemsize;
                puVar54 = (undefined4 *)
                          ((long)b->data +
                          (int)uVar62 * lVar63 + (long)b->h * (long)(int)uVar50 * lVar63);
                uVar69 = uVar42;
                if (iVar47 == 0x10) {
                  while ((int)uVar69 != 0) {
                    uVar160 = *puVar54;
                    auVar23._4_4_ = uVar160;
                    auVar23._0_4_ = uVar160;
                    auVar23._8_4_ = uVar160;
                    auVar23._12_4_ = uVar160;
                    auVar23._16_4_ = uVar160;
                    auVar23._20_4_ = uVar160;
                    auVar23._24_4_ = uVar160;
                    auVar23._28_4_ = uVar160;
                    auVar23._32_4_ = uVar160;
                    auVar23._36_4_ = uVar160;
                    auVar23._40_4_ = uVar160;
                    auVar23._44_4_ = uVar160;
                    auVar23._48_4_ = uVar160;
                    auVar23._52_4_ = uVar160;
                    auVar23._56_4_ = uVar160;
                    auVar23._60_4_ = uVar160;
                    auVar138 = vsubps_avx512f(*pauVar67,auVar23);
                    *pauVar52 = auVar138;
                    pauVar67 = pauVar67 + 1;
                    puVar54 = puVar54 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar69 = (ulong)((int)uVar69 - 1);
                  }
                }
                uVar69 = uVar42;
                if (iVar47 == 8) {
                  while ((int)uVar69 != 0) {
                    uVar160 = *puVar54;
                    auVar17._4_4_ = uVar160;
                    auVar17._0_4_ = uVar160;
                    auVar17._8_4_ = uVar160;
                    auVar17._12_4_ = uVar160;
                    auVar17._16_4_ = uVar160;
                    auVar17._20_4_ = uVar160;
                    auVar17._24_4_ = uVar160;
                    auVar17._28_4_ = uVar160;
                    auVar72 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar67,auVar17);
                    *(undefined1 (*) [32])*pauVar52 = auVar72;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
                    puVar54 = puVar54 + 1;
                    pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x20);
                    uVar69 = (ulong)((int)uVar69 - 1);
                  }
                }
                uVar69 = uVar42;
                if (iVar47 == 4) {
                  while ((int)uVar69 != 0) {
                    uVar160 = *puVar54;
                    auVar11._4_4_ = uVar160;
                    auVar11._0_4_ = uVar160;
                    auVar11._8_4_ = uVar160;
                    auVar11._12_4_ = uVar160;
                    auVar71 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar67,auVar11);
                    *(undefined1 (*) [16])*pauVar52 = auVar71;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
                    puVar54 = puVar54 + 1;
                    pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x10);
                    uVar69 = (ulong)((int)uVar69 - 1);
                  }
                }
                if (iVar47 == 1) {
                  lVar56 = 0;
                  for (lVar63 = 0; (int)uVar42 != (int)lVar63; lVar63 = lVar63 + 1) {
                    *(float *)((long)*pauVar52 + lVar63 * 4) =
                         *(float *)(*pauVar67 + lVar63 * 4) - (float)puVar54[lVar63];
                    lVar56 = lVar56 + -4;
                  }
                  pauVar67 = (undefined1 (*) [64])((long)pauVar67 - lVar56);
                  pauVar52 = (undefined1 (*) [64])((long)pauVar52 - lVar56);
                }
              }
            }
          }
          return 0;
        case 2:
          iVar47 = m->elempack;
          uVar35 = m->h;
          uVar40 = m->d;
          uVar45 = m->c;
          if (uVar50 == 2) {
            uVar42 = 0;
            uVar50 = 0;
            if (0 < (int)uVar55) {
              uVar50 = uVar55;
            }
            uVar37 = 0;
            if (0 < (int)uVar35) {
              uVar37 = (ulong)uVar35;
            }
            for (; uVar42 != uVar37; uVar42 = uVar42 + 1) {
              pauVar67 = (undefined1 (*) [64])((long)m->w * uVar42 * m->elemsize + (long)m->data);
              pauVar52 = (undefined1 (*) [64])
                         ((long)pMVar159->w * uVar42 * pMVar159->elemsize + (long)pMVar159->data);
              pfVar59 = (float *)b->data;
              uVar62 = uVar50;
              if (iVar47 == 0x10) {
                while (uVar62 != 0) {
                  auVar138 = vbroadcastss_avx512f(ZEXT416((uint)*pfVar59));
                  auVar138 = vmulps_avx512f(auVar138,*pauVar67);
                  *pauVar52 = auVar138;
                  pauVar67 = pauVar67 + 1;
                  pfVar59 = pfVar59 + 1;
                  pauVar52 = pauVar52 + 1;
                  uVar62 = uVar62 - 1;
                }
              }
              uVar62 = uVar50;
              if (iVar47 == 8) {
                while (uVar62 != 0) {
                  fVar77 = *pfVar59;
                  auVar24._4_4_ = fVar77 * *(float *)(*pauVar67 + 4);
                  auVar24._0_4_ = fVar77 * *(float *)*pauVar67;
                  auVar24._8_4_ = fVar77 * *(float *)(*pauVar67 + 8);
                  auVar24._12_4_ = fVar77 * *(float *)(*pauVar67 + 0xc);
                  auVar24._16_4_ = fVar77 * *(float *)(*pauVar67 + 0x10);
                  auVar24._20_4_ = fVar77 * *(float *)(*pauVar67 + 0x14);
                  auVar24._24_4_ = fVar77 * *(float *)(*pauVar67 + 0x18);
                  auVar24._28_4_ = fVar77;
                  *(undefined1 (*) [32])*pauVar52 = auVar24;
                  pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
                  pfVar59 = pfVar59 + 1;
                  pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x20);
                  uVar62 = uVar62 - 1;
                }
              }
              uVar62 = uVar50;
              if (iVar47 == 4) {
                while (uVar62 != 0) {
                  fVar77 = *pfVar59;
                  auVar85._0_4_ = fVar77 * *(float *)*pauVar67;
                  auVar85._4_4_ = fVar77 * *(float *)(*pauVar67 + 4);
                  auVar85._8_4_ = fVar77 * *(float *)(*pauVar67 + 8);
                  auVar85._12_4_ = fVar77 * *(float *)(*pauVar67 + 0xc);
                  *(undefined1 (*) [16])*pauVar52 = auVar85;
                  pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
                  pfVar59 = pfVar59 + 1;
                  pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x10);
                  uVar62 = uVar62 - 1;
                }
              }
              if (iVar47 == 1) {
                for (lVar63 = 0; uVar50 != (uint)lVar63; lVar63 = lVar63 + 1) {
                  *(float *)((long)*pauVar52 + lVar63 * 4) =
                       pfVar59[lVar63] * *(float *)(*pauVar67 + lVar63 * 4);
                }
              }
            }
            uVar50 = m->dims;
          }
          if (1 < uVar50 - 3) {
            return 0;
          }
          uVar42 = (ulong)uVar55;
          if ((int)uVar55 < 1) {
            uVar42 = 0;
          }
          if ((int)uVar35 < 1) {
            uVar35 = 0;
          }
          if ((int)uVar40 < 1) {
            uVar40 = 0;
          }
          uVar37 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pauVar67 = (undefined1 (*) [64])(m->cstep * uVar38 * m->elemsize + (long)m->data);
            pauVar52 = (undefined1 (*) [64])
                       (pMVar159->cstep * uVar38 * pMVar159->elemsize + (long)pMVar159->data);
            for (uVar55 = 0; uVar55 != uVar40; uVar55 = uVar55 + 1) {
              uVar50 = b->d - 1;
              if ((int)uVar55 <= (int)uVar50) {
                uVar50 = uVar55;
              }
              for (uVar45 = 0; uVar45 != uVar35; uVar45 = uVar45 + 1) {
                uVar62 = b->h - 1;
                if ((int)uVar45 <= (int)uVar62) {
                  uVar62 = uVar45;
                }
                lVar63 = (long)b->w * b->elemsize;
                pfVar59 = (float *)((long)b->data +
                                   (int)uVar62 * lVar63 + (long)b->h * (long)(int)uVar50 * lVar63);
                uVar69 = uVar42;
                if (iVar47 == 0x10) {
                  while ((int)uVar69 != 0) {
                    auVar138 = vbroadcastss_avx512f(ZEXT416((uint)*pfVar59));
                    auVar138 = vmulps_avx512f(auVar138,*pauVar67);
                    *pauVar52 = auVar138;
                    pauVar67 = pauVar67 + 1;
                    pfVar59 = pfVar59 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar69 = (ulong)((int)uVar69 - 1);
                  }
                }
                uVar69 = uVar42;
                if (iVar47 == 8) {
                  while ((int)uVar69 != 0) {
                    fVar77 = *pfVar59;
                    auVar26._4_4_ = fVar77 * *(float *)(*pauVar67 + 4);
                    auVar26._0_4_ = fVar77 * *(float *)*pauVar67;
                    auVar26._8_4_ = fVar77 * *(float *)(*pauVar67 + 8);
                    auVar26._12_4_ = fVar77 * *(float *)(*pauVar67 + 0xc);
                    auVar26._16_4_ = fVar77 * *(float *)(*pauVar67 + 0x10);
                    auVar26._20_4_ = fVar77 * *(float *)(*pauVar67 + 0x14);
                    auVar26._24_4_ = fVar77 * *(float *)(*pauVar67 + 0x18);
                    auVar26._28_4_ = fVar77;
                    *(undefined1 (*) [32])*pauVar52 = auVar26;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
                    pfVar59 = pfVar59 + 1;
                    pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x20);
                    uVar69 = (ulong)((int)uVar69 - 1);
                  }
                }
                uVar69 = uVar42;
                if (iVar47 == 4) {
                  while ((int)uVar69 != 0) {
                    fVar77 = *pfVar59;
                    auVar91._0_4_ = fVar77 * *(float *)*pauVar67;
                    auVar91._4_4_ = fVar77 * *(float *)(*pauVar67 + 4);
                    auVar91._8_4_ = fVar77 * *(float *)(*pauVar67 + 8);
                    auVar91._12_4_ = fVar77 * *(float *)(*pauVar67 + 0xc);
                    *(undefined1 (*) [16])*pauVar52 = auVar91;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
                    pfVar59 = pfVar59 + 1;
                    pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x10);
                    uVar69 = (ulong)((int)uVar69 - 1);
                  }
                }
                if (iVar47 == 1) {
                  lVar56 = 0;
                  for (lVar63 = 0; (int)uVar42 != (int)lVar63; lVar63 = lVar63 + 1) {
                    *(float *)((long)*pauVar52 + lVar63 * 4) =
                         pfVar59[lVar63] * *(float *)(*pauVar67 + lVar63 * 4);
                    lVar56 = lVar56 + -4;
                  }
                  pauVar67 = (undefined1 (*) [64])((long)pauVar67 - lVar56);
                  pauVar52 = (undefined1 (*) [64])((long)pauVar52 - lVar56);
                }
              }
            }
          }
          return 0;
        case 3:
          iVar47 = m->elempack;
          uVar35 = m->h;
          uVar40 = m->d;
          uVar45 = m->c;
          if (uVar50 == 2) {
            uVar42 = 0;
            uVar50 = 0;
            if (0 < (int)uVar55) {
              uVar50 = uVar55;
            }
            uVar37 = 0;
            if (0 < (int)uVar35) {
              uVar37 = (ulong)uVar35;
            }
            for (; uVar42 != uVar37; uVar42 = uVar42 + 1) {
              pauVar67 = (undefined1 (*) [64])((long)m->w * uVar42 * m->elemsize + (long)m->data);
              pauVar52 = (undefined1 (*) [64])
                         ((long)pMVar159->w * uVar42 * pMVar159->elemsize + (long)pMVar159->data);
              pfVar59 = (float *)b->data;
              uVar62 = uVar50;
              if (iVar47 == 0x10) {
                while (uVar62 != 0) {
                  auVar138 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / *pfVar59)));
                  auVar138 = vmulps_avx512f(auVar138,*pauVar67);
                  *pauVar52 = auVar138;
                  pauVar67 = pauVar67 + 1;
                  pfVar59 = pfVar59 + 1;
                  pauVar52 = pauVar52 + 1;
                  uVar62 = uVar62 - 1;
                }
              }
              uVar62 = uVar50;
              if (iVar47 == 8) {
                while (uVar62 != 0) {
                  fVar77 = 1.0 / *pfVar59;
                  auVar25._4_4_ = fVar77 * *(float *)(*pauVar67 + 4);
                  auVar25._0_4_ = fVar77 * *(float *)*pauVar67;
                  auVar25._8_4_ = fVar77 * *(float *)(*pauVar67 + 8);
                  auVar25._12_4_ = fVar77 * *(float *)(*pauVar67 + 0xc);
                  auVar25._16_4_ = fVar77 * *(float *)(*pauVar67 + 0x10);
                  auVar25._20_4_ = fVar77 * *(float *)(*pauVar67 + 0x14);
                  auVar25._24_4_ = fVar77 * *(float *)(*pauVar67 + 0x18);
                  auVar25._28_4_ = fVar77;
                  *(undefined1 (*) [32])*pauVar52 = auVar25;
                  pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
                  pfVar59 = pfVar59 + 1;
                  pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x20);
                  uVar62 = uVar62 - 1;
                }
              }
              uVar62 = uVar50;
              if (iVar47 == 4) {
                while (uVar62 != 0) {
                  fVar77 = 1.0 / *pfVar59;
                  auVar133._0_4_ = fVar77 * *(float *)*pauVar67;
                  auVar133._4_4_ = fVar77 * *(float *)(*pauVar67 + 4);
                  auVar133._8_4_ = fVar77 * *(float *)(*pauVar67 + 8);
                  auVar133._12_4_ = fVar77 * *(float *)(*pauVar67 + 0xc);
                  *(undefined1 (*) [16])*pauVar52 = auVar133;
                  pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
                  pfVar59 = pfVar59 + 1;
                  pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x10);
                  uVar62 = uVar62 - 1;
                }
              }
              if (iVar47 == 1) {
                for (lVar63 = 0; uVar50 != (uint)lVar63; lVar63 = lVar63 + 1) {
                  *(float *)((long)*pauVar52 + lVar63 * 4) =
                       *(float *)(*pauVar67 + lVar63 * 4) / pfVar59[lVar63];
                }
              }
            }
            uVar50 = m->dims;
          }
          if (1 < uVar50 - 3) {
            return 0;
          }
          uVar42 = (ulong)uVar55;
          if ((int)uVar55 < 1) {
            uVar42 = 0;
          }
          if ((int)uVar35 < 1) {
            uVar35 = 0;
          }
          if ((int)uVar40 < 1) {
            uVar40 = 0;
          }
          uVar37 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pauVar67 = (undefined1 (*) [64])(m->cstep * uVar38 * m->elemsize + (long)m->data);
            pauVar52 = (undefined1 (*) [64])
                       (pMVar159->cstep * uVar38 * pMVar159->elemsize + (long)pMVar159->data);
            for (uVar55 = 0; uVar55 != uVar40; uVar55 = uVar55 + 1) {
              uVar50 = b->d - 1;
              if ((int)uVar55 <= (int)uVar50) {
                uVar50 = uVar55;
              }
              for (uVar45 = 0; uVar45 != uVar35; uVar45 = uVar45 + 1) {
                uVar62 = b->h - 1;
                if ((int)uVar45 <= (int)uVar62) {
                  uVar62 = uVar45;
                }
                lVar63 = (long)b->w * b->elemsize;
                pfVar59 = (float *)((long)b->data +
                                   (int)uVar62 * lVar63 + (long)b->h * (long)(int)uVar50 * lVar63);
                uVar69 = uVar42;
                if (iVar47 == 0x10) {
                  while ((int)uVar69 != 0) {
                    auVar138 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / *pfVar59)));
                    auVar138 = vmulps_avx512f(auVar138,*pauVar67);
                    *pauVar52 = auVar138;
                    pauVar67 = pauVar67 + 1;
                    pfVar59 = pfVar59 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar69 = (ulong)((int)uVar69 - 1);
                  }
                }
                uVar69 = uVar42;
                if (iVar47 == 8) {
                  while ((int)uVar69 != 0) {
                    fVar77 = 1.0 / *pfVar59;
                    auVar27._4_4_ = fVar77 * *(float *)(*pauVar67 + 4);
                    auVar27._0_4_ = fVar77 * *(float *)*pauVar67;
                    auVar27._8_4_ = fVar77 * *(float *)(*pauVar67 + 8);
                    auVar27._12_4_ = fVar77 * *(float *)(*pauVar67 + 0xc);
                    auVar27._16_4_ = fVar77 * *(float *)(*pauVar67 + 0x10);
                    auVar27._20_4_ = fVar77 * *(float *)(*pauVar67 + 0x14);
                    auVar27._24_4_ = fVar77 * *(float *)(*pauVar67 + 0x18);
                    auVar27._28_4_ = fVar77;
                    *(undefined1 (*) [32])*pauVar52 = auVar27;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
                    pfVar59 = pfVar59 + 1;
                    pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x20);
                    uVar69 = (ulong)((int)uVar69 - 1);
                  }
                }
                uVar69 = uVar42;
                if (iVar47 == 4) {
                  while ((int)uVar69 != 0) {
                    fVar77 = 1.0 / *pfVar59;
                    auVar135._0_4_ = fVar77 * *(float *)*pauVar67;
                    auVar135._4_4_ = fVar77 * *(float *)(*pauVar67 + 4);
                    auVar135._8_4_ = fVar77 * *(float *)(*pauVar67 + 8);
                    auVar135._12_4_ = fVar77 * *(float *)(*pauVar67 + 0xc);
                    *(undefined1 (*) [16])*pauVar52 = auVar135;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
                    pfVar59 = pfVar59 + 1;
                    pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x10);
                    uVar69 = (ulong)((int)uVar69 - 1);
                  }
                }
                if (iVar47 == 1) {
                  lVar56 = 0;
                  for (lVar63 = 0; (int)uVar42 != (int)lVar63; lVar63 = lVar63 + 1) {
                    *(float *)((long)*pauVar52 + lVar63 * 4) =
                         *(float *)(*pauVar67 + lVar63 * 4) / pfVar59[lVar63];
                    lVar56 = lVar56 + -4;
                  }
                  pauVar67 = (undefined1 (*) [64])((long)pauVar67 - lVar56);
                  pauVar52 = (undefined1 (*) [64])((long)pauVar52 - lVar56);
                }
              }
            }
          }
          return 0;
        case 4:
          iVar47 = m->elempack;
          uVar35 = m->h;
          uVar40 = m->d;
          uVar45 = m->c;
          if (uVar50 == 2) {
            uVar42 = 0;
            uVar50 = 0;
            if (0 < (int)uVar55) {
              uVar50 = uVar55;
            }
            uVar37 = 0;
            if (0 < (int)uVar35) {
              uVar37 = (ulong)uVar35;
            }
            for (; uVar42 != uVar37; uVar42 = uVar42 + 1) {
              pauVar67 = (undefined1 (*) [64])((long)m->w * uVar42 * m->elemsize + (long)m->data);
              pauVar52 = (undefined1 (*) [64])
                         ((long)pMVar159->w * uVar42 * pMVar159->elemsize + (long)pMVar159->data);
              puVar54 = (undefined4 *)b->data;
              uVar62 = uVar50;
              if (iVar47 == 0x10) {
                while (uVar62 != 0) {
                  uVar160 = *puVar54;
                  auVar20._4_4_ = uVar160;
                  auVar20._0_4_ = uVar160;
                  auVar20._8_4_ = uVar160;
                  auVar20._12_4_ = uVar160;
                  auVar20._16_4_ = uVar160;
                  auVar20._20_4_ = uVar160;
                  auVar20._24_4_ = uVar160;
                  auVar20._28_4_ = uVar160;
                  auVar20._32_4_ = uVar160;
                  auVar20._36_4_ = uVar160;
                  auVar20._40_4_ = uVar160;
                  auVar20._44_4_ = uVar160;
                  auVar20._48_4_ = uVar160;
                  auVar20._52_4_ = uVar160;
                  auVar20._56_4_ = uVar160;
                  auVar20._60_4_ = uVar160;
                  auVar138 = vmaxps_avx512f(*pauVar67,auVar20);
                  *pauVar52 = auVar138;
                  pauVar67 = pauVar67 + 1;
                  puVar54 = puVar54 + 1;
                  pauVar52 = pauVar52 + 1;
                  uVar62 = uVar62 - 1;
                }
              }
              uVar62 = uVar50;
              if (iVar47 == 8) {
                while (uVar62 != 0) {
                  uVar160 = *puVar54;
                  auVar14._4_4_ = uVar160;
                  auVar14._0_4_ = uVar160;
                  auVar14._8_4_ = uVar160;
                  auVar14._12_4_ = uVar160;
                  auVar14._16_4_ = uVar160;
                  auVar14._20_4_ = uVar160;
                  auVar14._24_4_ = uVar160;
                  auVar14._28_4_ = uVar160;
                  auVar72 = vmaxps_avx512vl(*(undefined1 (*) [32])*pauVar67,auVar14);
                  *(undefined1 (*) [32])*pauVar52 = auVar72;
                  pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
                  puVar54 = puVar54 + 1;
                  pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x20);
                  uVar62 = uVar62 - 1;
                }
              }
              uVar62 = uVar50;
              if (iVar47 == 4) {
                while (uVar62 != 0) {
                  uVar160 = *puVar54;
                  auVar8._4_4_ = uVar160;
                  auVar8._0_4_ = uVar160;
                  auVar8._8_4_ = uVar160;
                  auVar8._12_4_ = uVar160;
                  auVar71 = vmaxps_avx512vl(*(undefined1 (*) [16])*pauVar67,auVar8);
                  *(undefined1 (*) [16])*pauVar52 = auVar71;
                  pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
                  puVar54 = puVar54 + 1;
                  pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x10);
                  uVar62 = uVar62 - 1;
                }
              }
              if (iVar47 == 1) {
                for (lVar63 = 0; uVar50 != (uint)lVar63; lVar63 = lVar63 + 1) {
                  auVar71 = vmaxss_avx(ZEXT416((uint)puVar54[lVar63]),
                                       ZEXT416(*(uint *)(*pauVar67 + lVar63 * 4)));
                  *(int *)((long)*pauVar52 + lVar63 * 4) = auVar71._0_4_;
                }
              }
            }
            uVar50 = m->dims;
          }
          if (1 < uVar50 - 3) {
            return 0;
          }
          uVar42 = (ulong)uVar55;
          if ((int)uVar55 < 1) {
            uVar42 = 0;
          }
          if ((int)uVar35 < 1) {
            uVar35 = 0;
          }
          if ((int)uVar40 < 1) {
            uVar40 = 0;
          }
          uVar37 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pauVar67 = (undefined1 (*) [64])(m->cstep * uVar38 * m->elemsize + (long)m->data);
            pauVar52 = (undefined1 (*) [64])
                       (pMVar159->cstep * uVar38 * pMVar159->elemsize + (long)pMVar159->data);
            for (uVar55 = 0; uVar55 != uVar40; uVar55 = uVar55 + 1) {
              uVar50 = b->d - 1;
              if ((int)uVar55 <= (int)uVar50) {
                uVar50 = uVar55;
              }
              for (uVar45 = 0; uVar45 != uVar35; uVar45 = uVar45 + 1) {
                uVar62 = b->h - 1;
                if ((int)uVar45 <= (int)uVar62) {
                  uVar62 = uVar45;
                }
                lVar63 = (long)b->w * b->elemsize;
                puVar54 = (undefined4 *)
                          ((long)b->data +
                          (int)uVar62 * lVar63 + (long)b->h * (long)(int)uVar50 * lVar63);
                uVar69 = uVar42;
                if (iVar47 == 0x10) {
                  while ((int)uVar69 != 0) {
                    uVar160 = *puVar54;
                    auVar21._4_4_ = uVar160;
                    auVar21._0_4_ = uVar160;
                    auVar21._8_4_ = uVar160;
                    auVar21._12_4_ = uVar160;
                    auVar21._16_4_ = uVar160;
                    auVar21._20_4_ = uVar160;
                    auVar21._24_4_ = uVar160;
                    auVar21._28_4_ = uVar160;
                    auVar21._32_4_ = uVar160;
                    auVar21._36_4_ = uVar160;
                    auVar21._40_4_ = uVar160;
                    auVar21._44_4_ = uVar160;
                    auVar21._48_4_ = uVar160;
                    auVar21._52_4_ = uVar160;
                    auVar21._56_4_ = uVar160;
                    auVar21._60_4_ = uVar160;
                    auVar138 = vmaxps_avx512f(*pauVar67,auVar21);
                    *pauVar52 = auVar138;
                    pauVar67 = pauVar67 + 1;
                    puVar54 = puVar54 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar69 = (ulong)((int)uVar69 - 1);
                  }
                }
                uVar69 = uVar42;
                if (iVar47 == 8) {
                  while ((int)uVar69 != 0) {
                    uVar160 = *puVar54;
                    auVar15._4_4_ = uVar160;
                    auVar15._0_4_ = uVar160;
                    auVar15._8_4_ = uVar160;
                    auVar15._12_4_ = uVar160;
                    auVar15._16_4_ = uVar160;
                    auVar15._20_4_ = uVar160;
                    auVar15._24_4_ = uVar160;
                    auVar15._28_4_ = uVar160;
                    auVar72 = vmaxps_avx512vl(*(undefined1 (*) [32])*pauVar67,auVar15);
                    *(undefined1 (*) [32])*pauVar52 = auVar72;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
                    puVar54 = puVar54 + 1;
                    pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x20);
                    uVar69 = (ulong)((int)uVar69 - 1);
                  }
                }
                uVar69 = uVar42;
                if (iVar47 == 4) {
                  while ((int)uVar69 != 0) {
                    uVar160 = *puVar54;
                    auVar9._4_4_ = uVar160;
                    auVar9._0_4_ = uVar160;
                    auVar9._8_4_ = uVar160;
                    auVar9._12_4_ = uVar160;
                    auVar71 = vmaxps_avx512vl(*(undefined1 (*) [16])*pauVar67,auVar9);
                    *(undefined1 (*) [16])*pauVar52 = auVar71;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
                    puVar54 = puVar54 + 1;
                    pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x10);
                    uVar69 = (ulong)((int)uVar69 - 1);
                  }
                }
                if (iVar47 == 1) {
                  lVar56 = 0;
                  for (lVar63 = 0; (int)uVar42 != (int)lVar63; lVar63 = lVar63 + 1) {
                    auVar71 = vmaxss_avx(ZEXT416((uint)puVar54[lVar63]),
                                         ZEXT416(*(uint *)(*pauVar67 + lVar63 * 4)));
                    *(int *)((long)*pauVar52 + lVar63 * 4) = auVar71._0_4_;
                    lVar56 = lVar56 + -4;
                  }
                  pauVar67 = (undefined1 (*) [64])((long)pauVar67 - lVar56);
                  pauVar52 = (undefined1 (*) [64])((long)pauVar52 - lVar56);
                }
              }
            }
          }
          return 0;
        case 5:
          iVar47 = m->elempack;
          uVar35 = m->h;
          uVar40 = m->d;
          uVar45 = m->c;
          if (uVar50 == 2) {
            uVar42 = 0;
            uVar50 = 0;
            if (0 < (int)uVar55) {
              uVar50 = uVar55;
            }
            uVar37 = 0;
            if (0 < (int)uVar35) {
              uVar37 = (ulong)uVar35;
            }
            for (; uVar42 != uVar37; uVar42 = uVar42 + 1) {
              pauVar67 = (undefined1 (*) [64])((long)m->w * uVar42 * m->elemsize + (long)m->data);
              pauVar52 = (undefined1 (*) [64])
                         ((long)pMVar159->w * uVar42 * pMVar159->elemsize + (long)pMVar159->data);
              puVar54 = (undefined4 *)b->data;
              uVar62 = uVar50;
              if (iVar47 == 0x10) {
                while (uVar62 != 0) {
                  uVar160 = *puVar54;
                  auVar18._4_4_ = uVar160;
                  auVar18._0_4_ = uVar160;
                  auVar18._8_4_ = uVar160;
                  auVar18._12_4_ = uVar160;
                  auVar18._16_4_ = uVar160;
                  auVar18._20_4_ = uVar160;
                  auVar18._24_4_ = uVar160;
                  auVar18._28_4_ = uVar160;
                  auVar18._32_4_ = uVar160;
                  auVar18._36_4_ = uVar160;
                  auVar18._40_4_ = uVar160;
                  auVar18._44_4_ = uVar160;
                  auVar18._48_4_ = uVar160;
                  auVar18._52_4_ = uVar160;
                  auVar18._56_4_ = uVar160;
                  auVar18._60_4_ = uVar160;
                  auVar138 = vminps_avx512f(*pauVar67,auVar18);
                  *pauVar52 = auVar138;
                  pauVar67 = pauVar67 + 1;
                  puVar54 = puVar54 + 1;
                  pauVar52 = pauVar52 + 1;
                  uVar62 = uVar62 - 1;
                }
              }
              uVar62 = uVar50;
              if (iVar47 == 8) {
                while (uVar62 != 0) {
                  uVar160 = *puVar54;
                  auVar12._4_4_ = uVar160;
                  auVar12._0_4_ = uVar160;
                  auVar12._8_4_ = uVar160;
                  auVar12._12_4_ = uVar160;
                  auVar12._16_4_ = uVar160;
                  auVar12._20_4_ = uVar160;
                  auVar12._24_4_ = uVar160;
                  auVar12._28_4_ = uVar160;
                  auVar72 = vminps_avx512vl(*(undefined1 (*) [32])*pauVar67,auVar12);
                  *(undefined1 (*) [32])*pauVar52 = auVar72;
                  pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
                  puVar54 = puVar54 + 1;
                  pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x20);
                  uVar62 = uVar62 - 1;
                }
              }
              uVar62 = uVar50;
              if (iVar47 == 4) {
                while (uVar62 != 0) {
                  uVar160 = *puVar54;
                  auVar6._4_4_ = uVar160;
                  auVar6._0_4_ = uVar160;
                  auVar6._8_4_ = uVar160;
                  auVar6._12_4_ = uVar160;
                  auVar71 = vminps_avx512vl(*(undefined1 (*) [16])*pauVar67,auVar6);
                  *(undefined1 (*) [16])*pauVar52 = auVar71;
                  pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
                  puVar54 = puVar54 + 1;
                  pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x10);
                  uVar62 = uVar62 - 1;
                }
              }
              if (iVar47 == 1) {
                for (lVar63 = 0; uVar50 != (uint)lVar63; lVar63 = lVar63 + 1) {
                  auVar71 = vminss_avx(ZEXT416((uint)puVar54[lVar63]),
                                       ZEXT416(*(uint *)(*pauVar67 + lVar63 * 4)));
                  *(int *)((long)*pauVar52 + lVar63 * 4) = auVar71._0_4_;
                }
              }
            }
            uVar50 = m->dims;
          }
          if (1 < uVar50 - 3) {
            return 0;
          }
          uVar42 = (ulong)uVar55;
          if ((int)uVar55 < 1) {
            uVar42 = 0;
          }
          if ((int)uVar35 < 1) {
            uVar35 = 0;
          }
          if ((int)uVar40 < 1) {
            uVar40 = 0;
          }
          uVar37 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pauVar67 = (undefined1 (*) [64])(m->cstep * uVar38 * m->elemsize + (long)m->data);
            pauVar52 = (undefined1 (*) [64])
                       (pMVar159->cstep * uVar38 * pMVar159->elemsize + (long)pMVar159->data);
            for (uVar55 = 0; uVar55 != uVar40; uVar55 = uVar55 + 1) {
              uVar50 = b->d - 1;
              if ((int)uVar55 <= (int)uVar50) {
                uVar50 = uVar55;
              }
              for (uVar45 = 0; uVar45 != uVar35; uVar45 = uVar45 + 1) {
                uVar62 = b->h - 1;
                if ((int)uVar45 <= (int)uVar62) {
                  uVar62 = uVar45;
                }
                lVar63 = (long)b->w * b->elemsize;
                puVar54 = (undefined4 *)
                          ((long)b->data +
                          (int)uVar62 * lVar63 + (long)b->h * (long)(int)uVar50 * lVar63);
                uVar69 = uVar42;
                if (iVar47 == 0x10) {
                  while ((int)uVar69 != 0) {
                    uVar160 = *puVar54;
                    auVar19._4_4_ = uVar160;
                    auVar19._0_4_ = uVar160;
                    auVar19._8_4_ = uVar160;
                    auVar19._12_4_ = uVar160;
                    auVar19._16_4_ = uVar160;
                    auVar19._20_4_ = uVar160;
                    auVar19._24_4_ = uVar160;
                    auVar19._28_4_ = uVar160;
                    auVar19._32_4_ = uVar160;
                    auVar19._36_4_ = uVar160;
                    auVar19._40_4_ = uVar160;
                    auVar19._44_4_ = uVar160;
                    auVar19._48_4_ = uVar160;
                    auVar19._52_4_ = uVar160;
                    auVar19._56_4_ = uVar160;
                    auVar19._60_4_ = uVar160;
                    auVar138 = vminps_avx512f(*pauVar67,auVar19);
                    *pauVar52 = auVar138;
                    pauVar67 = pauVar67 + 1;
                    puVar54 = puVar54 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar69 = (ulong)((int)uVar69 - 1);
                  }
                }
                uVar69 = uVar42;
                if (iVar47 == 8) {
                  while ((int)uVar69 != 0) {
                    uVar160 = *puVar54;
                    auVar13._4_4_ = uVar160;
                    auVar13._0_4_ = uVar160;
                    auVar13._8_4_ = uVar160;
                    auVar13._12_4_ = uVar160;
                    auVar13._16_4_ = uVar160;
                    auVar13._20_4_ = uVar160;
                    auVar13._24_4_ = uVar160;
                    auVar13._28_4_ = uVar160;
                    auVar72 = vminps_avx512vl(*(undefined1 (*) [32])*pauVar67,auVar13);
                    *(undefined1 (*) [32])*pauVar52 = auVar72;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
                    puVar54 = puVar54 + 1;
                    pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x20);
                    uVar69 = (ulong)((int)uVar69 - 1);
                  }
                }
                uVar69 = uVar42;
                if (iVar47 == 4) {
                  while ((int)uVar69 != 0) {
                    uVar160 = *puVar54;
                    auVar7._4_4_ = uVar160;
                    auVar7._0_4_ = uVar160;
                    auVar7._8_4_ = uVar160;
                    auVar7._12_4_ = uVar160;
                    auVar71 = vminps_avx512vl(*(undefined1 (*) [16])*pauVar67,auVar7);
                    *(undefined1 (*) [16])*pauVar52 = auVar71;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
                    puVar54 = puVar54 + 1;
                    pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x10);
                    uVar69 = (ulong)((int)uVar69 - 1);
                  }
                }
                if (iVar47 == 1) {
                  lVar56 = 0;
                  for (lVar63 = 0; (int)uVar42 != (int)lVar63; lVar63 = lVar63 + 1) {
                    auVar71 = vminss_avx(ZEXT416((uint)puVar54[lVar63]),
                                         ZEXT416(*(uint *)(*pauVar67 + lVar63 * 4)));
                    *(int *)((long)*pauVar52 + lVar63 * 4) = auVar71._0_4_;
                    lVar56 = lVar56 + -4;
                  }
                  pauVar67 = (undefined1 (*) [64])((long)pauVar67 - lVar56);
                  pauVar52 = (undefined1 (*) [64])((long)pauVar52 - lVar56);
                }
              }
            }
          }
          return 0;
        case 6:
          iVar61 = m->elempack;
          iVar44 = m->h;
          iVar58 = m->d;
          uVar42 = (ulong)(uint)m->c;
          if (uVar50 == 2) {
            lVar63 = 0;
            uVar35 = 0;
            if (0 < (int)uVar55) {
              uVar35 = uVar55;
            }
            iVar31 = 0;
            if (0 < iVar44) {
              iVar31 = iVar44;
            }
            uVar160 = 0;
            while (lVar63 != CONCAT44(uVar160,iVar31)) {
              pfVar59 = (float *)(m->w * lVar63 * m->elemsize + (long)m->data);
              pauVar67 = (undefined1 (*) [64])
                         (pMVar159->w * lVar63 * pMVar159->elemsize + (long)pMVar159->data);
              puVar43 = (uint *)b->data;
              uVar155 = (undefined4)lVar63;
              uVar157 = (undefined4)((ulong)lVar63 >> 0x20);
              uVar40 = uVar35;
              if (iVar61 == 0x10) {
                while (uVar40 != 0) {
                  local_100 = *(float (*) [2])pfVar59;
                  afStack_f8 = *(float (*) [2])(pfVar59 + 2);
                  afStack_f0 = *(float (*) [2])(pfVar59 + 4);
                  afStack_e8 = *(float (*) [2])(pfVar59 + 6);
                  afStack_e0 = *(float (*) [2])(pfVar59 + 8);
                  afStack_d8 = *(float (*) [2])(pfVar59 + 10);
                  afStack_d0 = *(float (*) [2])(pfVar59 + 0xc);
                  afStack_c8 = *(float (*) [2])(pfVar59 + 0xe);
                  auVar138 = vpbroadcastd_avx512f(ZEXT416(*puVar43));
                  local_140 = (__m512)vmovdqa64_avx512f(auVar138);
                  BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                            ((binary_op_pow *)local_c0,(__m512 *)local_100,&local_140);
                  auVar138 = vmovdqu64_avx512f(auVar138);
                  *pauVar67 = auVar138;
                  pfVar59 = pfVar59 + 0x10;
                  puVar43 = puVar43 + 1;
                  pauVar67 = pauVar67 + 1;
                  uVar40 = uVar40 - 1;
                }
              }
              uVar40 = uVar35;
              if (iVar61 == 8) {
                while (uVar40 != 0) {
                  local_100 = *(float (*) [2])pfVar59;
                  afStack_f8 = *(float (*) [2])(pfVar59 + 2);
                  afStack_f0 = *(float (*) [2])(pfVar59 + 4);
                  afStack_e8 = *(float (*) [2])(pfVar59 + 6);
                  uVar50 = *puVar43;
                  auVar104._4_4_ = uVar50;
                  auVar104._0_4_ = uVar50;
                  auVar104._8_4_ = uVar50;
                  auVar104._12_4_ = uVar50;
                  auVar104._16_4_ = uVar50;
                  auVar104._20_4_ = uVar50;
                  auVar104._24_4_ = uVar50;
                  auVar104._28_4_ = uVar50;
                  local_140[0] = (float)uVar50;
                  local_140[1] = (float)uVar50;
                  local_140[2] = (float)uVar50;
                  local_140[3] = (float)uVar50;
                  local_140[4] = (float)uVar50;
                  local_140[5] = (float)uVar50;
                  local_140[6] = (float)uVar50;
                  local_140[7] = (float)uVar50;
                  BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                            ((binary_op_pow *)local_c0,(__m256 *)local_100,(__m256 *)local_140);
                  *(undefined1 (*) [32])*pauVar67 = auVar104;
                  pfVar59 = pfVar59 + 8;
                  puVar43 = puVar43 + 1;
                  pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
                  uVar40 = uVar40 - 1;
                }
              }
              uVar40 = uVar35;
              if (iVar61 == 4) {
                while (uVar40 != 0) {
                  local_100 = *(float (*) [2])pfVar59;
                  afStack_f8 = *(float (*) [2])(pfVar59 + 2);
                  uVar50 = *puVar43;
                  auVar87._4_4_ = uVar50;
                  auVar87._0_4_ = uVar50;
                  auVar87._8_4_ = uVar50;
                  auVar87._12_4_ = uVar50;
                  local_140[0] = (float)uVar50;
                  local_140[1] = (float)uVar50;
                  local_140[2] = (float)uVar50;
                  local_140[3] = (float)uVar50;
                  auVar124 = ZEXT856(auVar87._8_8_);
                  afVar154 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                       ((binary_op_pow *)local_c0,(__m128 *)local_100,
                                        (__m128 *)local_140);
                  auVar113._0_8_ = afVar154._0_8_;
                  auVar113._8_56_ = auVar124;
                  *(undefined1 (*) [16])*pauVar67 = auVar113._0_16_;
                  pfVar59 = pfVar59 + 4;
                  puVar43 = puVar43 + 1;
                  pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
                  uVar40 = uVar40 - 1;
                }
              }
              if (iVar61 == 1) {
                for (lVar63 = 0; uVar35 != (uint)lVar63; lVar63 = lVar63 + 1) {
                  fVar77 = powf(pfVar59[lVar63],(float)puVar43[lVar63]);
                  *(float *)(*pauVar67 + lVar63 * 4) = fVar77;
                }
              }
              lVar63 = CONCAT44(uVar157,uVar155) + 1;
            }
            uVar50 = m->dims;
          }
          if (1 < uVar50 - 3) {
            return iVar47;
          }
          uVar38 = 0;
          uVar37 = (ulong)uVar55;
          if ((int)uVar55 < 1) {
            uVar37 = uVar38;
          }
          iVar31 = (int)uVar37;
          if (iVar44 < 1) {
            iVar44 = 0;
          }
          if (iVar58 < 1) {
            iVar58 = 0;
          }
          iVar33 = iVar61;
          uVar37 = uVar42 & 0xffffffff;
          if ((int)uVar42 < 1) {
            uVar37 = uVar38;
          }
          for (; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pfVar59 = (float *)(m->cstep * uVar38 * m->elemsize + (long)m->data);
            pauVar67 = (undefined1 (*) [64])
                       (pMVar159->cstep * uVar38 * pMVar159->elemsize + (long)pMVar159->data);
            for (iVar32 = 0; iVar32 != iVar58; iVar32 = iVar32 + 1) {
              iVar39 = b->d + -1;
              if (iVar32 <= iVar39) {
                iVar39 = iVar32;
              }
              iVar34 = iVar39 >> 0x1f;
              for (iVar41 = 0; iVar41 != iVar44; iVar41 = iVar41 + 1) {
                iVar36 = b->h + -1;
                if (iVar41 <= iVar36) {
                  iVar36 = iVar41;
                }
                lVar63 = (long)b->w * b->elemsize;
                puVar43 = (uint *)((long)b->data +
                                  iVar36 * lVar63 + (long)b->h * CONCAT44(iVar34,iVar39) * lVar63);
                iVar36 = iVar31;
                if (iVar61 == 0x10) {
                  while (iVar36 != 0) {
                    local_100 = *(float (*) [2])pfVar59;
                    afStack_f8 = *(float (*) [2])(pfVar59 + 2);
                    afStack_f0 = *(float (*) [2])(pfVar59 + 4);
                    afStack_e8 = *(float (*) [2])(pfVar59 + 6);
                    afStack_e0 = *(float (*) [2])(pfVar59 + 8);
                    afStack_d8 = *(float (*) [2])(pfVar59 + 10);
                    afStack_d0 = *(float (*) [2])(pfVar59 + 0xc);
                    afStack_c8 = *(float (*) [2])(pfVar59 + 0xe);
                    auVar138 = vpbroadcastd_avx512f(ZEXT416(*puVar43));
                    local_140 = (__m512)vmovdqa64_avx512f(auVar138);
                    BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                              ((binary_op_pow *)local_c0,(__m512 *)local_100,&local_140);
                    auVar138 = vmovdqu64_avx512f(auVar138);
                    *pauVar67 = auVar138;
                    pfVar59 = pfVar59 + 0x10;
                    puVar43 = puVar43 + 1;
                    pauVar67 = pauVar67 + 1;
                    iVar36 = iVar36 + -1;
                  }
                }
                iVar36 = iVar31;
                if (iVar61 == 8) {
                  while (iVar36 != 0) {
                    local_100 = *(float (*) [2])pfVar59;
                    afStack_f8 = *(float (*) [2])(pfVar59 + 2);
                    afStack_f0 = *(float (*) [2])(pfVar59 + 4);
                    afStack_e8 = *(float (*) [2])(pfVar59 + 6);
                    uVar35 = *puVar43;
                    auVar110._4_4_ = uVar35;
                    auVar110._0_4_ = uVar35;
                    auVar110._8_4_ = uVar35;
                    auVar110._12_4_ = uVar35;
                    auVar110._16_4_ = uVar35;
                    auVar110._20_4_ = uVar35;
                    auVar110._24_4_ = uVar35;
                    auVar110._28_4_ = uVar35;
                    local_140[0] = (float)uVar35;
                    local_140[1] = (float)uVar35;
                    local_140[2] = (float)uVar35;
                    local_140[3] = (float)uVar35;
                    local_140[4] = (float)uVar35;
                    local_140[5] = (float)uVar35;
                    local_140[6] = (float)uVar35;
                    local_140[7] = (float)uVar35;
                    BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                              ((binary_op_pow *)local_c0,(__m256 *)local_100,(__m256 *)local_140);
                    *(undefined1 (*) [32])*pauVar67 = auVar110;
                    pfVar59 = pfVar59 + 8;
                    puVar43 = puVar43 + 1;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
                    iVar36 = iVar36 + -1;
                  }
                }
                iVar36 = iVar31;
                if (iVar61 == 4) {
                  while (iVar36 != 0) {
                    local_100 = *(float (*) [2])pfVar59;
                    afStack_f8 = *(float (*) [2])(pfVar59 + 2);
                    uVar35 = *puVar43;
                    auVar94._4_4_ = uVar35;
                    auVar94._0_4_ = uVar35;
                    auVar94._8_4_ = uVar35;
                    auVar94._12_4_ = uVar35;
                    local_140[0] = (float)uVar35;
                    local_140[1] = (float)uVar35;
                    local_140[2] = (float)uVar35;
                    local_140[3] = (float)uVar35;
                    auVar124 = ZEXT856(auVar94._8_8_);
                    afVar154 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                         ((binary_op_pow *)local_c0,(__m128 *)local_100,
                                          (__m128 *)local_140);
                    auVar115._0_8_ = afVar154._0_8_;
                    auVar115._8_56_ = auVar124;
                    *(undefined1 (*) [16])*pauVar67 = auVar115._0_16_;
                    pfVar59 = pfVar59 + 4;
                    puVar43 = puVar43 + 1;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
                    iVar36 = iVar36 + -1;
                  }
                }
                if (iVar61 == 1) {
                  lVar56 = 0;
                  iVar61 = iVar33;
                  for (lVar63 = 0; iVar31 != (int)lVar63; lVar63 = lVar63 + 1) {
                    fVar77 = powf(pfVar59[lVar63],(float)puVar43[lVar63]);
                    *(float *)(*pauVar67 + lVar63 * 4) = fVar77;
                    lVar56 = lVar56 + -4;
                  }
                  pfVar59 = (float *)((long)pfVar59 - lVar56);
                  pauVar67 = (undefined1 (*) [64])((long)pauVar67 - lVar56);
                  iVar33 = iVar61;
                }
              }
            }
          }
          return iVar47;
        case 7:
          iVar47 = m->elempack;
          uVar35 = m->h;
          uVar40 = m->d;
          uVar45 = m->c;
          if (uVar50 == 2) {
            uVar42 = 0;
            uVar50 = 0;
            if (0 < (int)uVar55) {
              uVar50 = uVar55;
            }
            uVar37 = 0;
            if (0 < (int)uVar35) {
              uVar37 = (ulong)uVar35;
            }
            for (; uVar42 != uVar37; uVar42 = uVar42 + 1) {
              pauVar67 = (undefined1 (*) [64])((long)m->w * uVar42 * m->elemsize + (long)m->data);
              pauVar52 = (undefined1 (*) [64])
                         ((long)pMVar159->w * uVar42 * pMVar159->elemsize + (long)pMVar159->data);
              puVar43 = (uint *)b->data;
              uVar62 = uVar50;
              if (iVar47 == 0x10) {
                while (uVar62 != 0) {
                  auVar138 = vbroadcastss_avx512f(ZEXT416(*puVar43));
                  auVar138 = vsubps_avx512f(auVar138,*pauVar67);
                  *pauVar52 = auVar138;
                  pauVar67 = pauVar67 + 1;
                  puVar43 = puVar43 + 1;
                  pauVar52 = pauVar52 + 1;
                  uVar62 = uVar62 - 1;
                }
              }
              uVar62 = uVar50;
              if (iVar47 == 8) {
                while (uVar62 != 0) {
                  uVar2 = *puVar43;
                  auVar103._4_4_ = uVar2;
                  auVar103._0_4_ = uVar2;
                  auVar103._8_4_ = uVar2;
                  auVar103._12_4_ = uVar2;
                  auVar103._16_4_ = uVar2;
                  auVar103._20_4_ = uVar2;
                  auVar103._24_4_ = uVar2;
                  auVar103._28_4_ = uVar2;
                  auVar72 = vsubps_avx(auVar103,*(undefined1 (*) [32])*pauVar67);
                  *(undefined1 (*) [32])*pauVar52 = auVar72;
                  pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
                  puVar43 = puVar43 + 1;
                  pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x20);
                  uVar62 = uVar62 - 1;
                }
              }
              uVar62 = uVar50;
              if (iVar47 == 4) {
                while (uVar62 != 0) {
                  uVar2 = *puVar43;
                  auVar86._4_4_ = uVar2;
                  auVar86._0_4_ = uVar2;
                  auVar86._8_4_ = uVar2;
                  auVar86._12_4_ = uVar2;
                  auVar71 = vsubps_avx(auVar86,*(undefined1 (*) [16])*pauVar67);
                  *(undefined1 (*) [16])*pauVar52 = auVar71;
                  pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
                  puVar43 = puVar43 + 1;
                  pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x10);
                  uVar62 = uVar62 - 1;
                }
              }
              if (iVar47 == 1) {
                for (lVar63 = 0; uVar50 != (uint)lVar63; lVar63 = lVar63 + 1) {
                  *(float *)((long)*pauVar52 + lVar63 * 4) =
                       (float)puVar43[lVar63] - *(float *)(*pauVar67 + lVar63 * 4);
                }
              }
            }
            uVar50 = m->dims;
          }
          if (1 < uVar50 - 3) {
            return 0;
          }
          uVar42 = (ulong)uVar55;
          if ((int)uVar55 < 1) {
            uVar42 = 0;
          }
          if ((int)uVar35 < 1) {
            uVar35 = 0;
          }
          if ((int)uVar40 < 1) {
            uVar40 = 0;
          }
          uVar37 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pauVar67 = (undefined1 (*) [64])(m->cstep * uVar38 * m->elemsize + (long)m->data);
            pauVar52 = (undefined1 (*) [64])
                       (pMVar159->cstep * uVar38 * pMVar159->elemsize + (long)pMVar159->data);
            for (uVar55 = 0; uVar55 != uVar40; uVar55 = uVar55 + 1) {
              uVar50 = b->d - 1;
              if ((int)uVar55 <= (int)uVar50) {
                uVar50 = uVar55;
              }
              for (uVar45 = 0; uVar45 != uVar35; uVar45 = uVar45 + 1) {
                uVar62 = b->h - 1;
                if ((int)uVar45 <= (int)uVar62) {
                  uVar62 = uVar45;
                }
                lVar63 = (long)b->w * b->elemsize;
                puVar43 = (uint *)((long)b->data +
                                  (int)uVar62 * lVar63 + (long)b->h * (long)(int)uVar50 * lVar63);
                uVar69 = uVar42;
                if (iVar47 == 0x10) {
                  while ((int)uVar69 != 0) {
                    auVar138 = vbroadcastss_avx512f(ZEXT416(*puVar43));
                    auVar138 = vsubps_avx512f(auVar138,*pauVar67);
                    *pauVar52 = auVar138;
                    pauVar67 = pauVar67 + 1;
                    puVar43 = puVar43 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar69 = (ulong)((int)uVar69 - 1);
                  }
                }
                uVar69 = uVar42;
                if (iVar47 == 8) {
                  while ((int)uVar69 != 0) {
                    uVar62 = *puVar43;
                    auVar108._4_4_ = uVar62;
                    auVar108._0_4_ = uVar62;
                    auVar108._8_4_ = uVar62;
                    auVar108._12_4_ = uVar62;
                    auVar108._16_4_ = uVar62;
                    auVar108._20_4_ = uVar62;
                    auVar108._24_4_ = uVar62;
                    auVar108._28_4_ = uVar62;
                    auVar72 = vsubps_avx(auVar108,*(undefined1 (*) [32])*pauVar67);
                    *(undefined1 (*) [32])*pauVar52 = auVar72;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
                    puVar43 = puVar43 + 1;
                    pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x20);
                    uVar69 = (ulong)((int)uVar69 - 1);
                  }
                }
                uVar69 = uVar42;
                if (iVar47 == 4) {
                  while ((int)uVar69 != 0) {
                    uVar62 = *puVar43;
                    auVar92._4_4_ = uVar62;
                    auVar92._0_4_ = uVar62;
                    auVar92._8_4_ = uVar62;
                    auVar92._12_4_ = uVar62;
                    auVar71 = vsubps_avx(auVar92,*(undefined1 (*) [16])*pauVar67);
                    *(undefined1 (*) [16])*pauVar52 = auVar71;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
                    puVar43 = puVar43 + 1;
                    pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x10);
                    uVar69 = (ulong)((int)uVar69 - 1);
                  }
                }
                if (iVar47 == 1) {
                  lVar56 = 0;
                  for (lVar63 = 0; (int)uVar42 != (int)lVar63; lVar63 = lVar63 + 1) {
                    *(float *)((long)*pauVar52 + lVar63 * 4) =
                         (float)puVar43[lVar63] - *(float *)(*pauVar67 + lVar63 * 4);
                    lVar56 = lVar56 + -4;
                  }
                  pauVar67 = (undefined1 (*) [64])((long)pauVar67 - lVar56);
                  pauVar52 = (undefined1 (*) [64])((long)pauVar52 - lVar56);
                }
              }
            }
          }
          return 0;
        case 8:
          iVar47 = m->elempack;
          uVar35 = m->h;
          uVar40 = m->d;
          uVar45 = m->c;
          if (uVar50 == 2) {
            uVar42 = 0;
            uVar50 = 0;
            if (0 < (int)uVar55) {
              uVar50 = uVar55;
            }
            uVar37 = 0;
            if (0 < (int)uVar35) {
              uVar37 = (ulong)uVar35;
            }
            for (; uVar42 != uVar37; uVar42 = uVar42 + 1) {
              pauVar67 = (undefined1 (*) [64])((long)m->w * uVar42 * m->elemsize + (long)m->data);
              pauVar52 = (undefined1 (*) [64])
                         ((long)pMVar159->w * uVar42 * pMVar159->elemsize + (long)pMVar159->data);
              pfVar59 = (float *)b->data;
              uVar62 = uVar50;
              if (iVar47 == 0x10) {
                while (uVar62 != 0) {
                  auVar138 = vrcp14ps_avx512f(*pauVar67);
                  auVar73 = vbroadcastss_avx512f(ZEXT416((uint)*pfVar59));
                  in_ZMM3 = vmulps_avx512f(auVar73,auVar138);
                  auVar73 = vfmsub213ps_avx512f(*pauVar67,in_ZMM3,auVar73);
                  auVar138 = vfnmadd213ps_avx512f(auVar73,auVar138,in_ZMM3);
                  *pauVar52 = auVar138;
                  pauVar67 = pauVar67 + 1;
                  pfVar59 = pfVar59 + 1;
                  pauVar52 = pauVar52 + 1;
                  uVar62 = uVar62 - 1;
                }
              }
              uVar62 = uVar50;
              if (iVar47 == 8) {
                while (uVar62 != 0) {
                  auVar72 = vrcpps_avx(*(undefined1 (*) [32])*pauVar67);
                  fVar77 = *pfVar59;
                  auVar141._4_4_ = fVar77;
                  auVar141._0_4_ = fVar77;
                  auVar141._8_4_ = fVar77;
                  auVar141._12_4_ = fVar77;
                  auVar141._16_4_ = fVar77;
                  auVar141._20_4_ = fVar77;
                  auVar141._24_4_ = fVar77;
                  auVar141._28_4_ = fVar77;
                  auVar150._0_4_ = fVar77 * auVar72._0_4_;
                  auVar150._4_4_ = fVar77 * auVar72._4_4_;
                  auVar150._8_4_ = fVar77 * auVar72._8_4_;
                  auVar150._12_4_ = fVar77 * auVar72._12_4_;
                  auVar150._16_4_ = fVar77 * auVar72._16_4_;
                  auVar150._20_4_ = fVar77 * auVar72._20_4_;
                  auVar150._28_36_ = in_ZMM3._28_36_;
                  auVar150._24_4_ = fVar77 * auVar72._24_4_;
                  auVar98 = auVar150._0_32_;
                  in_ZMM3 = ZEXT3264(auVar98);
                  auVar71 = vfmsub213ps_fma(*(undefined1 (*) [32])*pauVar67,auVar98,auVar141);
                  auVar71 = vfnmadd213ps_fma(ZEXT1632(auVar71),auVar72,auVar98);
                  *(undefined1 (*) [32])*pauVar52 = ZEXT1632(auVar71);
                  pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
                  pfVar59 = pfVar59 + 1;
                  pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x20);
                  uVar62 = uVar62 - 1;
                }
              }
              uVar62 = uVar50;
              if (iVar47 == 4) {
                while (uVar62 != 0) {
                  fVar77 = *pfVar59;
                  auVar134._4_4_ = fVar77;
                  auVar134._0_4_ = fVar77;
                  auVar134._8_4_ = fVar77;
                  auVar134._12_4_ = fVar77;
                  auVar71 = vrcpps_avx(*(undefined1 (*) [16])*pauVar67);
                  auVar145._0_4_ = fVar77 * auVar71._0_4_;
                  auVar145._4_4_ = fVar77 * auVar71._4_4_;
                  auVar145._8_4_ = fVar77 * auVar71._8_4_;
                  auVar145._12_4_ = fVar77 * auVar71._12_4_;
                  in_ZMM3 = ZEXT1664(auVar145);
                  auVar78 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar67,auVar145,auVar134);
                  auVar71 = vfnmadd213ps_fma(auVar78,auVar71,auVar145);
                  *(undefined1 (*) [16])*pauVar52 = auVar71;
                  pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
                  pfVar59 = pfVar59 + 1;
                  pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x10);
                  uVar62 = uVar62 - 1;
                }
              }
              if (iVar47 == 1) {
                for (lVar63 = 0; uVar50 != (uint)lVar63; lVar63 = lVar63 + 1) {
                  *(float *)((long)*pauVar52 + lVar63 * 4) =
                       pfVar59[lVar63] / *(float *)(*pauVar67 + lVar63 * 4);
                }
              }
            }
            uVar50 = m->dims;
          }
          if (1 < uVar50 - 3) {
            return 0;
          }
          uVar42 = (ulong)uVar55;
          if ((int)uVar55 < 1) {
            uVar42 = 0;
          }
          if ((int)uVar35 < 1) {
            uVar35 = 0;
          }
          if ((int)uVar40 < 1) {
            uVar40 = 0;
          }
          uVar37 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pauVar67 = (undefined1 (*) [64])(m->cstep * uVar38 * m->elemsize + (long)m->data);
            pauVar52 = (undefined1 (*) [64])
                       (pMVar159->cstep * uVar38 * pMVar159->elemsize + (long)pMVar159->data);
            for (uVar55 = 0; uVar55 != uVar40; uVar55 = uVar55 + 1) {
              uVar50 = b->d - 1;
              if ((int)uVar55 <= (int)uVar50) {
                uVar50 = uVar55;
              }
              for (uVar45 = 0; uVar45 != uVar35; uVar45 = uVar45 + 1) {
                uVar62 = b->h - 1;
                if ((int)uVar45 <= (int)uVar62) {
                  uVar62 = uVar45;
                }
                lVar63 = (long)b->w * b->elemsize;
                pfVar59 = (float *)((long)b->data +
                                   (int)uVar62 * lVar63 + (long)b->h * (long)(int)uVar50 * lVar63);
                uVar69 = uVar42;
                if (iVar47 == 0x10) {
                  while ((int)uVar69 != 0) {
                    auVar138 = vrcp14ps_avx512f(*pauVar67);
                    auVar73 = vbroadcastss_avx512f(ZEXT416((uint)*pfVar59));
                    in_ZMM3 = vmulps_avx512f(auVar73,auVar138);
                    auVar73 = vfmsub213ps_avx512f(*pauVar67,in_ZMM3,auVar73);
                    auVar138 = vfnmadd213ps_avx512f(auVar73,auVar138,in_ZMM3);
                    *pauVar52 = auVar138;
                    pauVar67 = pauVar67 + 1;
                    pfVar59 = pfVar59 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar69 = (ulong)((int)uVar69 - 1);
                  }
                }
                uVar69 = uVar42;
                if (iVar47 == 8) {
                  while ((int)uVar69 != 0) {
                    auVar72 = vrcpps_avx(*(undefined1 (*) [32])*pauVar67);
                    fVar77 = *pfVar59;
                    auVar142._4_4_ = fVar77;
                    auVar142._0_4_ = fVar77;
                    auVar142._8_4_ = fVar77;
                    auVar142._12_4_ = fVar77;
                    auVar142._16_4_ = fVar77;
                    auVar142._20_4_ = fVar77;
                    auVar142._24_4_ = fVar77;
                    auVar142._28_4_ = fVar77;
                    auVar151._0_4_ = fVar77 * auVar72._0_4_;
                    auVar151._4_4_ = fVar77 * auVar72._4_4_;
                    auVar151._8_4_ = fVar77 * auVar72._8_4_;
                    auVar151._12_4_ = fVar77 * auVar72._12_4_;
                    auVar151._16_4_ = fVar77 * auVar72._16_4_;
                    auVar151._20_4_ = fVar77 * auVar72._20_4_;
                    auVar151._28_36_ = in_ZMM3._28_36_;
                    auVar151._24_4_ = fVar77 * auVar72._24_4_;
                    auVar98 = auVar151._0_32_;
                    in_ZMM3 = ZEXT3264(auVar98);
                    auVar71 = vfmsub213ps_fma(*(undefined1 (*) [32])*pauVar67,auVar98,auVar142);
                    auVar71 = vfnmadd213ps_fma(ZEXT1632(auVar71),auVar72,auVar98);
                    *(undefined1 (*) [32])*pauVar52 = ZEXT1632(auVar71);
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
                    pfVar59 = pfVar59 + 1;
                    pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x20);
                    uVar69 = (ulong)((int)uVar69 - 1);
                  }
                }
                uVar69 = uVar42;
                if (iVar47 == 4) {
                  while ((int)uVar69 != 0) {
                    fVar77 = *pfVar59;
                    auVar136._4_4_ = fVar77;
                    auVar136._0_4_ = fVar77;
                    auVar136._8_4_ = fVar77;
                    auVar136._12_4_ = fVar77;
                    auVar71 = vrcpps_avx(*(undefined1 (*) [16])*pauVar67);
                    auVar146._0_4_ = fVar77 * auVar71._0_4_;
                    auVar146._4_4_ = fVar77 * auVar71._4_4_;
                    auVar146._8_4_ = fVar77 * auVar71._8_4_;
                    auVar146._12_4_ = fVar77 * auVar71._12_4_;
                    in_ZMM3 = ZEXT1664(auVar146);
                    auVar78 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar67,auVar146,auVar136);
                    auVar71 = vfnmadd213ps_fma(auVar78,auVar71,auVar146);
                    *(undefined1 (*) [16])*pauVar52 = auVar71;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
                    pfVar59 = pfVar59 + 1;
                    pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x10);
                    uVar69 = (ulong)((int)uVar69 - 1);
                  }
                }
                if (iVar47 == 1) {
                  lVar56 = 0;
                  for (lVar63 = 0; (int)uVar42 != (int)lVar63; lVar63 = lVar63 + 1) {
                    *(float *)((long)*pauVar52 + lVar63 * 4) =
                         pfVar59[lVar63] / *(float *)(*pauVar67 + lVar63 * 4);
                    lVar56 = lVar56 + -4;
                  }
                  pauVar67 = (undefined1 (*) [64])((long)pauVar67 - lVar56);
                  pauVar52 = (undefined1 (*) [64])((long)pauVar52 - lVar56);
                }
              }
            }
          }
          return 0;
        case 9:
          iVar61 = m->elempack;
          iVar44 = m->h;
          iVar58 = m->d;
          uVar42 = (ulong)(uint)m->c;
          if (uVar50 == 2) {
            lVar63 = 0;
            uVar35 = 0;
            if (0 < (int)uVar55) {
              uVar35 = uVar55;
            }
            iVar31 = 0;
            if (0 < iVar44) {
              iVar31 = iVar44;
            }
            uVar160 = 0;
            while (lVar63 != CONCAT44(uVar160,iVar31)) {
              pfVar59 = (float *)(m->w * lVar63 * m->elemsize + (long)m->data);
              uVar155 = (undefined4)lVar63;
              uVar157 = (undefined4)((ulong)lVar63 >> 0x20);
              pauVar67 = (undefined1 (*) [64])
                         (pMVar159->w * lVar63 * pMVar159->elemsize + (long)pMVar159->data);
              puVar43 = (uint *)b->data;
              uVar40 = uVar35;
              if (iVar61 == 0x10) {
                while (uVar40 != 0) {
                  local_100 = *(float (*) [2])pfVar59;
                  afStack_f8 = *(float (*) [2])(pfVar59 + 2);
                  afStack_f0 = *(float (*) [2])(pfVar59 + 4);
                  afStack_e8 = *(float (*) [2])(pfVar59 + 6);
                  afStack_e0 = *(float (*) [2])(pfVar59 + 8);
                  afStack_d8 = *(float (*) [2])(pfVar59 + 10);
                  afStack_d0 = *(float (*) [2])(pfVar59 + 0xc);
                  afStack_c8 = *(float (*) [2])(pfVar59 + 0xe);
                  auVar138 = vpbroadcastd_avx512f(ZEXT416(*puVar43));
                  local_140 = (__m512)vmovdqa64_avx512f(auVar138);
                  BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16
                            ((binary_op_rpow *)local_c0,(__m512 *)local_100,&local_140);
                  auVar138 = vmovdqu64_avx512f(auVar138);
                  *pauVar67 = auVar138;
                  pfVar59 = pfVar59 + 0x10;
                  puVar43 = puVar43 + 1;
                  pauVar67 = pauVar67 + 1;
                  uVar40 = uVar40 - 1;
                }
              }
              uVar40 = uVar35;
              if (iVar61 == 8) {
                while (uVar40 != 0) {
                  local_100 = *(float (*) [2])pfVar59;
                  afStack_f8 = *(float (*) [2])(pfVar59 + 2);
                  afStack_f0 = *(float (*) [2])(pfVar59 + 4);
                  afStack_e8 = *(float (*) [2])(pfVar59 + 6);
                  uVar50 = *puVar43;
                  auVar102._4_4_ = uVar50;
                  auVar102._0_4_ = uVar50;
                  auVar102._8_4_ = uVar50;
                  auVar102._12_4_ = uVar50;
                  auVar102._16_4_ = uVar50;
                  auVar102._20_4_ = uVar50;
                  auVar102._24_4_ = uVar50;
                  auVar102._28_4_ = uVar50;
                  local_140[0] = (float)uVar50;
                  local_140[1] = (float)uVar50;
                  local_140[2] = (float)uVar50;
                  local_140[3] = (float)uVar50;
                  local_140[4] = (float)uVar50;
                  local_140[5] = (float)uVar50;
                  local_140[6] = (float)uVar50;
                  local_140[7] = (float)uVar50;
                  BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8
                            ((binary_op_rpow *)local_c0,(__m256 *)local_100,(__m256 *)local_140);
                  *(undefined1 (*) [32])*pauVar67 = auVar102;
                  pfVar59 = pfVar59 + 8;
                  puVar43 = puVar43 + 1;
                  pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
                  uVar40 = uVar40 - 1;
                }
              }
              uVar40 = uVar35;
              if (iVar61 == 4) {
                while (uVar40 != 0) {
                  local_100 = *(float (*) [2])pfVar59;
                  afStack_f8 = *(float (*) [2])(pfVar59 + 2);
                  uVar50 = *puVar43;
                  auVar84._4_4_ = uVar50;
                  auVar84._0_4_ = uVar50;
                  auVar84._8_4_ = uVar50;
                  auVar84._12_4_ = uVar50;
                  local_140[0] = (float)uVar50;
                  local_140[1] = (float)uVar50;
                  local_140[2] = (float)uVar50;
                  local_140[3] = (float)uVar50;
                  auVar124 = ZEXT856(auVar84._8_8_);
                  afVar154 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                                       ((binary_op_rpow *)local_c0,(__m128 *)local_100,
                                        (__m128 *)local_140);
                  auVar112._0_8_ = afVar154._0_8_;
                  auVar112._8_56_ = auVar124;
                  *(undefined1 (*) [16])*pauVar67 = auVar112._0_16_;
                  pfVar59 = pfVar59 + 4;
                  puVar43 = puVar43 + 1;
                  pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
                  uVar40 = uVar40 - 1;
                }
              }
              if (iVar61 == 1) {
                for (lVar63 = 0; uVar35 != (uint)lVar63; lVar63 = lVar63 + 1) {
                  fVar77 = powf((float)puVar43[lVar63],pfVar59[lVar63]);
                  *(float *)(*pauVar67 + lVar63 * 4) = fVar77;
                }
              }
              lVar63 = CONCAT44(uVar157,uVar155) + 1;
            }
            uVar50 = m->dims;
          }
          if (1 < uVar50 - 3) {
            return iVar47;
          }
          uVar38 = 0;
          uVar37 = (ulong)uVar55;
          if ((int)uVar55 < 1) {
            uVar37 = uVar38;
          }
          iVar31 = (int)uVar37;
          if (iVar44 < 1) {
            iVar44 = 0;
          }
          if (iVar58 < 1) {
            iVar58 = 0;
          }
          iVar33 = iVar61;
          uVar37 = uVar42 & 0xffffffff;
          if ((int)uVar42 < 1) {
            uVar37 = uVar38;
          }
          for (; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pfVar59 = (float *)(m->cstep * uVar38 * m->elemsize + (long)m->data);
            pauVar67 = (undefined1 (*) [64])
                       (pMVar159->cstep * uVar38 * pMVar159->elemsize + (long)pMVar159->data);
            for (iVar32 = 0; iVar32 != iVar58; iVar32 = iVar32 + 1) {
              iVar39 = b->d + -1;
              if (iVar32 <= iVar39) {
                iVar39 = iVar32;
              }
              iVar34 = iVar39 >> 0x1f;
              for (iVar41 = 0; iVar41 != iVar44; iVar41 = iVar41 + 1) {
                iVar36 = b->h + -1;
                if (iVar41 <= iVar36) {
                  iVar36 = iVar41;
                }
                lVar63 = (long)b->w * b->elemsize;
                puVar43 = (uint *)((long)b->data +
                                  iVar36 * lVar63 + (long)b->h * CONCAT44(iVar34,iVar39) * lVar63);
                iVar36 = iVar31;
                if (iVar61 == 0x10) {
                  while (iVar36 != 0) {
                    local_100 = *(float (*) [2])pfVar59;
                    afStack_f8 = *(float (*) [2])(pfVar59 + 2);
                    afStack_f0 = *(float (*) [2])(pfVar59 + 4);
                    afStack_e8 = *(float (*) [2])(pfVar59 + 6);
                    afStack_e0 = *(float (*) [2])(pfVar59 + 8);
                    afStack_d8 = *(float (*) [2])(pfVar59 + 10);
                    afStack_d0 = *(float (*) [2])(pfVar59 + 0xc);
                    afStack_c8 = *(float (*) [2])(pfVar59 + 0xe);
                    auVar138 = vpbroadcastd_avx512f(ZEXT416(*puVar43));
                    local_140 = (__m512)vmovdqa64_avx512f(auVar138);
                    BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16
                              ((binary_op_rpow *)local_c0,(__m512 *)local_100,&local_140);
                    auVar138 = vmovdqu64_avx512f(auVar138);
                    *pauVar67 = auVar138;
                    pfVar59 = pfVar59 + 0x10;
                    puVar43 = puVar43 + 1;
                    pauVar67 = pauVar67 + 1;
                    iVar36 = iVar36 + -1;
                  }
                }
                iVar36 = iVar31;
                if (iVar61 == 8) {
                  while (iVar36 != 0) {
                    local_100 = *(float (*) [2])pfVar59;
                    afStack_f8 = *(float (*) [2])(pfVar59 + 2);
                    afStack_f0 = *(float (*) [2])(pfVar59 + 4);
                    afStack_e8 = *(float (*) [2])(pfVar59 + 6);
                    uVar35 = *puVar43;
                    auVar107._4_4_ = uVar35;
                    auVar107._0_4_ = uVar35;
                    auVar107._8_4_ = uVar35;
                    auVar107._12_4_ = uVar35;
                    auVar107._16_4_ = uVar35;
                    auVar107._20_4_ = uVar35;
                    auVar107._24_4_ = uVar35;
                    auVar107._28_4_ = uVar35;
                    local_140[0] = (float)uVar35;
                    local_140[1] = (float)uVar35;
                    local_140[2] = (float)uVar35;
                    local_140[3] = (float)uVar35;
                    local_140[4] = (float)uVar35;
                    local_140[5] = (float)uVar35;
                    local_140[6] = (float)uVar35;
                    local_140[7] = (float)uVar35;
                    BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8
                              ((binary_op_rpow *)local_c0,(__m256 *)local_100,(__m256 *)local_140);
                    *(undefined1 (*) [32])*pauVar67 = auVar107;
                    pfVar59 = pfVar59 + 8;
                    puVar43 = puVar43 + 1;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
                    iVar36 = iVar36 + -1;
                  }
                }
                iVar36 = iVar31;
                if (iVar61 == 4) {
                  while (iVar36 != 0) {
                    local_100 = *(float (*) [2])pfVar59;
                    afStack_f8 = *(float (*) [2])(pfVar59 + 2);
                    uVar35 = *puVar43;
                    auVar90._4_4_ = uVar35;
                    auVar90._0_4_ = uVar35;
                    auVar90._8_4_ = uVar35;
                    auVar90._12_4_ = uVar35;
                    local_140[0] = (float)uVar35;
                    local_140[1] = (float)uVar35;
                    local_140[2] = (float)uVar35;
                    local_140[3] = (float)uVar35;
                    auVar124 = ZEXT856(auVar90._8_8_);
                    afVar154 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                                         ((binary_op_rpow *)local_c0,(__m128 *)local_100,
                                          (__m128 *)local_140);
                    auVar114._0_8_ = afVar154._0_8_;
                    auVar114._8_56_ = auVar124;
                    *(undefined1 (*) [16])*pauVar67 = auVar114._0_16_;
                    pfVar59 = pfVar59 + 4;
                    puVar43 = puVar43 + 1;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
                    iVar36 = iVar36 + -1;
                  }
                }
                if (iVar61 == 1) {
                  lVar56 = 0;
                  iVar61 = iVar33;
                  for (lVar63 = 0; iVar31 != (int)lVar63; lVar63 = lVar63 + 1) {
                    fVar77 = powf((float)puVar43[lVar63],pfVar59[lVar63]);
                    *(float *)(*pauVar67 + lVar63 * 4) = fVar77;
                    lVar56 = lVar56 + -4;
                  }
                  pfVar59 = (float *)((long)pfVar59 - lVar56);
                  pauVar67 = (undefined1 (*) [64])((long)pauVar67 - lVar56);
                  iVar33 = iVar61;
                }
              }
            }
          }
          return iVar47;
        case 10:
          iVar61 = m->elempack;
          iVar44 = m->h;
          iVar58 = m->d;
          uVar42 = (ulong)(uint)m->c;
          if (uVar50 == 2) {
            lVar63 = 0;
            uVar35 = 0;
            if (0 < (int)uVar55) {
              uVar35 = uVar55;
            }
            in_stack_fffffffffffffe3c = 0.0;
            iVar31 = 0;
            if (0 < iVar44) {
              iVar31 = iVar44;
            }
            in_stack_fffffffffffffe74 = 0;
            while (lVar63 != CONCAT44(in_stack_fffffffffffffe74,iVar31)) {
              pauVar52 = (undefined1 (*) [64])(m->w * lVar63 * m->elemsize + (long)m->data);
              uVar157 = (undefined4)lVar63;
              uVar156 = (undefined4)((ulong)lVar63 >> 0x20);
              pauVar67 = (undefined1 (*) [64])
                         (pMVar159->w * lVar63 * pMVar159->elemsize + (long)pMVar159->data);
              pfVar59 = (float *)b->data;
              uVar40 = uVar35;
              if (iVar61 == 0x10) {
                while (uVar40 != 0) {
                  auVar138 = vmovdqu64_avx512f(*pauVar52);
                  vpbroadcastd_avx512f(ZEXT416((uint)*pfVar59));
                  y_03[4] = (float)uVar55;
                  y_03[0] = (float)in_stack_fffffffffffffe00._0_4_;
                  y_03[1] = (float)in_stack_fffffffffffffe00._4_4_;
                  y_03[2] = (float)in_stack_fffffffffffffe00._8_4_;
                  y_03[3] = (float)in_stack_fffffffffffffe00._12_4_;
                  y_03[5] = (float)uVar155;
                  y_03[6] = (float)(int)in_stack_fffffffffffffe18;
                  y_03[7] = (float)(int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
                  y_03[8] = (float)iVar61;
                  y_03[9] = (float)in_stack_fffffffffffffe24;
                  y_03._40_8_ = pMVar159;
                  y_03[0xc] = (float)iVar47;
                  y_03[0xd] = (float)uVar160;
                  y_03[0xe] = (float)uVar35;
                  y_03[0xf] = in_stack_fffffffffffffe3c;
                  x_02[2] = (float)(int)in_stack_fffffffffffffe48;
                  x_02[3] = (float)(int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
                  x_02._0_8_ = m;
                  x_02[4] = (float)uVar157;
                  x_02[5] = (float)uVar156;
                  x_02[6] = (float)(int)in_stack_fffffffffffffe58;
                  x_02[7] = (float)(int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
                  x_02[8] = (float)iVar44;
                  x_02[9] = (float)in_stack_fffffffffffffe64;
                  x_02[10] = (float)iVar58;
                  x_02[0xb] = (float)in_stack_fffffffffffffe6c;
                  x_02[0xc] = (float)iVar31;
                  x_02[0xd] = (float)in_stack_fffffffffffffe74;
                  x_02[0xe] = (float)(int)uVar42;
                  x_02[0xf] = (float)(int)(uVar42 >> 0x20);
                  atan2512_ps((__m512 *)pbVar51,y_03,x_02);
                  auVar138 = vmovdqu64_avx512f(auVar138);
                  *pauVar67 = auVar138;
                  pauVar52 = pauVar52 + 1;
                  pfVar59 = pfVar59 + 1;
                  pauVar67 = pauVar67 + 1;
                  uVar40 = uVar40 - 1;
                }
              }
              uVar40 = uVar35;
              if (iVar61 == 8) {
                while (uVar40 != 0) {
                  local_100 = *(float (*) [2])*pauVar52;
                  afStack_f8 = *(float (*) [2])(*pauVar52 + 8);
                  afStack_f0 = *(float (*) [2])(*pauVar52 + 0x10);
                  afStack_e8 = *(float (*) [2])(*pauVar52 + 0x18);
                  fVar77 = *pfVar59;
                  auVar105._4_4_ = fVar77;
                  auVar105._0_4_ = fVar77;
                  auVar105._8_4_ = fVar77;
                  auVar105._12_4_ = fVar77;
                  auVar105._16_4_ = fVar77;
                  auVar105._20_4_ = fVar77;
                  auVar105._24_4_ = fVar77;
                  auVar105._28_4_ = fVar77;
                  local_140[0] = fVar77;
                  local_140[1] = fVar77;
                  local_140[2] = fVar77;
                  local_140[3] = fVar77;
                  local_140[4] = fVar77;
                  local_140[5] = fVar77;
                  local_140[6] = fVar77;
                  local_140[7] = fVar77;
                  pbVar51 = local_c0;
                  BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack8
                            ((binary_op_atan2 *)local_c0,(__m256 *)local_100,(__m256 *)local_140);
                  *(undefined1 (*) [32])*pauVar67 = auVar105;
                  pauVar52 = (undefined1 (*) [64])(*pauVar52 + 0x20);
                  pfVar59 = pfVar59 + 1;
                  pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
                  uVar40 = uVar40 - 1;
                }
              }
              uVar40 = uVar35;
              if (iVar61 == 4) {
                while (uVar40 != 0) {
                  local_100 = *(float (*) [2])*pauVar52;
                  afStack_f8 = *(float (*) [2])(*pauVar52 + 8);
                  fVar77 = *pfVar59;
                  auVar88._4_4_ = fVar77;
                  auVar88._0_4_ = fVar77;
                  auVar88._8_4_ = fVar77;
                  auVar88._12_4_ = fVar77;
                  local_140[0] = fVar77;
                  local_140[1] = fVar77;
                  local_140[2] = fVar77;
                  local_140[3] = fVar77;
                  auVar124 = ZEXT856(auVar88._8_8_);
                  pbVar51 = local_c0;
                  afVar154 = BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack4
                                       ((binary_op_atan2 *)local_c0,(__m128 *)local_100,
                                        (__m128 *)local_140);
                  auVar74._0_8_ = afVar154._0_8_;
                  auVar74._8_56_ = auVar124;
                  *(undefined1 (*) [16])*pauVar67 = auVar74._0_16_;
                  pauVar52 = (undefined1 (*) [64])(*pauVar52 + 0x10);
                  pfVar59 = pfVar59 + 1;
                  pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
                  uVar40 = uVar40 - 1;
                }
              }
              if (iVar61 == 1) {
                for (lVar63 = 0; uVar35 != (uint)lVar63; lVar63 = lVar63 + 1) {
                  pbVar51 = local_c0;
                  fVar77 = BinaryOp_x86_avx512_functor::binary_op_atan2::func
                                     ((binary_op_atan2 *)local_c0,(float *)pauVar52,pfVar59);
                  *(float *)(*pauVar67 + lVar63 * 4) = fVar77;
                  pauVar52 = (undefined1 (*) [64])(*pauVar52 + 4);
                  pfVar59 = pfVar59 + 1;
                }
              }
              lVar63 = CONCAT44(uVar156,uVar157) + 1;
            }
            uVar50 = m->dims;
          }
          __return_storage_ptr__ = (binary_op_atan2 *)(ulong)(uVar50 - 3);
          if (1 < uVar50 - 3) {
            return iVar47;
          }
          uVar38 = 0;
          uVar37 = (ulong)uVar55;
          if ((int)uVar55 < 1) {
            uVar37 = uVar38;
          }
          iVar31 = (int)uVar37;
          uVar155 = 0;
          if (iVar44 < 1) {
            iVar44 = 0;
          }
          if (iVar58 < 1) {
            iVar58 = 0;
          }
          uVar37 = uVar42 & 0xffffffff;
          if ((int)uVar42 < 1) {
            uVar37 = uVar38;
          }
          for (; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pauVar52 = (undefined1 (*) [64])(m->cstep * uVar38 * m->elemsize + (long)m->data);
            pauVar67 = (undefined1 (*) [64])
                       (pMVar159->cstep * uVar38 * pMVar159->elemsize + (long)pMVar159->data);
            for (iVar33 = 0; iVar33 != iVar58; iVar33 = iVar33 + 1) {
              iVar32 = b->d + -1;
              if (iVar33 <= iVar32) {
                iVar32 = iVar33;
              }
              iVar41 = iVar32 >> 0x1f;
              for (iVar39 = 0; iVar39 != iVar44; iVar39 = iVar39 + 1) {
                iVar34 = b->h + -1;
                if (iVar39 <= iVar34) {
                  iVar34 = iVar39;
                }
                lVar63 = (long)b->w * b->elemsize;
                pfVar59 = (float *)((long)b->data +
                                   iVar34 * lVar63 + (long)b->h * CONCAT44(iVar41,iVar32) * lVar63);
                iVar34 = iVar31;
                if (iVar61 == 0x10) {
                  while (iVar34 != 0) {
                    auVar138 = vmovdqu64_avx512f(*pauVar52);
                    vpbroadcastd_avx512f(ZEXT416((uint)*pfVar59));
                    y_05[4] = (float)iVar31;
                    y_05[0] = (float)in_stack_fffffffffffffe00._0_4_;
                    y_05[1] = (float)in_stack_fffffffffffffe00._4_4_;
                    y_05[2] = (float)in_stack_fffffffffffffe00._8_4_;
                    y_05[3] = (float)in_stack_fffffffffffffe00._12_4_;
                    y_05[5] = (float)uVar155;
                    y_05[6] = (float)(int)in_stack_fffffffffffffe18;
                    y_05[7] = (float)(int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
                    y_05[8] = (float)iVar61;
                    y_05[9] = (float)in_stack_fffffffffffffe24;
                    y_05._40_8_ = pMVar159;
                    y_05[0xc] = (float)iVar47;
                    y_05[0xd] = (float)uVar160;
                    y_05[0xe] = (float)iVar39;
                    y_05[0xf] = in_stack_fffffffffffffe3c;
                    x_04[2] = (float)(int)uVar38;
                    x_04[3] = (float)(int)(uVar38 >> 0x20);
                    x_04._0_8_ = m;
                    x_04[4] = (float)iVar32;
                    x_04[5] = (float)iVar41;
                    x_04[6] = (float)(int)in_stack_fffffffffffffe58;
                    x_04[7] = (float)(int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
                    x_04[8] = (float)iVar44;
                    x_04[9] = (float)in_stack_fffffffffffffe64;
                    x_04[10] = (float)iVar58;
                    x_04[0xb] = (float)in_stack_fffffffffffffe6c;
                    x_04[0xc] = (float)iVar33;
                    x_04[0xd] = (float)in_stack_fffffffffffffe74;
                    x_04[0xe] = (float)(int)uVar37;
                    x_04[0xf] = (float)(int)(uVar37 >> 0x20);
                    atan2512_ps((__m512 *)__return_storage_ptr__,y_05,x_04);
                    auVar138 = vmovdqu64_avx512f(auVar138);
                    *pauVar67 = auVar138;
                    pauVar52 = pauVar52 + 1;
                    pfVar59 = pfVar59 + 1;
                    pauVar67 = pauVar67 + 1;
                    iVar34 = iVar34 + -1;
                  }
                }
                iVar34 = iVar31;
                if (iVar61 == 8) {
                  while (iVar34 != 0) {
                    local_100 = *(float (*) [2])*pauVar52;
                    afStack_f8 = *(float (*) [2])(*pauVar52 + 8);
                    afStack_f0 = *(float (*) [2])(*pauVar52 + 0x10);
                    afStack_e8 = *(float (*) [2])(*pauVar52 + 0x18);
                    fVar77 = *pfVar59;
                    auVar111._4_4_ = fVar77;
                    auVar111._0_4_ = fVar77;
                    auVar111._8_4_ = fVar77;
                    auVar111._12_4_ = fVar77;
                    auVar111._16_4_ = fVar77;
                    auVar111._20_4_ = fVar77;
                    auVar111._24_4_ = fVar77;
                    auVar111._28_4_ = fVar77;
                    local_140[0] = fVar77;
                    local_140[1] = fVar77;
                    local_140[2] = fVar77;
                    local_140[3] = fVar77;
                    local_140[4] = fVar77;
                    local_140[5] = fVar77;
                    local_140[6] = fVar77;
                    local_140[7] = fVar77;
                    __return_storage_ptr__ = (binary_op_atan2 *)local_c0;
                    BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack8
                              ((binary_op_atan2 *)local_c0,(__m256 *)local_100,(__m256 *)local_140);
                    *(undefined1 (*) [32])*pauVar67 = auVar111;
                    pauVar52 = (undefined1 (*) [64])(*pauVar52 + 0x20);
                    pfVar59 = pfVar59 + 1;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
                    iVar34 = iVar34 + -1;
                  }
                }
                iVar34 = iVar31;
                if (iVar61 == 4) {
                  while (iVar34 != 0) {
                    local_100 = *(float (*) [2])*pauVar52;
                    afStack_f8 = *(float (*) [2])(*pauVar52 + 8);
                    fVar77 = *pfVar59;
                    auVar95._4_4_ = fVar77;
                    auVar95._0_4_ = fVar77;
                    auVar95._8_4_ = fVar77;
                    auVar95._12_4_ = fVar77;
                    local_140[0] = fVar77;
                    local_140[1] = fVar77;
                    local_140[2] = fVar77;
                    local_140[3] = fVar77;
                    auVar124 = ZEXT856(auVar95._8_8_);
                    __return_storage_ptr__ = (binary_op_atan2 *)local_c0;
                    afVar154 = BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack4
                                         ((binary_op_atan2 *)local_c0,(__m128 *)local_100,
                                          (__m128 *)local_140);
                    auVar116._0_8_ = afVar154._0_8_;
                    auVar116._8_56_ = auVar124;
                    *(undefined1 (*) [16])*pauVar67 = auVar116._0_16_;
                    pauVar52 = (undefined1 (*) [64])(*pauVar52 + 0x10);
                    pfVar59 = pfVar59 + 1;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
                    iVar34 = iVar34 + -1;
                  }
                }
                iVar34 = iVar31;
                if (iVar61 == 1) {
                  while (iVar34 != 0) {
                    __return_storage_ptr__ = (binary_op_atan2 *)local_c0;
                    fVar77 = BinaryOp_x86_avx512_functor::binary_op_atan2::func
                                       ((binary_op_atan2 *)local_c0,(float *)pauVar52,pfVar59);
                    *(float *)*pauVar67 = fVar77;
                    pauVar52 = (undefined1 (*) [64])(*pauVar52 + 4);
                    pfVar59 = pfVar59 + 1;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 4);
                    iVar34 = iVar34 + -1;
                  }
                }
              }
            }
          }
          return iVar47;
        case 0xb:
          iVar61 = m->elempack;
          iVar44 = m->h;
          iVar58 = m->d;
          uVar42 = (ulong)(uint)m->c;
          if (uVar50 == 2) {
            lVar63 = 0;
            uVar35 = 0;
            if (0 < (int)uVar55) {
              uVar35 = uVar55;
            }
            in_stack_fffffffffffffe3c = 0.0;
            iVar31 = 0;
            if (0 < iVar44) {
              iVar31 = iVar44;
            }
            in_stack_fffffffffffffe74 = 0;
            while (lVar63 != CONCAT44(in_stack_fffffffffffffe74,iVar31)) {
              pauVar52 = (undefined1 (*) [64])(m->w * lVar63 * m->elemsize + (long)m->data);
              uVar157 = (undefined4)lVar63;
              uVar156 = (undefined4)((ulong)lVar63 >> 0x20);
              pauVar67 = (undefined1 (*) [64])
                         (pMVar159->w * lVar63 * pMVar159->elemsize + (long)pMVar159->data);
              pfVar59 = (float *)b->data;
              uVar40 = uVar35;
              if (iVar61 == 0x10) {
                while (uVar40 != 0) {
                  vmovdqu64_avx512f(*pauVar52);
                  auVar138 = vpbroadcastd_avx512f(ZEXT416((uint)*pfVar59));
                  y_02[4] = (float)uVar55;
                  y_02[0] = (float)in_stack_fffffffffffffe00._0_4_;
                  y_02[1] = (float)in_stack_fffffffffffffe00._4_4_;
                  y_02[2] = (float)in_stack_fffffffffffffe00._8_4_;
                  y_02[3] = (float)in_stack_fffffffffffffe00._12_4_;
                  y_02[5] = (float)uVar155;
                  y_02[6] = (float)(int)in_stack_fffffffffffffe18;
                  y_02[7] = (float)(int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
                  y_02[8] = (float)iVar61;
                  y_02[9] = (float)in_stack_fffffffffffffe24;
                  y_02._40_8_ = pMVar159;
                  y_02[0xc] = (float)iVar47;
                  y_02[0xd] = (float)uVar160;
                  y_02[0xe] = (float)uVar35;
                  y_02[0xf] = in_stack_fffffffffffffe3c;
                  x_01[2] = (float)(int)in_stack_fffffffffffffe48;
                  x_01[3] = (float)(int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
                  x_01._0_8_ = m;
                  x_01[4] = (float)uVar157;
                  x_01[5] = (float)uVar156;
                  x_01[6] = (float)(int)in_stack_fffffffffffffe58;
                  x_01[7] = (float)(int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
                  x_01[8] = (float)iVar44;
                  x_01[9] = (float)in_stack_fffffffffffffe64;
                  x_01[10] = (float)iVar58;
                  x_01[0xb] = (float)in_stack_fffffffffffffe6c;
                  x_01[0xc] = (float)iVar31;
                  x_01[0xd] = (float)in_stack_fffffffffffffe74;
                  x_01[0xe] = (float)(int)uVar42;
                  x_01[0xf] = (float)(int)(uVar42 >> 0x20);
                  atan2512_ps((__m512 *)pbVar51,y_02,x_01);
                  auVar138 = vmovdqu64_avx512f(auVar138);
                  *pauVar67 = auVar138;
                  pauVar52 = pauVar52 + 1;
                  pfVar59 = pfVar59 + 1;
                  pauVar67 = pauVar67 + 1;
                  uVar40 = uVar40 - 1;
                }
              }
              uVar40 = uVar35;
              if (iVar61 == 8) {
                while (uVar40 != 0) {
                  local_100 = *(float (*) [2])*pauVar52;
                  afStack_f8 = *(float (*) [2])(*pauVar52 + 8);
                  afStack_f0 = *(float (*) [2])(*pauVar52 + 0x10);
                  afStack_e8 = *(float (*) [2])(*pauVar52 + 0x18);
                  fVar77 = *pfVar59;
                  auVar101._4_4_ = fVar77;
                  auVar101._0_4_ = fVar77;
                  auVar101._8_4_ = fVar77;
                  auVar101._12_4_ = fVar77;
                  auVar101._16_4_ = fVar77;
                  auVar101._20_4_ = fVar77;
                  auVar101._24_4_ = fVar77;
                  auVar101._28_4_ = fVar77;
                  local_140[0] = fVar77;
                  local_140[1] = fVar77;
                  local_140[2] = fVar77;
                  local_140[3] = fVar77;
                  local_140[4] = fVar77;
                  local_140[5] = fVar77;
                  local_140[6] = fVar77;
                  local_140[7] = fVar77;
                  pbVar51 = local_c0;
                  BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack8
                            (local_c0,(__m256 *)local_100,(__m256 *)local_140);
                  *(undefined1 (*) [32])*pauVar67 = auVar101;
                  pauVar52 = (undefined1 (*) [64])(*pauVar52 + 0x20);
                  pfVar59 = pfVar59 + 1;
                  pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
                  uVar40 = uVar40 - 1;
                }
              }
              uVar40 = uVar35;
              if (iVar61 == 4) {
                while (uVar40 != 0) {
                  local_100 = *(float (*) [2])*pauVar52;
                  afStack_f8 = *(float (*) [2])(*pauVar52 + 8);
                  fVar77 = *pfVar59;
                  auVar83._4_4_ = fVar77;
                  auVar83._0_4_ = fVar77;
                  auVar83._8_4_ = fVar77;
                  auVar83._12_4_ = fVar77;
                  local_140[0] = fVar77;
                  local_140[1] = fVar77;
                  local_140[2] = fVar77;
                  local_140[3] = fVar77;
                  auVar124 = ZEXT856(auVar83._8_8_);
                  pbVar51 = local_c0;
                  afVar154 = BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack4
                                       (local_c0,(__m128 *)local_100,(__m128 *)local_140);
                  auVar138._0_8_ = afVar154._0_8_;
                  auVar138._8_56_ = auVar124;
                  *(undefined1 (*) [16])*pauVar67 = auVar138._0_16_;
                  pauVar52 = (undefined1 (*) [64])(*pauVar52 + 0x10);
                  pfVar59 = pfVar59 + 1;
                  pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
                  uVar40 = uVar40 - 1;
                }
              }
              if (iVar61 == 1) {
                for (lVar63 = 0; uVar35 != (uint)lVar63; lVar63 = lVar63 + 1) {
                  pbVar51 = local_c0;
                  fVar77 = BinaryOp_x86_avx512_functor::binary_op_ratan2::func
                                     (local_c0,(float *)pauVar52,pfVar59);
                  *(float *)(*pauVar67 + lVar63 * 4) = fVar77;
                  pauVar52 = (undefined1 (*) [64])(*pauVar52 + 4);
                  pfVar59 = pfVar59 + 1;
                }
              }
              lVar63 = CONCAT44(uVar156,uVar157) + 1;
            }
            uVar50 = m->dims;
          }
          pbVar51 = (binary_op_ratan2 *)(ulong)(uVar50 - 3);
          if (1 < uVar50 - 3) {
            return iVar47;
          }
          uVar38 = 0;
          uVar37 = (ulong)uVar55;
          if ((int)uVar55 < 1) {
            uVar37 = uVar38;
          }
          iVar31 = (int)uVar37;
          uVar155 = 0;
          if (iVar44 < 1) {
            iVar44 = 0;
          }
          if (iVar58 < 1) {
            iVar58 = 0;
          }
          uVar37 = uVar42 & 0xffffffff;
          if ((int)uVar42 < 1) {
            uVar37 = uVar38;
          }
          for (; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pauVar52 = (undefined1 (*) [64])(m->cstep * uVar38 * m->elemsize + (long)m->data);
            pauVar67 = (undefined1 (*) [64])
                       (pMVar159->cstep * uVar38 * pMVar159->elemsize + (long)pMVar159->data);
            for (iVar33 = 0; iVar33 != iVar58; iVar33 = iVar33 + 1) {
              iVar32 = b->d + -1;
              if (iVar33 <= iVar32) {
                iVar32 = iVar33;
              }
              iVar41 = iVar32 >> 0x1f;
              for (iVar39 = 0; iVar39 != iVar44; iVar39 = iVar39 + 1) {
                iVar34 = b->h + -1;
                if (iVar39 <= iVar34) {
                  iVar34 = iVar39;
                }
                lVar63 = (long)b->w * b->elemsize;
                pfVar59 = (float *)((long)b->data +
                                   iVar34 * lVar63 + (long)b->h * CONCAT44(iVar41,iVar32) * lVar63);
                iVar34 = iVar31;
                if (iVar61 == 0x10) {
                  while (iVar34 != 0) {
                    vmovdqu64_avx512f(*pauVar52);
                    auVar138 = vpbroadcastd_avx512f(ZEXT416((uint)*pfVar59));
                    y_04[4] = (float)iVar31;
                    y_04[0] = (float)in_stack_fffffffffffffe00._0_4_;
                    y_04[1] = (float)in_stack_fffffffffffffe00._4_4_;
                    y_04[2] = (float)in_stack_fffffffffffffe00._8_4_;
                    y_04[3] = (float)in_stack_fffffffffffffe00._12_4_;
                    y_04[5] = (float)uVar155;
                    y_04[6] = (float)(int)in_stack_fffffffffffffe18;
                    y_04[7] = (float)(int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
                    y_04[8] = (float)iVar61;
                    y_04[9] = (float)in_stack_fffffffffffffe24;
                    y_04._40_8_ = pMVar159;
                    y_04[0xc] = (float)iVar47;
                    y_04[0xd] = (float)uVar160;
                    y_04[0xe] = (float)iVar39;
                    y_04[0xf] = in_stack_fffffffffffffe3c;
                    x_03[2] = (float)(int)uVar38;
                    x_03[3] = (float)(int)(uVar38 >> 0x20);
                    x_03._0_8_ = m;
                    x_03[4] = (float)iVar32;
                    x_03[5] = (float)iVar41;
                    x_03[6] = (float)(int)in_stack_fffffffffffffe58;
                    x_03[7] = (float)(int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
                    x_03[8] = (float)iVar44;
                    x_03[9] = (float)in_stack_fffffffffffffe64;
                    x_03[10] = (float)iVar58;
                    x_03[0xb] = (float)in_stack_fffffffffffffe6c;
                    x_03[0xc] = (float)iVar33;
                    x_03[0xd] = (float)in_stack_fffffffffffffe74;
                    x_03[0xe] = (float)(int)uVar37;
                    x_03[0xf] = (float)(int)(uVar37 >> 0x20);
                    atan2512_ps((__m512 *)pbVar51,y_04,x_03);
                    auVar138 = vmovdqu64_avx512f(auVar138);
                    *pauVar67 = auVar138;
                    pauVar52 = pauVar52 + 1;
                    pfVar59 = pfVar59 + 1;
                    pauVar67 = pauVar67 + 1;
                    iVar34 = iVar34 + -1;
                  }
                }
                iVar34 = iVar31;
                if (iVar61 == 8) {
                  while (iVar34 != 0) {
                    local_100 = *(float (*) [2])*pauVar52;
                    afStack_f8 = *(float (*) [2])(*pauVar52 + 8);
                    afStack_f0 = *(float (*) [2])(*pauVar52 + 0x10);
                    afStack_e8 = *(float (*) [2])(*pauVar52 + 0x18);
                    fVar77 = *pfVar59;
                    auVar106._4_4_ = fVar77;
                    auVar106._0_4_ = fVar77;
                    auVar106._8_4_ = fVar77;
                    auVar106._12_4_ = fVar77;
                    auVar106._16_4_ = fVar77;
                    auVar106._20_4_ = fVar77;
                    auVar106._24_4_ = fVar77;
                    auVar106._28_4_ = fVar77;
                    local_140[0] = fVar77;
                    local_140[1] = fVar77;
                    local_140[2] = fVar77;
                    local_140[3] = fVar77;
                    local_140[4] = fVar77;
                    local_140[5] = fVar77;
                    local_140[6] = fVar77;
                    local_140[7] = fVar77;
                    pbVar51 = local_c0;
                    BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack8
                              (local_c0,(__m256 *)local_100,(__m256 *)local_140);
                    *(undefined1 (*) [32])*pauVar67 = auVar106;
                    pauVar52 = (undefined1 (*) [64])(*pauVar52 + 0x20);
                    pfVar59 = pfVar59 + 1;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
                    iVar34 = iVar34 + -1;
                  }
                }
                iVar34 = iVar31;
                if (iVar61 == 4) {
                  while (iVar34 != 0) {
                    local_100 = *(float (*) [2])*pauVar52;
                    afStack_f8 = *(float (*) [2])(*pauVar52 + 8);
                    fVar77 = *pfVar59;
                    auVar89._4_4_ = fVar77;
                    auVar89._0_4_ = fVar77;
                    auVar89._8_4_ = fVar77;
                    auVar89._12_4_ = fVar77;
                    local_140[0] = fVar77;
                    local_140[1] = fVar77;
                    local_140[2] = fVar77;
                    local_140[3] = fVar77;
                    auVar124 = ZEXT856(auVar89._8_8_);
                    pbVar51 = local_c0;
                    afVar154 = BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack4
                                         (local_c0,(__m128 *)local_100,(__m128 *)local_140);
                    auVar73._0_8_ = afVar154._0_8_;
                    auVar73._8_56_ = auVar124;
                    *(undefined1 (*) [16])*pauVar67 = auVar73._0_16_;
                    pauVar52 = (undefined1 (*) [64])(*pauVar52 + 0x10);
                    pfVar59 = pfVar59 + 1;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
                    iVar34 = iVar34 + -1;
                  }
                }
                iVar34 = iVar31;
                if (iVar61 == 1) {
                  while (iVar34 != 0) {
                    pbVar51 = local_c0;
                    fVar77 = BinaryOp_x86_avx512_functor::binary_op_ratan2::func
                                       (local_c0,(float *)pauVar52,pfVar59);
                    *(float *)*pauVar67 = fVar77;
                    pauVar52 = (undefined1 (*) [64])(*pauVar52 + 4);
                    pfVar59 = pfVar59 + 1;
                    pauVar67 = (undefined1 (*) [64])(*pauVar67 + 4);
                    iVar34 = iVar34 + -1;
                  }
                }
              }
            }
          }
          return iVar47;
        }
      }
      else {
        uVar160 = 0;
        if (!bVar30 || uVar45 != 3) {
          return 0;
        }
        if (iVar44 != 1) {
          return 0;
        }
        if (m->w != uVar55) {
          return 0;
        }
        if (m->c != uVar40) {
          return 0;
        }
        switch(uVar42) {
        case 0:
          iVar61 = uVar55 * m->elempack;
          iVar47 = m->h;
          if (m->h < 1) {
            iVar47 = 0;
          }
          uVar42 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar42 = 0;
          }
          for (uVar37 = 0; uVar37 != uVar42; uVar37 = uVar37 + 1) {
            pauVar67 = (undefined1 (*) [64])(m->cstep * uVar37 * m->elemsize + (long)m->data);
            pauVar52 = (undefined1 (*) [64])
                       (pMVar159->cstep * uVar37 * pMVar159->elemsize + (long)pMVar159->data);
            for (iVar44 = 0; iVar44 != iVar47; iVar44 = iVar44 + 1) {
              pvVar3 = b->data;
              lVar63 = b->cstep * uVar37 * b->elemsize;
              pauVar46 = (undefined1 (*) [64])((long)pvVar3 + lVar63);
              lVar56 = 0;
              pauVar65 = pauVar52;
              pauVar70 = pauVar67;
              for (iVar58 = 0; iVar58 + 0xf < iVar61; iVar58 = iVar58 + 0x10) {
                auVar138 = vaddps_avx512f(*pauVar46,*pauVar70);
                *pauVar65 = auVar138;
                pauVar70 = pauVar70 + 1;
                pauVar46 = pauVar46 + 1;
                pauVar65 = pauVar65 + 1;
                lVar56 = lVar56 + 0x40;
              }
              for (; iVar58 + 7 < iVar61; iVar58 = iVar58 + 8) {
                pfVar59 = (float *)((long)pvVar3 + lVar56 + lVar63);
                pfVar64 = (float *)(*pauVar67 + lVar56);
                auVar100._0_4_ = *pfVar59 + *pfVar64;
                auVar100._4_4_ = pfVar59[1] + pfVar64[1];
                auVar100._8_4_ = pfVar59[2] + pfVar64[2];
                auVar100._12_4_ = pfVar59[3] + pfVar64[3];
                auVar100._16_4_ = pfVar59[4] + pfVar64[4];
                auVar100._20_4_ = pfVar59[5] + pfVar64[5];
                auVar100._24_4_ = pfVar59[6] + pfVar64[6];
                auVar100._28_4_ = pfVar59[7] + pfVar64[7];
                *(undefined1 (*) [32])((long)*pauVar52 + lVar56) = auVar100;
                lVar56 = lVar56 + 0x20;
              }
              for (; iVar58 + 3 < iVar61; iVar58 = iVar58 + 4) {
                pfVar59 = (float *)((long)pvVar3 + lVar56 + lVar63);
                pfVar64 = (float *)(*pauVar67 + lVar56);
                auVar82._0_4_ = *pfVar59 + *pfVar64;
                auVar82._4_4_ = pfVar59[1] + pfVar64[1];
                auVar82._8_4_ = pfVar59[2] + pfVar64[2];
                auVar82._12_4_ = pfVar59[3] + pfVar64[3];
                *(undefined1 (*) [16])((long)*pauVar52 + lVar56) = auVar82;
                lVar56 = lVar56 + 0x10;
              }
              pfVar59 = (float *)((long)pvVar3 + lVar63 + lVar56);
              pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + lVar56);
              pauVar67 = (undefined1 (*) [64])(*pauVar67 + lVar56);
              for (; iVar58 < iVar61; iVar58 = iVar58 + 1) {
                *(float *)*pauVar52 = *pfVar59 + *(float *)*pauVar67;
                pauVar67 = (undefined1 (*) [64])(*pauVar67 + 4);
                pfVar59 = pfVar59 + 1;
                pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 4);
              }
            }
          }
          return 0;
        case 1:
          iVar61 = uVar55 * m->elempack;
          iVar47 = m->h;
          if (m->h < 1) {
            iVar47 = 0;
          }
          uVar42 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar42 = 0;
          }
          for (uVar37 = 0; uVar37 != uVar42; uVar37 = uVar37 + 1) {
            pauVar67 = (undefined1 (*) [64])(m->cstep * uVar37 * m->elemsize + (long)m->data);
            pauVar52 = (undefined1 (*) [64])
                       (pMVar159->cstep * uVar37 * pMVar159->elemsize + (long)pMVar159->data);
            for (iVar44 = 0; iVar44 != iVar47; iVar44 = iVar44 + 1) {
              pvVar3 = b->data;
              lVar63 = b->cstep * uVar37 * b->elemsize;
              pauVar46 = (undefined1 (*) [64])((long)pvVar3 + lVar63);
              lVar56 = 0;
              pauVar65 = pauVar52;
              pauVar70 = pauVar67;
              for (iVar58 = 0; iVar58 + 0xf < iVar61; iVar58 = iVar58 + 0x10) {
                auVar138 = vsubps_avx512f(*pauVar70,*pauVar46);
                *pauVar65 = auVar138;
                pauVar70 = pauVar70 + 1;
                pauVar46 = pauVar46 + 1;
                pauVar65 = pauVar65 + 1;
                lVar56 = lVar56 + 0x40;
              }
              for (; iVar58 + 7 < iVar61; iVar58 = iVar58 + 8) {
                auVar72 = vsubps_avx(*(undefined1 (*) [32])(*pauVar67 + lVar56),
                                     *(undefined1 (*) [32])((long)pvVar3 + lVar56 + lVar63));
                *(undefined1 (*) [32])((long)*pauVar52 + lVar56) = auVar72;
                lVar56 = lVar56 + 0x20;
              }
              for (; iVar58 + 3 < iVar61; iVar58 = iVar58 + 4) {
                auVar71 = vsubps_avx(*(undefined1 (*) [16])(*pauVar67 + lVar56),
                                     *(undefined1 (*) [16])((long)pvVar3 + lVar56 + lVar63));
                *(undefined1 (*) [16])((long)*pauVar52 + lVar56) = auVar71;
                lVar56 = lVar56 + 0x10;
              }
              pfVar59 = (float *)((long)pvVar3 + lVar63 + lVar56);
              pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + lVar56);
              pauVar67 = (undefined1 (*) [64])(*pauVar67 + lVar56);
              for (; iVar58 < iVar61; iVar58 = iVar58 + 1) {
                *(float *)*pauVar52 = *(float *)*pauVar67 - *pfVar59;
                pauVar67 = (undefined1 (*) [64])(*pauVar67 + 4);
                pfVar59 = pfVar59 + 1;
                pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 4);
              }
            }
          }
          return 0;
        case 2:
          iVar61 = uVar55 * m->elempack;
          iVar47 = m->h;
          if (m->h < 1) {
            iVar47 = 0;
          }
          uVar42 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar42 = 0;
          }
          for (uVar37 = 0; uVar37 != uVar42; uVar37 = uVar37 + 1) {
            pauVar67 = (undefined1 (*) [64])(m->cstep * uVar37 * m->elemsize + (long)m->data);
            pauVar52 = (undefined1 (*) [64])
                       (pMVar159->cstep * uVar37 * pMVar159->elemsize + (long)pMVar159->data);
            for (iVar44 = 0; iVar44 != iVar47; iVar44 = iVar44 + 1) {
              pvVar3 = b->data;
              lVar63 = b->cstep * uVar37 * b->elemsize;
              pauVar46 = (undefined1 (*) [64])((long)pvVar3 + lVar63);
              lVar56 = 0;
              pauVar65 = pauVar52;
              pauVar70 = pauVar67;
              for (iVar58 = 0; iVar58 + 0xf < iVar61; iVar58 = iVar58 + 0x10) {
                auVar138 = vmulps_avx512f(*pauVar46,*pauVar70);
                *pauVar65 = auVar138;
                pauVar70 = pauVar70 + 1;
                pauVar46 = pauVar46 + 1;
                pauVar65 = pauVar65 + 1;
                lVar56 = lVar56 + 0x40;
              }
              for (; iVar58 + 7 < iVar61; iVar58 = iVar58 + 8) {
                pfVar59 = (float *)((long)pvVar3 + lVar56 + lVar63);
                pfVar64 = (float *)(*pauVar67 + lVar56);
                auVar28._4_4_ = pfVar59[1] * pfVar64[1];
                auVar28._0_4_ = *pfVar59 * *pfVar64;
                auVar28._8_4_ = pfVar59[2] * pfVar64[2];
                auVar28._12_4_ = pfVar59[3] * pfVar64[3];
                auVar28._16_4_ = pfVar59[4] * pfVar64[4];
                auVar28._20_4_ = pfVar59[5] * pfVar64[5];
                auVar28._24_4_ = pfVar59[6] * pfVar64[6];
                auVar28._28_4_ = pfVar59[7];
                *(undefined1 (*) [32])((long)*pauVar52 + lVar56) = auVar28;
                lVar56 = lVar56 + 0x20;
              }
              for (; iVar58 + 3 < iVar61; iVar58 = iVar58 + 4) {
                pfVar59 = (float *)((long)pvVar3 + lVar56 + lVar63);
                pfVar64 = (float *)(*pauVar67 + lVar56);
                auVar96._0_4_ = *pfVar59 * *pfVar64;
                auVar96._4_4_ = pfVar59[1] * pfVar64[1];
                auVar96._8_4_ = pfVar59[2] * pfVar64[2];
                auVar96._12_4_ = pfVar59[3] * pfVar64[3];
                *(undefined1 (*) [16])((long)*pauVar52 + lVar56) = auVar96;
                lVar56 = lVar56 + 0x10;
              }
              pfVar59 = (float *)((long)pvVar3 + lVar63 + lVar56);
              pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + lVar56);
              pauVar67 = (undefined1 (*) [64])(*pauVar67 + lVar56);
              for (; iVar58 < iVar61; iVar58 = iVar58 + 1) {
                *(float *)*pauVar52 = *pfVar59 * *(float *)*pauVar67;
                pauVar67 = (undefined1 (*) [64])(*pauVar67 + 4);
                pfVar59 = pfVar59 + 1;
                pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 4);
              }
            }
          }
          return 0;
        case 3:
          iVar61 = uVar55 * m->elempack;
          iVar47 = m->h;
          if (m->h < 1) {
            iVar47 = 0;
          }
          uVar42 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar42 = 0;
          }
          for (uVar37 = 0; uVar37 != uVar42; uVar37 = uVar37 + 1) {
            pauVar67 = (undefined1 (*) [64])(m->cstep * uVar37 * m->elemsize + (long)m->data);
            pauVar52 = (undefined1 (*) [64])
                       (pMVar159->cstep * uVar37 * pMVar159->elemsize + (long)pMVar159->data);
            for (iVar44 = 0; iVar44 != iVar47; iVar44 = iVar44 + 1) {
              pvVar3 = b->data;
              lVar63 = b->cstep * uVar37 * b->elemsize;
              pauVar46 = (undefined1 (*) [64])((long)pvVar3 + lVar63);
              lVar56 = 0;
              pauVar65 = pauVar52;
              pauVar70 = pauVar67;
              for (iVar58 = 0; iVar58 + 0xf < iVar61; iVar58 = iVar58 + 0x10) {
                auVar138 = vrcp14ps_avx512f(*pauVar46);
                in_ZMM3 = vmulps_avx512f(*pauVar70,auVar138);
                auVar73 = vfmsub213ps_avx512f(*pauVar46,in_ZMM3,*pauVar70);
                auVar138 = vfnmadd213ps_avx512f(auVar73,auVar138,in_ZMM3);
                *pauVar65 = auVar138;
                pauVar70 = pauVar70 + 1;
                pauVar46 = pauVar46 + 1;
                pauVar65 = pauVar65 + 1;
                lVar56 = lVar56 + 0x40;
              }
              for (; iVar58 + 7 < iVar61; iVar58 = iVar58 + 8) {
                auVar72 = *(undefined1 (*) [32])((long)pvVar3 + lVar56 + lVar63);
                auVar101 = vrcpps_avx(auVar72);
                auVar98 = *(undefined1 (*) [32])(*pauVar67 + lVar56);
                auVar152._0_4_ = auVar98._0_4_ * auVar101._0_4_;
                auVar152._4_4_ = auVar98._4_4_ * auVar101._4_4_;
                auVar152._8_4_ = auVar98._8_4_ * auVar101._8_4_;
                auVar152._12_4_ = auVar98._12_4_ * auVar101._12_4_;
                auVar152._16_4_ = auVar98._16_4_ * auVar101._16_4_;
                auVar152._20_4_ = auVar98._20_4_ * auVar101._20_4_;
                auVar152._28_36_ = in_ZMM3._28_36_;
                auVar152._24_4_ = auVar98._24_4_ * auVar101._24_4_;
                auVar106 = auVar152._0_32_;
                in_ZMM3 = ZEXT3264(auVar106);
                auVar71 = vfmsub213ps_fma(auVar72,auVar106,auVar98);
                auVar71 = vfnmadd213ps_fma(ZEXT1632(auVar71),auVar101,auVar106);
                *(undefined1 (*) [32])((long)*pauVar52 + lVar56) = ZEXT1632(auVar71);
                lVar56 = lVar56 + 0x20;
              }
              for (; iVar58 + 3 < iVar61; iVar58 = iVar58 + 4) {
                auVar71 = *(undefined1 (*) [16])(*pauVar67 + lVar56);
                auVar78 = *(undefined1 (*) [16])((long)pvVar3 + lVar56 + lVar63);
                auVar97 = vrcpps_avx(auVar78);
                auVar147._0_4_ = auVar71._0_4_ * auVar97._0_4_;
                auVar147._4_4_ = auVar71._4_4_ * auVar97._4_4_;
                auVar147._8_4_ = auVar71._8_4_ * auVar97._8_4_;
                auVar147._12_4_ = auVar71._12_4_ * auVar97._12_4_;
                in_ZMM3 = ZEXT1664(auVar147);
                auVar71 = vfmsub213ps_fma(auVar78,auVar147,auVar71);
                auVar71 = vfnmadd213ps_fma(auVar71,auVar97,auVar147);
                *(undefined1 (*) [16])((long)*pauVar52 + lVar56) = auVar71;
                lVar56 = lVar56 + 0x10;
              }
              pfVar59 = (float *)((long)pvVar3 + lVar63 + lVar56);
              pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + lVar56);
              pauVar67 = (undefined1 (*) [64])(*pauVar67 + lVar56);
              for (; iVar58 < iVar61; iVar58 = iVar58 + 1) {
                *(float *)*pauVar52 = *(float *)*pauVar67 / *pfVar59;
                pauVar67 = (undefined1 (*) [64])(*pauVar67 + 4);
                pfVar59 = pfVar59 + 1;
                pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 4);
              }
            }
          }
          return 0;
        case 4:
          iVar61 = uVar55 * m->elempack;
          iVar47 = m->h;
          if (m->h < 1) {
            iVar47 = 0;
          }
          uVar42 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar42 = 0;
          }
          for (uVar37 = 0; uVar37 != uVar42; uVar37 = uVar37 + 1) {
            pauVar67 = (undefined1 (*) [64])(m->cstep * uVar37 * m->elemsize + (long)m->data);
            pauVar52 = (undefined1 (*) [64])
                       (pMVar159->cstep * uVar37 * pMVar159->elemsize + (long)pMVar159->data);
            for (iVar44 = 0; iVar44 != iVar47; iVar44 = iVar44 + 1) {
              pvVar3 = b->data;
              lVar63 = b->cstep * uVar37 * b->elemsize;
              pauVar46 = (undefined1 (*) [64])((long)pvVar3 + lVar63);
              lVar56 = 0;
              pauVar65 = pauVar52;
              pauVar70 = pauVar67;
              for (iVar58 = 0; iVar58 + 0xf < iVar61; iVar58 = iVar58 + 0x10) {
                auVar138 = vmaxps_avx512f(*pauVar70,*pauVar46);
                *pauVar65 = auVar138;
                pauVar70 = pauVar70 + 1;
                pauVar46 = pauVar46 + 1;
                pauVar65 = pauVar65 + 1;
                lVar56 = lVar56 + 0x40;
              }
              for (; iVar58 + 7 < iVar61; iVar58 = iVar58 + 8) {
                auVar72 = vmaxps_avx(*(undefined1 (*) [32])(*pauVar67 + lVar56),
                                     *(undefined1 (*) [32])((long)pvVar3 + lVar56 + lVar63));
                *(undefined1 (*) [32])((long)*pauVar52 + lVar56) = auVar72;
                lVar56 = lVar56 + 0x20;
              }
              for (; iVar58 + 3 < iVar61; iVar58 = iVar58 + 4) {
                auVar71 = vmaxps_avx(*(undefined1 (*) [16])(*pauVar67 + lVar56),
                                     *(undefined1 (*) [16])((long)pvVar3 + lVar56 + lVar63));
                *(undefined1 (*) [16])((long)*pauVar52 + lVar56) = auVar71;
                lVar56 = lVar56 + 0x10;
              }
              puVar43 = (uint *)((long)pvVar3 + lVar63 + lVar56);
              pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + lVar56);
              pauVar67 = (undefined1 (*) [64])(*pauVar67 + lVar56);
              for (; iVar58 < iVar61; iVar58 = iVar58 + 1) {
                auVar71 = vmaxss_avx(ZEXT416(*puVar43),ZEXT416(*(uint *)*pauVar67));
                *(int *)*pauVar52 = auVar71._0_4_;
                pauVar67 = (undefined1 (*) [64])(*pauVar67 + 4);
                puVar43 = puVar43 + 1;
                pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 4);
              }
            }
          }
          return 0;
        case 5:
          iVar61 = uVar55 * m->elempack;
          iVar47 = m->h;
          if (m->h < 1) {
            iVar47 = 0;
          }
          uVar42 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar42 = 0;
          }
          for (uVar37 = 0; uVar37 != uVar42; uVar37 = uVar37 + 1) {
            pauVar67 = (undefined1 (*) [64])(m->cstep * uVar37 * m->elemsize + (long)m->data);
            pauVar52 = (undefined1 (*) [64])
                       (pMVar159->cstep * uVar37 * pMVar159->elemsize + (long)pMVar159->data);
            for (iVar44 = 0; iVar44 != iVar47; iVar44 = iVar44 + 1) {
              pvVar3 = b->data;
              lVar63 = b->cstep * uVar37 * b->elemsize;
              pauVar46 = (undefined1 (*) [64])((long)pvVar3 + lVar63);
              lVar56 = 0;
              pauVar65 = pauVar52;
              pauVar70 = pauVar67;
              for (iVar58 = 0; iVar58 + 0xf < iVar61; iVar58 = iVar58 + 0x10) {
                auVar138 = vminps_avx512f(*pauVar70,*pauVar46);
                *pauVar65 = auVar138;
                pauVar70 = pauVar70 + 1;
                pauVar46 = pauVar46 + 1;
                pauVar65 = pauVar65 + 1;
                lVar56 = lVar56 + 0x40;
              }
              for (; iVar58 + 7 < iVar61; iVar58 = iVar58 + 8) {
                auVar72 = vminps_avx(*(undefined1 (*) [32])(*pauVar67 + lVar56),
                                     *(undefined1 (*) [32])((long)pvVar3 + lVar56 + lVar63));
                *(undefined1 (*) [32])((long)*pauVar52 + lVar56) = auVar72;
                lVar56 = lVar56 + 0x20;
              }
              for (; iVar58 + 3 < iVar61; iVar58 = iVar58 + 4) {
                auVar71 = vminps_avx(*(undefined1 (*) [16])(*pauVar67 + lVar56),
                                     *(undefined1 (*) [16])((long)pvVar3 + lVar56 + lVar63));
                *(undefined1 (*) [16])((long)*pauVar52 + lVar56) = auVar71;
                lVar56 = lVar56 + 0x10;
              }
              puVar43 = (uint *)((long)pvVar3 + lVar63 + lVar56);
              pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + lVar56);
              pauVar67 = (undefined1 (*) [64])(*pauVar67 + lVar56);
              for (; iVar58 < iVar61; iVar58 = iVar58 + 1) {
                auVar71 = vminss_avx(ZEXT416(*puVar43),ZEXT416(*(uint *)*pauVar67));
                *(int *)*pauVar52 = auVar71._0_4_;
                pauVar67 = (undefined1 (*) [64])(*pauVar67 + 4);
                puVar43 = puVar43 + 1;
                pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 4);
              }
            }
          }
          return 0;
        case 6:
          iVar47 = m->h;
          iVar61 = uVar55 * m->elempack;
          uVar42 = 0;
          if (iVar47 < 1) {
            iVar47 = 0;
          }
          pMVar49 = m;
          uVar37 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar37 = uVar42;
          }
          for (; uVar42 != uVar37; uVar42 = uVar42 + 1) {
            pfVar59 = (float *)(m->cstep * uVar42 * m->elemsize + (long)m->data);
            pauVar67 = (undefined1 (*) [64])
                       (pMVar159->cstep * uVar42 * pMVar159->elemsize + (long)pMVar159->data);
            uVar160 = (undefined4)uVar42;
            uVar155 = (undefined4)(uVar42 >> 0x20);
            for (iVar44 = 0; iVar44 != iVar47; iVar44 = iVar44 + 1) {
              pvVar3 = b->data;
              lVar63 = b->cstep * uVar42 * b->elemsize;
              uVar158 = SUB84(pvVar3,0);
              uVar161 = (undefined4)((ulong)pvVar3 >> 0x20);
              pauVar52 = (undefined1 (*) [64])((long)pvVar3 + lVar63);
              lVar56 = 0;
              uVar157 = SUB84(pauVar67,0);
              uVar156 = (undefined4)((ulong)pauVar67 >> 0x20);
              m = pMVar49;
              pfVar64 = pfVar59;
              for (iVar58 = 0; iVar58 + 0xf < iVar61; iVar58 = iVar58 + 0x10) {
                local_100 = *(float (*) [2])pfVar59;
                afStack_f8 = *(float (*) [2])(pfVar59 + 2);
                afStack_f0 = *(float (*) [2])(pfVar59 + 4);
                afStack_e8 = *(float (*) [2])(pfVar59 + 6);
                afStack_e0 = *(float (*) [2])(pfVar59 + 8);
                afStack_d8 = *(float (*) [2])(pfVar59 + 10);
                afStack_d0 = *(float (*) [2])(pfVar59 + 0xc);
                afStack_c8 = *(float (*) [2])(pfVar59 + 0xe);
                auVar138 = vmovdqu64_avx512f(*pauVar52);
                local_140 = (__m512)vmovdqa64_avx512f(auVar138);
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                          ((binary_op_pow *)local_c0,(__m512 *)local_100,&local_140);
                auVar138 = vmovdqu64_avx512f(auVar138);
                *pauVar67 = auVar138;
                pfVar59 = pfVar59 + 0x10;
                pauVar52 = pauVar52 + 1;
                pauVar67 = pauVar67 + 1;
                lVar56 = lVar56 + 0x40;
              }
              lVar57 = CONCAT44(uVar161,uVar158) + lVar63;
              for (; iVar58 + 7 < iVar61; iVar58 = iVar58 + 8) {
                pfVar59 = (float *)((long)pfVar64 + lVar56);
                local_100 = *(float (*) [2])pfVar59;
                afStack_f8 = *(float (*) [2])(pfVar59 + 2);
                afStack_f0 = *(float (*) [2])(pfVar59 + 4);
                afStack_e8 = *(float (*) [2])(pfVar59 + 6);
                auVar72 = *(undefined1 (*) [32])(lVar57 + lVar56);
                local_140[0] = (float)auVar72._0_4_;
                local_140[1] = (float)auVar72._4_4_;
                local_140[2] = (float)auVar72._8_4_;
                local_140[3] = (float)auVar72._12_4_;
                local_140[4] = (float)auVar72._16_4_;
                local_140[5] = (float)auVar72._20_4_;
                local_140[6] = (float)auVar72._24_4_;
                local_140[7] = (float)auVar72._28_4_;
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                          ((binary_op_pow *)local_c0,(__m256 *)local_100,(__m256 *)local_140);
                *(undefined1 (*) [32])(CONCAT44(uVar156,uVar157) + lVar56) = auVar72;
                lVar56 = lVar56 + 0x20;
              }
              for (; iVar58 + 3 < iVar61; iVar58 = iVar58 + 4) {
                local_100 = *(float (*) [2])((long)pfVar64 + lVar56);
                afStack_f8 = *(float (*) [2])((float *)((long)pfVar64 + lVar56) + 2);
                pauVar1 = (undefined1 (*) [16])(lVar57 + lVar56);
                local_140._0_16_ = *pauVar1;
                auVar124 = ZEXT856(*(ulong *)(*pauVar1 + 8));
                afVar154 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                     ((binary_op_pow *)local_c0,(__m128 *)local_100,
                                      (__m128 *)local_140);
                auVar119._0_8_ = afVar154._0_8_;
                auVar119._8_56_ = auVar124;
                *(undefined1 (*) [16])(CONCAT44(uVar156,uVar157) + lVar56) = auVar119._0_16_;
                lVar56 = lVar56 + 0x10;
              }
              pfVar53 = (float *)(CONCAT44(uVar161,uVar158) + lVar56 + lVar63);
              pauVar67 = (undefined1 (*) [64])(CONCAT44(uVar156,uVar157) + lVar56);
              pfVar59 = (float *)((long)pfVar64 + lVar56);
              for (; iVar58 < iVar61; iVar58 = iVar58 + 1) {
                fVar77 = powf(*pfVar59,*pfVar53);
                *(float *)*pauVar67 = fVar77;
                pfVar59 = pfVar59 + 1;
                pfVar53 = pfVar53 + 1;
                pauVar67 = (undefined1 (*) [64])(*pauVar67 + 4);
              }
              uVar42 = CONCAT44(uVar155,uVar160);
              pMVar49 = m;
            }
          }
          break;
        case 7:
          iVar61 = uVar55 * m->elempack;
          iVar47 = m->h;
          if (m->h < 1) {
            iVar47 = 0;
          }
          uVar42 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar42 = 0;
          }
          for (uVar37 = 0; uVar37 != uVar42; uVar37 = uVar37 + 1) {
            pauVar67 = (undefined1 (*) [64])(m->cstep * uVar37 * m->elemsize + (long)m->data);
            pauVar52 = (undefined1 (*) [64])
                       (pMVar159->cstep * uVar37 * pMVar159->elemsize + (long)pMVar159->data);
            for (iVar44 = 0; iVar44 != iVar47; iVar44 = iVar44 + 1) {
              pvVar3 = b->data;
              lVar63 = b->cstep * uVar37 * b->elemsize;
              pauVar46 = (undefined1 (*) [64])((long)pvVar3 + lVar63);
              lVar56 = 0;
              pauVar65 = pauVar52;
              pauVar70 = pauVar67;
              for (iVar58 = 0; iVar58 + 0xf < iVar61; iVar58 = iVar58 + 0x10) {
                auVar138 = vsubps_avx512f(*pauVar46,*pauVar70);
                *pauVar65 = auVar138;
                pauVar70 = pauVar70 + 1;
                pauVar46 = pauVar46 + 1;
                pauVar65 = pauVar65 + 1;
                lVar56 = lVar56 + 0x40;
              }
              for (; iVar58 + 7 < iVar61; iVar58 = iVar58 + 8) {
                auVar72 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar3 + lVar56 + lVar63),
                                     *(undefined1 (*) [32])(*pauVar67 + lVar56));
                *(undefined1 (*) [32])((long)*pauVar52 + lVar56) = auVar72;
                lVar56 = lVar56 + 0x20;
              }
              for (; iVar58 + 3 < iVar61; iVar58 = iVar58 + 4) {
                auVar71 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar3 + lVar56 + lVar63),
                                     *(undefined1 (*) [16])(*pauVar67 + lVar56));
                *(undefined1 (*) [16])((long)*pauVar52 + lVar56) = auVar71;
                lVar56 = lVar56 + 0x10;
              }
              pfVar59 = (float *)((long)pvVar3 + lVar63 + lVar56);
              pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + lVar56);
              pauVar67 = (undefined1 (*) [64])(*pauVar67 + lVar56);
              for (; iVar58 < iVar61; iVar58 = iVar58 + 1) {
                *(float *)*pauVar52 = *pfVar59 - *(float *)*pauVar67;
                pauVar67 = (undefined1 (*) [64])(*pauVar67 + 4);
                pfVar59 = pfVar59 + 1;
                pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 4);
              }
            }
          }
          return 0;
        case 8:
          iVar61 = uVar55 * m->elempack;
          iVar47 = m->h;
          if (m->h < 1) {
            iVar47 = 0;
          }
          uVar42 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar42 = 0;
          }
          for (uVar37 = 0; uVar37 != uVar42; uVar37 = uVar37 + 1) {
            pauVar67 = (undefined1 (*) [64])(m->cstep * uVar37 * m->elemsize + (long)m->data);
            pauVar52 = (undefined1 (*) [64])
                       (pMVar159->cstep * uVar37 * pMVar159->elemsize + (long)pMVar159->data);
            for (iVar44 = 0; iVar44 != iVar47; iVar44 = iVar44 + 1) {
              pvVar3 = b->data;
              lVar63 = b->cstep * uVar37 * b->elemsize;
              pauVar46 = (undefined1 (*) [64])((long)pvVar3 + lVar63);
              lVar56 = 0;
              pauVar65 = pauVar52;
              pauVar70 = pauVar67;
              for (iVar58 = 0; iVar58 + 0xf < iVar61; iVar58 = iVar58 + 0x10) {
                auVar138 = vrcp14ps_avx512f(*pauVar70);
                in_ZMM3 = vmulps_avx512f(*pauVar46,auVar138);
                auVar73 = vfmsub213ps_avx512f(*pauVar70,in_ZMM3,*pauVar46);
                auVar138 = vfnmadd213ps_avx512f(auVar73,auVar138,in_ZMM3);
                *pauVar65 = auVar138;
                pauVar70 = pauVar70 + 1;
                pauVar46 = pauVar46 + 1;
                pauVar65 = pauVar65 + 1;
                lVar56 = lVar56 + 0x40;
              }
              for (; iVar58 + 7 < iVar61; iVar58 = iVar58 + 8) {
                auVar98 = vrcpps_avx(*(undefined1 (*) [32])(*pauVar67 + lVar56));
                auVar72 = *(undefined1 (*) [32])((long)pvVar3 + lVar56 + lVar63);
                auVar153._0_4_ = auVar72._0_4_ * auVar98._0_4_;
                auVar153._4_4_ = auVar72._4_4_ * auVar98._4_4_;
                auVar153._8_4_ = auVar72._8_4_ * auVar98._8_4_;
                auVar153._12_4_ = auVar72._12_4_ * auVar98._12_4_;
                auVar153._16_4_ = auVar72._16_4_ * auVar98._16_4_;
                auVar153._20_4_ = auVar72._20_4_ * auVar98._20_4_;
                auVar153._28_36_ = in_ZMM3._28_36_;
                auVar153._24_4_ = auVar72._24_4_ * auVar98._24_4_;
                auVar101 = auVar153._0_32_;
                in_ZMM3 = ZEXT3264(auVar101);
                auVar71 = vfmsub213ps_fma(*(undefined1 (*) [32])(*pauVar67 + lVar56),auVar101,
                                          auVar72);
                auVar71 = vfnmadd213ps_fma(ZEXT1632(auVar71),auVar98,auVar101);
                *(undefined1 (*) [32])((long)*pauVar52 + lVar56) = ZEXT1632(auVar71);
                lVar56 = lVar56 + 0x20;
              }
              for (; iVar58 + 3 < iVar61; iVar58 = iVar58 + 4) {
                auVar78 = vrcpps_avx(*(undefined1 (*) [16])(*pauVar67 + lVar56));
                auVar71 = *(undefined1 (*) [16])((long)pvVar3 + lVar56 + lVar63);
                auVar148._0_4_ = auVar71._0_4_ * auVar78._0_4_;
                auVar148._4_4_ = auVar71._4_4_ * auVar78._4_4_;
                auVar148._8_4_ = auVar71._8_4_ * auVar78._8_4_;
                auVar148._12_4_ = auVar71._12_4_ * auVar78._12_4_;
                in_ZMM3 = ZEXT1664(auVar148);
                auVar71 = vfmsub213ps_fma(*(undefined1 (*) [16])(*pauVar67 + lVar56),auVar148,
                                          auVar71);
                auVar71 = vfnmadd213ps_fma(auVar71,auVar78,auVar148);
                *(undefined1 (*) [16])((long)*pauVar52 + lVar56) = auVar71;
                lVar56 = lVar56 + 0x10;
              }
              pfVar59 = (float *)((long)pvVar3 + lVar63 + lVar56);
              pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + lVar56);
              pauVar67 = (undefined1 (*) [64])(*pauVar67 + lVar56);
              for (; iVar58 < iVar61; iVar58 = iVar58 + 1) {
                *(float *)*pauVar52 = *pfVar59 / *(float *)*pauVar67;
                pauVar67 = (undefined1 (*) [64])(*pauVar67 + 4);
                pfVar59 = pfVar59 + 1;
                pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 4);
              }
            }
          }
          return 0;
        case 9:
          iVar47 = m->h;
          iVar61 = uVar55 * m->elempack;
          uVar42 = 0;
          if (iVar47 < 1) {
            iVar47 = 0;
          }
          pMVar49 = m;
          uVar37 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar37 = uVar42;
          }
          for (; uVar42 != uVar37; uVar42 = uVar42 + 1) {
            pfVar59 = (float *)(m->cstep * uVar42 * m->elemsize + (long)m->data);
            pauVar67 = (undefined1 (*) [64])
                       (pMVar159->cstep * uVar42 * pMVar159->elemsize + (long)pMVar159->data);
            uVar160 = (undefined4)uVar42;
            uVar155 = (undefined4)(uVar42 >> 0x20);
            for (iVar44 = 0; iVar44 != iVar47; iVar44 = iVar44 + 1) {
              pvVar3 = b->data;
              lVar63 = b->cstep * uVar42 * b->elemsize;
              uVar158 = SUB84(pvVar3,0);
              uVar161 = (undefined4)((ulong)pvVar3 >> 0x20);
              pauVar52 = (undefined1 (*) [64])((long)pvVar3 + lVar63);
              lVar56 = 0;
              uVar157 = SUB84(pauVar67,0);
              uVar156 = (undefined4)((ulong)pauVar67 >> 0x20);
              m = pMVar49;
              pfVar64 = pfVar59;
              for (iVar58 = 0; iVar58 + 0xf < iVar61; iVar58 = iVar58 + 0x10) {
                local_100 = *(float (*) [2])pfVar59;
                afStack_f8 = *(float (*) [2])(pfVar59 + 2);
                afStack_f0 = *(float (*) [2])(pfVar59 + 4);
                afStack_e8 = *(float (*) [2])(pfVar59 + 6);
                afStack_e0 = *(float (*) [2])(pfVar59 + 8);
                afStack_d8 = *(float (*) [2])(pfVar59 + 10);
                afStack_d0 = *(float (*) [2])(pfVar59 + 0xc);
                afStack_c8 = *(float (*) [2])(pfVar59 + 0xe);
                auVar138 = vmovdqu64_avx512f(*pauVar52);
                local_140 = (__m512)vmovdqa64_avx512f(auVar138);
                BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16
                          ((binary_op_rpow *)local_c0,(__m512 *)local_100,&local_140);
                auVar138 = vmovdqu64_avx512f(auVar138);
                *pauVar67 = auVar138;
                pfVar59 = pfVar59 + 0x10;
                pauVar52 = pauVar52 + 1;
                pauVar67 = pauVar67 + 1;
                lVar56 = lVar56 + 0x40;
              }
              lVar57 = CONCAT44(uVar161,uVar158) + lVar63;
              for (; iVar58 + 7 < iVar61; iVar58 = iVar58 + 8) {
                pfVar59 = (float *)((long)pfVar64 + lVar56);
                local_100 = *(float (*) [2])pfVar59;
                afStack_f8 = *(float (*) [2])(pfVar59 + 2);
                afStack_f0 = *(float (*) [2])(pfVar59 + 4);
                afStack_e8 = *(float (*) [2])(pfVar59 + 6);
                auVar72 = *(undefined1 (*) [32])(lVar57 + lVar56);
                local_140[0] = (float)auVar72._0_4_;
                local_140[1] = (float)auVar72._4_4_;
                local_140[2] = (float)auVar72._8_4_;
                local_140[3] = (float)auVar72._12_4_;
                local_140[4] = (float)auVar72._16_4_;
                local_140[5] = (float)auVar72._20_4_;
                local_140[6] = (float)auVar72._24_4_;
                local_140[7] = (float)auVar72._28_4_;
                BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8
                          ((binary_op_rpow *)local_c0,(__m256 *)local_100,(__m256 *)local_140);
                *(undefined1 (*) [32])(CONCAT44(uVar156,uVar157) + lVar56) = auVar72;
                lVar56 = lVar56 + 0x20;
              }
              for (; iVar58 + 3 < iVar61; iVar58 = iVar58 + 4) {
                local_100 = *(float (*) [2])((long)pfVar64 + lVar56);
                afStack_f8 = *(float (*) [2])((float *)((long)pfVar64 + lVar56) + 2);
                pauVar1 = (undefined1 (*) [16])(lVar57 + lVar56);
                local_140._0_16_ = *pauVar1;
                auVar124 = ZEXT856(*(ulong *)(*pauVar1 + 8));
                afVar154 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                                     ((binary_op_rpow *)local_c0,(__m128 *)local_100,
                                      (__m128 *)local_140);
                auVar118._0_8_ = afVar154._0_8_;
                auVar118._8_56_ = auVar124;
                *(undefined1 (*) [16])(CONCAT44(uVar156,uVar157) + lVar56) = auVar118._0_16_;
                lVar56 = lVar56 + 0x10;
              }
              pfVar53 = (float *)(CONCAT44(uVar161,uVar158) + lVar56 + lVar63);
              pauVar67 = (undefined1 (*) [64])(CONCAT44(uVar156,uVar157) + lVar56);
              pfVar59 = (float *)((long)pfVar64 + lVar56);
              for (; iVar58 < iVar61; iVar58 = iVar58 + 1) {
                fVar77 = powf(*pfVar53,*pfVar59);
                *(float *)*pauVar67 = fVar77;
                pfVar59 = pfVar59 + 1;
                pfVar53 = pfVar53 + 1;
                pauVar67 = (undefined1 (*) [64])(*pauVar67 + 4);
              }
              uVar42 = CONCAT44(uVar155,uVar160);
              pMVar49 = m;
            }
          }
          break;
        case 10:
          iVar47 = m->h;
          iVar61 = uVar55 * m->elempack;
          uVar155 = 0;
          uVar42 = 0;
          if (iVar47 < 1) {
            iVar47 = 0;
          }
          pMVar49 = m;
          uVar37 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar37 = uVar42;
          }
          for (; uVar42 != uVar37; uVar42 = uVar42 + 1) {
            pauVar52 = (undefined1 (*) [64])(m->cstep * uVar42 * m->elemsize + (long)m->data);
            pauVar67 = (undefined1 (*) [64])
                       (pMVar159->cstep * uVar42 * pMVar159->elemsize + (long)pMVar159->data);
            uVar157 = (undefined4)uVar42;
            uVar156 = (undefined4)(uVar42 >> 0x20);
            for (iVar44 = 0; iVar44 != iVar47; iVar44 = iVar44 + 1) {
              pvVar3 = b->data;
              lVar63 = b->cstep * uVar42 * b->elemsize;
              uVar158 = SUB84(pvVar3,0);
              uVar161 = (undefined4)((ulong)pvVar3 >> 0x20);
              pauVar46 = (undefined1 (*) [64])((long)pvVar3 + lVar63);
              lVar56 = 0;
              iVar58 = 0;
              m = pMVar49;
              pauVar65 = pauVar52;
              pauVar70 = pauVar67;
              while( true ) {
                if (iVar61 <= iVar58 + 0xf) break;
                auVar138 = vmovdqu64_avx512f(*pauVar52);
                vmovdqu64_avx512f(*pauVar46);
                y_07[4] = (float)iVar61;
                y_07[0] = (float)in_stack_fffffffffffffe00._0_4_;
                y_07[1] = (float)in_stack_fffffffffffffe00._4_4_;
                y_07[2] = (float)in_stack_fffffffffffffe00._8_4_;
                y_07[3] = (float)in_stack_fffffffffffffe00._12_4_;
                y_07[5] = (float)uVar155;
                y_07[6] = (float)(int)in_stack_fffffffffffffe18;
                y_07[7] = (float)(int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
                y_07[8] = (float)(int)pauVar65;
                y_07[9] = (float)(int)((ulong)pauVar65 >> 0x20);
                y_07._40_8_ = pMVar159;
                y_07[0xc] = (float)iVar44;
                y_07[0xd] = (float)uVar160;
                y_07[0xe] = (float)(int)pauVar70;
                y_07[0xf] = (float)((ulong)pauVar70 >> 0x20);
                x_06[2] = (float)(int)uVar37;
                x_06[3] = (float)(int)(uVar37 >> 0x20);
                x_06._0_8_ = m;
                x_06[4] = (float)(int)lVar63;
                x_06[5] = (float)(int)((ulong)lVar63 >> 0x20);
                x_06[6] = (float)(int)in_stack_fffffffffffffe58;
                x_06[7] = (float)(int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
                x_06[8] = (float)uVar158;
                x_06[9] = (float)uVar161;
                x_06[10] = (float)uVar157;
                x_06[0xb] = (float)uVar156;
                x_06[0xc] = (float)iVar47;
                x_06[0xd] = (float)in_stack_fffffffffffffe74;
                x_06[0xe] = (float)(int)in_stack_fffffffffffffe78;
                x_06[0xf] = (float)(int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
                atan2512_ps((__m512 *)pbVar51,y_07,x_06);
                auVar138 = vmovdqu64_avx512f(auVar138);
                *pauVar67 = auVar138;
                pauVar52 = pauVar52 + 1;
                pauVar46 = pauVar46 + 1;
                pauVar67 = pauVar67 + 1;
                iVar58 = iVar58 + 0x10;
                lVar56 = lVar56 + 0x40;
              }
              lVar57 = CONCAT44(uVar161,uVar158) + lVar63;
              for (; iVar58 + 7 < iVar61; iVar58 = iVar58 + 8) {
                pfVar59 = (float *)(*pauVar65 + lVar56);
                local_100 = *(float (*) [2])pfVar59;
                afStack_f8 = *(float (*) [2])(pfVar59 + 2);
                afStack_f0 = *(float (*) [2])(pfVar59 + 4);
                afStack_e8 = *(float (*) [2])(pfVar59 + 6);
                auVar72 = *(undefined1 (*) [32])(lVar57 + lVar56);
                local_140[0] = (float)auVar72._0_4_;
                local_140[1] = (float)auVar72._4_4_;
                local_140[2] = (float)auVar72._8_4_;
                local_140[3] = (float)auVar72._12_4_;
                local_140[4] = (float)auVar72._16_4_;
                local_140[5] = (float)auVar72._20_4_;
                local_140[6] = (float)auVar72._24_4_;
                local_140[7] = (float)auVar72._28_4_;
                pbVar51 = local_c0;
                BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack8
                          ((binary_op_atan2 *)local_c0,(__m256 *)local_100,(__m256 *)local_140);
                *(undefined1 (*) [32])(*pauVar70 + lVar56) = auVar72;
                lVar56 = lVar56 + 0x20;
              }
              for (; iVar58 + 3 < iVar61; iVar58 = iVar58 + 4) {
                local_100 = *(float (*) [2])(*pauVar65 + lVar56);
                afStack_f8 = *(float (*) [2])((long)(*pauVar65 + lVar56) + 8);
                pauVar1 = (undefined1 (*) [16])(lVar57 + lVar56);
                local_140._0_16_ = *pauVar1;
                auVar124 = ZEXT856(*(ulong *)(*pauVar1 + 8));
                pbVar51 = local_c0;
                afVar154 = BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack4
                                     ((binary_op_atan2 *)local_c0,(__m128 *)local_100,
                                      (__m128 *)local_140);
                auVar120._0_8_ = afVar154._0_8_;
                auVar120._8_56_ = auVar124;
                *(undefined1 (*) [16])(*pauVar70 + lVar56) = auVar120._0_16_;
                lVar56 = lVar56 + 0x10;
              }
              pfVar59 = (float *)(CONCAT44(uVar161,uVar158) + lVar56 + lVar63);
              pauVar67 = (undefined1 (*) [64])(*pauVar70 + lVar56);
              pauVar52 = (undefined1 (*) [64])(*pauVar65 + lVar56);
              for (; iVar58 < iVar61; iVar58 = iVar58 + 1) {
                pbVar51 = local_c0;
                fVar77 = BinaryOp_x86_avx512_functor::binary_op_atan2::func
                                   ((binary_op_atan2 *)local_c0,(float *)pauVar52,pfVar59);
                *(float *)*pauVar67 = fVar77;
                pauVar52 = (undefined1 (*) [64])(*pauVar52 + 4);
                pfVar59 = pfVar59 + 1;
                pauVar67 = (undefined1 (*) [64])(*pauVar67 + 4);
              }
              uVar42 = CONCAT44(uVar156,uVar157);
              pMVar49 = m;
            }
          }
          break;
        case 0xb:
          iVar47 = m->h;
          iVar61 = uVar55 * m->elempack;
          uVar155 = 0;
          uVar42 = 0;
          if (iVar47 < 1) {
            iVar47 = 0;
          }
          pMVar49 = m;
          uVar37 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar37 = uVar42;
          }
          for (; uVar42 != uVar37; uVar42 = uVar42 + 1) {
            pauVar52 = (undefined1 (*) [64])(m->cstep * uVar42 * m->elemsize + (long)m->data);
            pauVar67 = (undefined1 (*) [64])
                       (pMVar159->cstep * uVar42 * pMVar159->elemsize + (long)pMVar159->data);
            uVar157 = (undefined4)uVar42;
            uVar156 = (undefined4)(uVar42 >> 0x20);
            for (iVar44 = 0; iVar44 != iVar47; iVar44 = iVar44 + 1) {
              pvVar3 = b->data;
              lVar63 = b->cstep * uVar42 * b->elemsize;
              uVar158 = SUB84(pvVar3,0);
              uVar161 = (undefined4)((ulong)pvVar3 >> 0x20);
              pauVar46 = (undefined1 (*) [64])((long)pvVar3 + lVar63);
              lVar56 = 0;
              iVar58 = 0;
              m = pMVar49;
              pauVar65 = pauVar52;
              pauVar70 = pauVar67;
              while( true ) {
                if (iVar61 <= iVar58 + 0xf) break;
                vmovdqu64_avx512f(*pauVar52);
                auVar138 = vmovdqu64_avx512f(*pauVar46);
                y_06[4] = (float)iVar61;
                y_06[0] = (float)in_stack_fffffffffffffe00._0_4_;
                y_06[1] = (float)in_stack_fffffffffffffe00._4_4_;
                y_06[2] = (float)in_stack_fffffffffffffe00._8_4_;
                y_06[3] = (float)in_stack_fffffffffffffe00._12_4_;
                y_06[5] = (float)uVar155;
                y_06[6] = (float)(int)in_stack_fffffffffffffe18;
                y_06[7] = (float)(int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
                y_06[8] = (float)(int)pauVar65;
                y_06[9] = (float)(int)((ulong)pauVar65 >> 0x20);
                y_06._40_8_ = pMVar159;
                y_06[0xc] = (float)iVar44;
                y_06[0xd] = (float)uVar160;
                y_06[0xe] = (float)(int)pauVar70;
                y_06[0xf] = (float)((ulong)pauVar70 >> 0x20);
                x_05[2] = (float)(int)uVar37;
                x_05[3] = (float)(int)(uVar37 >> 0x20);
                x_05._0_8_ = m;
                x_05[4] = (float)(int)lVar63;
                x_05[5] = (float)(int)((ulong)lVar63 >> 0x20);
                x_05[6] = (float)(int)in_stack_fffffffffffffe58;
                x_05[7] = (float)(int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
                x_05[8] = (float)uVar158;
                x_05[9] = (float)uVar161;
                x_05[10] = (float)uVar157;
                x_05[0xb] = (float)uVar156;
                x_05[0xc] = (float)iVar47;
                x_05[0xd] = (float)in_stack_fffffffffffffe74;
                x_05[0xe] = (float)(int)in_stack_fffffffffffffe78;
                x_05[0xf] = (float)(int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
                atan2512_ps((__m512 *)pbVar51,y_06,x_05);
                auVar138 = vmovdqu64_avx512f(auVar138);
                *pauVar67 = auVar138;
                pauVar52 = pauVar52 + 1;
                pauVar46 = pauVar46 + 1;
                pauVar67 = pauVar67 + 1;
                iVar58 = iVar58 + 0x10;
                lVar56 = lVar56 + 0x40;
              }
              lVar57 = CONCAT44(uVar161,uVar158) + lVar63;
              for (; iVar58 + 7 < iVar61; iVar58 = iVar58 + 8) {
                pfVar59 = (float *)(*pauVar65 + lVar56);
                local_100 = *(float (*) [2])pfVar59;
                afStack_f8 = *(float (*) [2])(pfVar59 + 2);
                afStack_f0 = *(float (*) [2])(pfVar59 + 4);
                afStack_e8 = *(float (*) [2])(pfVar59 + 6);
                auVar72 = *(undefined1 (*) [32])(lVar57 + lVar56);
                local_140[0] = (float)auVar72._0_4_;
                local_140[1] = (float)auVar72._4_4_;
                local_140[2] = (float)auVar72._8_4_;
                local_140[3] = (float)auVar72._12_4_;
                local_140[4] = (float)auVar72._16_4_;
                local_140[5] = (float)auVar72._20_4_;
                local_140[6] = (float)auVar72._24_4_;
                local_140[7] = (float)auVar72._28_4_;
                pbVar51 = local_c0;
                BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack8
                          (local_c0,(__m256 *)local_100,(__m256 *)local_140);
                *(undefined1 (*) [32])(*pauVar70 + lVar56) = auVar72;
                lVar56 = lVar56 + 0x20;
              }
              for (; iVar58 + 3 < iVar61; iVar58 = iVar58 + 4) {
                local_100 = *(float (*) [2])(*pauVar65 + lVar56);
                afStack_f8 = *(float (*) [2])((long)(*pauVar65 + lVar56) + 8);
                pauVar1 = (undefined1 (*) [16])(lVar57 + lVar56);
                local_140._0_16_ = *pauVar1;
                auVar124 = ZEXT856(*(ulong *)(*pauVar1 + 8));
                pbVar51 = local_c0;
                afVar154 = BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack4
                                     (local_c0,(__m128 *)local_100,(__m128 *)local_140);
                auVar117._0_8_ = afVar154._0_8_;
                auVar117._8_56_ = auVar124;
                *(undefined1 (*) [16])(*pauVar70 + lVar56) = auVar117._0_16_;
                lVar56 = lVar56 + 0x10;
              }
              pfVar59 = (float *)(CONCAT44(uVar161,uVar158) + lVar56 + lVar63);
              pauVar67 = (undefined1 (*) [64])(*pauVar70 + lVar56);
              pauVar52 = (undefined1 (*) [64])(*pauVar65 + lVar56);
              for (; iVar58 < iVar61; iVar58 = iVar58 + 1) {
                pbVar51 = local_c0;
                fVar77 = BinaryOp_x86_avx512_functor::binary_op_ratan2::func
                                   (local_c0,(float *)pauVar52,pfVar59);
                *(float *)*pauVar67 = fVar77;
                pauVar52 = (undefined1 (*) [64])(*pauVar52 + 4);
                pfVar59 = pfVar59 + 1;
                pauVar67 = (undefined1 (*) [64])(*pauVar67 + 4);
              }
              uVar42 = CONCAT44(uVar156,uVar157);
              pMVar49 = m;
            }
          }
          break;
        default:
          return 0;
        }
      }
      goto switchD_0034de27_default;
    }
    if (0xb < uVar35) goto switchD_0034de27_default;
    opt_00 = (Option *)
             ((long)&switchD_0034dbca::switchdataD_004f3c8c +
             (long)(int)(&switchD_0034dbca::switchdataD_004f3c8c)[uVar42]);
    switch(uVar42) {
    case 0:
      iVar31 = iVar31 * iVar61;
      if ((int)uVar40 < 1) {
        uVar40 = 0;
      }
      for (uVar42 = 0; uVar42 != uVar40; uVar42 = uVar42 + 1) {
        pvVar3 = m->data;
        pvVar4 = b->data;
        pvVar5 = pMVar159->data;
        lVar57 = pMVar159->elemsize * pMVar159->cstep * uVar42;
        lVar56 = b->elemsize * b->cstep * uVar42;
        lVar63 = m->elemsize * m->cstep * uVar42;
        lVar66 = 0;
        for (iVar47 = 0; iVar47 + 0xf < iVar31; iVar47 = iVar47 + 0x10) {
          auVar138 = vaddps_avx512f(*(undefined1 (*) [64])((long)pvVar4 + lVar66 + lVar56),
                                    *(undefined1 (*) [64])((long)pvVar3 + lVar66 + lVar63));
          *(undefined1 (*) [64])((long)pvVar5 + lVar66 + lVar57) = auVar138;
          lVar66 = lVar66 + 0x40;
        }
        for (; iVar47 + 7 < iVar31; iVar47 = iVar47 + 8) {
          pfVar59 = (float *)((long)pvVar4 + lVar66 + lVar56);
          pfVar64 = (float *)((long)pvVar3 + lVar66 + lVar63);
          auVar98._0_4_ = *pfVar59 + *pfVar64;
          auVar98._4_4_ = pfVar59[1] + pfVar64[1];
          auVar98._8_4_ = pfVar59[2] + pfVar64[2];
          auVar98._12_4_ = pfVar59[3] + pfVar64[3];
          auVar98._16_4_ = pfVar59[4] + pfVar64[4];
          auVar98._20_4_ = pfVar59[5] + pfVar64[5];
          auVar98._24_4_ = pfVar59[6] + pfVar64[6];
          auVar98._28_4_ = pfVar59[7] + pfVar64[7];
          *(undefined1 (*) [32])((long)pvVar5 + lVar66 + lVar57) = auVar98;
          lVar66 = lVar66 + 0x20;
        }
        for (; iVar47 + 3 < iVar31; iVar47 = iVar47 + 4) {
          pfVar59 = (float *)((long)pvVar4 + lVar66 + lVar56);
          pfVar64 = (float *)((long)pvVar3 + lVar66 + lVar63);
          auVar79._0_4_ = *pfVar59 + *pfVar64;
          auVar79._4_4_ = pfVar59[1] + pfVar64[1];
          auVar79._8_4_ = pfVar59[2] + pfVar64[2];
          auVar79._12_4_ = pfVar59[3] + pfVar64[3];
          *(undefined1 (*) [16])((long)pvVar5 + lVar66 + lVar57) = auVar79;
          lVar66 = lVar66 + 0x10;
        }
        pfVar53 = (float *)((long)pvVar5 + lVar57 + lVar66);
        pfVar64 = (float *)((long)pvVar4 + lVar56 + lVar66);
        pfVar59 = (float *)((long)pvVar3 + lVar63 + lVar66);
        for (; iVar47 < iVar31; iVar47 = iVar47 + 1) {
          *pfVar53 = *pfVar64 + *pfVar59;
          pfVar59 = pfVar59 + 1;
          pfVar64 = pfVar64 + 1;
          pfVar53 = pfVar53 + 1;
        }
      }
      return 0;
    case 1:
      pMVar49 = b;
      break;
    case 2:
      iVar31 = iVar31 * iVar61;
      if ((int)uVar40 < 1) {
        uVar40 = 0;
      }
      for (uVar42 = 0; uVar42 != uVar40; uVar42 = uVar42 + 1) {
        pvVar3 = m->data;
        pvVar4 = b->data;
        pvVar5 = pMVar159->data;
        lVar57 = pMVar159->elemsize * pMVar159->cstep * uVar42;
        lVar56 = b->elemsize * b->cstep * uVar42;
        lVar63 = m->elemsize * m->cstep * uVar42;
        lVar66 = 0;
        for (iVar47 = 0; iVar47 + 0xf < iVar31; iVar47 = iVar47 + 0x10) {
          auVar138 = vmulps_avx512f(*(undefined1 (*) [64])((long)pvVar4 + lVar66 + lVar56),
                                    *(undefined1 (*) [64])((long)pvVar3 + lVar66 + lVar63));
          *(undefined1 (*) [64])((long)pvVar5 + lVar66 + lVar57) = auVar138;
          lVar66 = lVar66 + 0x40;
        }
        for (; iVar47 + 7 < iVar31; iVar47 = iVar47 + 8) {
          pfVar59 = (float *)((long)pvVar4 + lVar66 + lVar56);
          pfVar64 = (float *)((long)pvVar3 + lVar66 + lVar63);
          auVar72._4_4_ = pfVar59[1] * pfVar64[1];
          auVar72._0_4_ = *pfVar59 * *pfVar64;
          auVar72._8_4_ = pfVar59[2] * pfVar64[2];
          auVar72._12_4_ = pfVar59[3] * pfVar64[3];
          auVar72._16_4_ = pfVar59[4] * pfVar64[4];
          auVar72._20_4_ = pfVar59[5] * pfVar64[5];
          auVar72._24_4_ = pfVar59[6] * pfVar64[6];
          auVar72._28_4_ = pfVar59[7];
          *(undefined1 (*) [32])((long)pvVar5 + lVar66 + lVar57) = auVar72;
          lVar66 = lVar66 + 0x20;
        }
        for (; iVar47 + 3 < iVar31; iVar47 = iVar47 + 4) {
          pfVar59 = (float *)((long)pvVar4 + lVar66 + lVar56);
          pfVar64 = (float *)((long)pvVar3 + lVar66 + lVar63);
          auVar97._0_4_ = *pfVar59 * *pfVar64;
          auVar97._4_4_ = pfVar59[1] * pfVar64[1];
          auVar97._8_4_ = pfVar59[2] * pfVar64[2];
          auVar97._12_4_ = pfVar59[3] * pfVar64[3];
          *(undefined1 (*) [16])((long)pvVar5 + lVar66 + lVar57) = auVar97;
          lVar66 = lVar66 + 0x10;
        }
        pfVar53 = (float *)((long)pvVar5 + lVar57 + lVar66);
        pfVar64 = (float *)((long)pvVar4 + lVar56 + lVar66);
        pfVar59 = (float *)((long)pvVar3 + lVar63 + lVar66);
        for (; iVar47 < iVar31; iVar47 = iVar47 + 1) {
          *pfVar53 = *pfVar64 * *pfVar59;
          pfVar59 = pfVar59 + 1;
          pfVar64 = pfVar64 + 1;
          pfVar53 = pfVar53 + 1;
        }
      }
      return 0;
    case 3:
      pMVar49 = b;
      goto LAB_00352d10;
    case 4:
      iVar31 = iVar31 * iVar61;
      if ((int)uVar40 < 1) {
        uVar40 = 0;
      }
      for (uVar42 = 0; uVar42 != uVar40; uVar42 = uVar42 + 1) {
        pvVar3 = m->data;
        pvVar4 = b->data;
        pvVar5 = pMVar159->data;
        lVar57 = pMVar159->elemsize * pMVar159->cstep * uVar42;
        lVar56 = b->elemsize * b->cstep * uVar42;
        lVar63 = m->elemsize * m->cstep * uVar42;
        lVar66 = 0;
        for (iVar47 = 0; iVar47 + 0xf < iVar31; iVar47 = iVar47 + 0x10) {
          auVar138 = vmaxps_avx512f(*(undefined1 (*) [64])((long)pvVar3 + lVar66 + lVar63),
                                    *(undefined1 (*) [64])((long)pvVar4 + lVar66 + lVar56));
          *(undefined1 (*) [64])((long)pvVar5 + lVar66 + lVar57) = auVar138;
          lVar66 = lVar66 + 0x40;
        }
        for (; iVar47 + 7 < iVar31; iVar47 = iVar47 + 8) {
          auVar72 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar3 + lVar66 + lVar63),
                               *(undefined1 (*) [32])((long)pvVar4 + lVar66 + lVar56));
          *(undefined1 (*) [32])((long)pvVar5 + lVar66 + lVar57) = auVar72;
          lVar66 = lVar66 + 0x20;
        }
        for (; iVar47 + 3 < iVar31; iVar47 = iVar47 + 4) {
          auVar71 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar3 + lVar66 + lVar63),
                               *(undefined1 (*) [16])((long)pvVar4 + lVar66 + lVar56));
          *(undefined1 (*) [16])((long)pvVar5 + lVar66 + lVar57) = auVar71;
          lVar66 = lVar66 + 0x10;
        }
        puVar54 = (undefined4 *)((long)pvVar5 + lVar57 + lVar66);
        puVar48 = (uint *)((long)pvVar4 + lVar56 + lVar66);
        puVar43 = (uint *)((long)pvVar3 + lVar63 + lVar66);
        for (; iVar47 < iVar31; iVar47 = iVar47 + 1) {
          auVar71 = vmaxss_avx(ZEXT416(*puVar48),ZEXT416(*puVar43));
          *puVar54 = auVar71._0_4_;
          puVar43 = puVar43 + 1;
          puVar48 = puVar48 + 1;
          puVar54 = puVar54 + 1;
        }
      }
      return 0;
    case 5:
      iVar31 = iVar31 * iVar61;
      if ((int)uVar40 < 1) {
        uVar40 = 0;
      }
      for (uVar42 = 0; uVar42 != uVar40; uVar42 = uVar42 + 1) {
        pvVar3 = m->data;
        pvVar4 = b->data;
        pvVar5 = pMVar159->data;
        lVar57 = pMVar159->elemsize * pMVar159->cstep * uVar42;
        lVar56 = b->elemsize * b->cstep * uVar42;
        lVar63 = m->elemsize * m->cstep * uVar42;
        lVar66 = 0;
        for (iVar47 = 0; iVar47 + 0xf < iVar31; iVar47 = iVar47 + 0x10) {
          auVar138 = vminps_avx512f(*(undefined1 (*) [64])((long)pvVar3 + lVar66 + lVar63),
                                    *(undefined1 (*) [64])((long)pvVar4 + lVar66 + lVar56));
          *(undefined1 (*) [64])((long)pvVar5 + lVar66 + lVar57) = auVar138;
          lVar66 = lVar66 + 0x40;
        }
        for (; iVar47 + 7 < iVar31; iVar47 = iVar47 + 8) {
          auVar72 = vminps_avx(*(undefined1 (*) [32])((long)pvVar3 + lVar66 + lVar63),
                               *(undefined1 (*) [32])((long)pvVar4 + lVar66 + lVar56));
          *(undefined1 (*) [32])((long)pvVar5 + lVar66 + lVar57) = auVar72;
          lVar66 = lVar66 + 0x20;
        }
        for (; iVar47 + 3 < iVar31; iVar47 = iVar47 + 4) {
          auVar71 = vminps_avx(*(undefined1 (*) [16])((long)pvVar3 + lVar66 + lVar63),
                               *(undefined1 (*) [16])((long)pvVar4 + lVar66 + lVar56));
          *(undefined1 (*) [16])((long)pvVar5 + lVar66 + lVar57) = auVar71;
          lVar66 = lVar66 + 0x10;
        }
        puVar54 = (undefined4 *)((long)pvVar5 + lVar57 + lVar66);
        puVar48 = (uint *)((long)pvVar4 + lVar56 + lVar66);
        puVar43 = (uint *)((long)pvVar3 + lVar63 + lVar66);
        for (; iVar47 < iVar31; iVar47 = iVar47 + 1) {
          auVar71 = vminss_avx(ZEXT416(*puVar48),ZEXT416(*puVar43));
          *puVar54 = auVar71._0_4_;
          puVar43 = puVar43 + 1;
          puVar48 = puVar48 + 1;
          puVar54 = puVar54 + 1;
        }
      }
      return 0;
    case 6:
      pMVar49 = b;
      goto LAB_00352ced;
    case 7:
      pMVar49 = m;
      m = b;
      break;
    case 8:
      pMVar49 = m;
      m = b;
LAB_00352d10:
      iVar47 = 0;
      binary_op_no_broadcast<ncnn::BinaryOp_x86_avx512_functor::binary_op_div>
                (m,pMVar49,pMVar159,opt_00);
      return iVar47;
    case 9:
      pMVar49 = m;
      m = b;
LAB_00352ced:
      iVar47 = 0;
      binary_op_no_broadcast<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                (m,pMVar49,pMVar159,opt_00);
      return iVar47;
    case 10:
      pMVar49 = b;
      goto LAB_00352d33;
    case 0xb:
      pMVar49 = m;
      m = b;
LAB_00352d33:
      iVar47 = 0;
      binary_op_no_broadcast<ncnn::BinaryOp_x86_avx512_functor::binary_op_atan2>
                (m,pMVar49,pMVar159,opt_00);
      return iVar47;
    }
    iVar47 = 0;
    binary_op_no_broadcast<ncnn::BinaryOp_x86_avx512_functor::binary_op_sub>
              (m,pMVar49,pMVar159,opt_00);
    return iVar47;
  }
  if (0xb < uVar35) goto switchD_0034de27_default;
  fVar77 = *b->data;
  uVar155 = 0;
  uVar123 = 0;
  auVar71 = ZEXT416((uint)fVar77);
  switch(uVar42) {
  case 0:
    iVar47 = m->h * m->w * m->d * m->elempack;
    auVar138 = vbroadcastss_avx512f(auVar71);
    uVar35 = m->c;
    if (m->c < 1) {
      uVar35 = 0;
    }
    for (uVar42 = 0; uVar42 != uVar35; uVar42 = uVar42 + 1) {
      pauVar67 = (undefined1 (*) [64])(m->cstep * uVar42 * m->elemsize + (long)m->data);
      pauVar52 = (undefined1 (*) [64])
                 (pMVar159->cstep * uVar42 * pMVar159->elemsize + (long)pMVar159->data);
      for (iVar61 = 0; iVar61 + 0xf < iVar47; iVar61 = iVar61 + 0x10) {
        auVar73 = vaddps_avx512f(auVar138,*pauVar67);
        *pauVar52 = auVar73;
        pauVar67 = pauVar67 + 1;
        pauVar52 = pauVar52 + 1;
      }
      while( true ) {
        if (iVar47 <= iVar61 + 7) break;
        auVar137._0_4_ = auVar138._0_4_ + *(float *)*pauVar67;
        auVar137._4_4_ = auVar138._4_4_ + *(float *)(*pauVar67 + 4);
        auVar137._8_4_ = auVar138._8_4_ + *(float *)(*pauVar67 + 8);
        auVar137._12_4_ = auVar138._12_4_ + *(float *)(*pauVar67 + 0xc);
        auVar137._16_4_ = auVar138._16_4_ + *(float *)(*pauVar67 + 0x10);
        auVar137._20_4_ = auVar138._20_4_ + *(float *)(*pauVar67 + 0x14);
        auVar137._24_4_ = auVar138._24_4_ + *(float *)(*pauVar67 + 0x18);
        auVar137._28_4_ = auVar138._28_4_ + *(float *)(*pauVar67 + 0x1c);
        *(undefined1 (*) [32])*pauVar52 = auVar137;
        pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
        pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x20);
        iVar61 = iVar61 + 8;
      }
      for (; iVar61 + 3 < iVar47; iVar61 = iVar61 + 4) {
        auVar131._0_4_ = auVar138._0_4_ + *(float *)*pauVar67;
        auVar131._4_4_ = auVar138._4_4_ + *(float *)(*pauVar67 + 4);
        auVar131._8_4_ = auVar138._8_4_ + *(float *)(*pauVar67 + 8);
        auVar131._12_4_ = auVar138._12_4_ + *(float *)(*pauVar67 + 0xc);
        *(undefined1 (*) [16])*pauVar52 = auVar131;
        pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
        pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x10);
      }
      lVar63 = 0;
      for (; iVar61 < iVar47; iVar61 = iVar61 + 1) {
        *(float *)((long)*pauVar52 + lVar63) = fVar77 + *(float *)(*pauVar67 + lVar63);
        lVar63 = lVar63 + 4;
      }
    }
    break;
  case 1:
    iVar47 = m->h * m->w * m->d * m->elempack;
    auVar138 = vbroadcastss_avx512f(auVar71);
    uVar35 = m->c;
    if (m->c < 1) {
      uVar35 = 0;
    }
    for (uVar42 = 0; uVar42 != uVar35; uVar42 = uVar42 + 1) {
      pauVar67 = (undefined1 (*) [64])(m->cstep * uVar42 * m->elemsize + (long)m->data);
      pauVar52 = (undefined1 (*) [64])
                 (pMVar159->cstep * uVar42 * pMVar159->elemsize + (long)pMVar159->data);
      for (iVar61 = 0; iVar61 + 0xf < iVar47; iVar61 = iVar61 + 0x10) {
        auVar73 = vsubps_avx512f(*pauVar67,auVar138);
        *pauVar52 = auVar73;
        pauVar67 = pauVar67 + 1;
        pauVar52 = pauVar52 + 1;
      }
      for (; iVar61 + 7 < iVar47; iVar61 = iVar61 + 8) {
        auVar72 = vsubps_avx(*(undefined1 (*) [32])*pauVar67,auVar138._0_32_);
        *(undefined1 (*) [32])*pauVar52 = auVar72;
        pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
        pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x20);
      }
      for (; iVar61 + 3 < iVar47; iVar61 = iVar61 + 4) {
        auVar71 = vsubps_avx(*(undefined1 (*) [16])*pauVar67,auVar138._0_16_);
        *(undefined1 (*) [16])*pauVar52 = auVar71;
        pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
        pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x10);
      }
      lVar63 = 0;
      for (; iVar61 < iVar47; iVar61 = iVar61 + 1) {
        *(float *)((long)*pauVar52 + lVar63) = *(float *)(*pauVar67 + lVar63) - fVar77;
        lVar63 = lVar63 + 4;
      }
    }
    break;
  case 2:
    iVar47 = m->h * m->w * m->d * m->elempack;
    auVar73 = vbroadcastss_avx512f(auVar71);
    uVar35 = m->c;
    if (m->c < 1) {
      uVar35 = 0;
    }
    for (uVar42 = 0; uVar42 != uVar35; uVar42 = uVar42 + 1) {
      pauVar67 = (undefined1 (*) [64])(m->cstep * uVar42 * m->elemsize + (long)m->data);
      pauVar52 = (undefined1 (*) [64])
                 (pMVar159->cstep * uVar42 * pMVar159->elemsize + (long)pMVar159->data);
      for (iVar61 = 0; iVar61 + 0xf < iVar47; iVar61 = iVar61 + 0x10) {
        auVar138 = vmulps_avx512f(auVar73,*pauVar67);
        *pauVar52 = auVar138;
        pauVar67 = pauVar67 + 1;
        pauVar52 = pauVar52 + 1;
      }
      while( true ) {
        if (iVar47 <= iVar61 + 7) break;
        auVar139._0_4_ = auVar73._0_4_ * *(float *)*pauVar67;
        auVar139._4_4_ = auVar73._4_4_ * *(float *)(*pauVar67 + 4);
        auVar139._8_4_ = auVar73._8_4_ * *(float *)(*pauVar67 + 8);
        auVar139._12_4_ = auVar73._12_4_ * *(float *)(*pauVar67 + 0xc);
        auVar139._16_4_ = auVar73._16_4_ * *(float *)(*pauVar67 + 0x10);
        auVar139._20_4_ = auVar73._20_4_ * *(float *)(*pauVar67 + 0x14);
        auVar139._28_36_ = auVar138._28_36_;
        auVar139._24_4_ = auVar73._24_4_ * *(float *)(*pauVar67 + 0x18);
        auVar138 = ZEXT3264(auVar139._0_32_);
        *(undefined1 (*) [32])*pauVar52 = auVar139._0_32_;
        pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
        pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x20);
        iVar61 = iVar61 + 8;
      }
      for (; iVar61 + 3 < iVar47; iVar61 = iVar61 + 4) {
        auVar132._0_4_ = auVar73._0_4_ * *(float *)*pauVar67;
        auVar132._4_4_ = auVar73._4_4_ * *(float *)(*pauVar67 + 4);
        auVar132._8_4_ = auVar73._8_4_ * *(float *)(*pauVar67 + 8);
        auVar132._12_4_ = auVar73._12_4_ * *(float *)(*pauVar67 + 0xc);
        auVar138 = ZEXT1664(auVar132);
        *(undefined1 (*) [16])*pauVar52 = auVar132;
        pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
        pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x10);
      }
      lVar63 = 0;
      for (; iVar61 < iVar47; iVar61 = iVar61 + 1) {
        fVar76 = fVar77 * *(float *)(*pauVar67 + lVar63);
        auVar138 = ZEXT464((uint)fVar76);
        *(float *)((long)*pauVar52 + lVar63) = fVar76;
        lVar63 = lVar63 + 4;
      }
    }
    break;
  case 3:
    iVar47 = m->h * m->w * m->d * m->elempack;
    auVar81._0_4_ = 1.0 / fVar77;
    auVar81._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar138 = vbroadcastss_avx512f(auVar81);
    uVar35 = m->c;
    if (m->c < 1) {
      uVar35 = 0;
    }
    for (uVar42 = 0; uVar42 != uVar35; uVar42 = uVar42 + 1) {
      pauVar67 = (undefined1 (*) [64])(m->cstep * uVar42 * m->elemsize + (long)m->data);
      pauVar52 = (undefined1 (*) [64])
                 (pMVar159->cstep * uVar42 * pMVar159->elemsize + (long)pMVar159->data);
      for (iVar61 = 0; iVar61 + 0xf < iVar47; iVar61 = iVar61 + 0x10) {
        in_ZMM2 = vmulps_avx512f(auVar138,*pauVar67);
        *pauVar52 = in_ZMM2;
        pauVar67 = pauVar67 + 1;
        pauVar52 = pauVar52 + 1;
      }
      while( true ) {
        if (iVar47 <= iVar61 + 7) break;
        auVar143._0_4_ = auVar138._0_4_ * *(float *)*pauVar67;
        auVar143._4_4_ = auVar138._4_4_ * *(float *)(*pauVar67 + 4);
        auVar143._8_4_ = auVar138._8_4_ * *(float *)(*pauVar67 + 8);
        auVar143._12_4_ = auVar138._12_4_ * *(float *)(*pauVar67 + 0xc);
        auVar143._16_4_ = auVar138._16_4_ * *(float *)(*pauVar67 + 0x10);
        auVar143._20_4_ = auVar138._20_4_ * *(float *)(*pauVar67 + 0x14);
        auVar143._28_36_ = in_ZMM2._28_36_;
        auVar143._24_4_ = auVar138._24_4_ * *(float *)(*pauVar67 + 0x18);
        in_ZMM2 = ZEXT3264(auVar143._0_32_);
        *(undefined1 (*) [32])*pauVar52 = auVar143._0_32_;
        pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
        pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x20);
        iVar61 = iVar61 + 8;
      }
      for (; iVar61 + 3 < iVar47; iVar61 = iVar61 + 4) {
        auVar140._0_4_ = auVar138._0_4_ * *(float *)*pauVar67;
        auVar140._4_4_ = auVar138._4_4_ * *(float *)(*pauVar67 + 4);
        auVar140._8_4_ = auVar138._8_4_ * *(float *)(*pauVar67 + 8);
        auVar140._12_4_ = auVar138._12_4_ * *(float *)(*pauVar67 + 0xc);
        in_ZMM2 = ZEXT1664(auVar140);
        *(undefined1 (*) [16])*pauVar52 = auVar140;
        pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
        pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x10);
      }
      lVar63 = 0;
      for (; iVar61 < iVar47; iVar61 = iVar61 + 1) {
        fVar77 = auVar81._0_4_ * *(float *)(*pauVar67 + lVar63);
        in_ZMM2 = ZEXT464((uint)fVar77);
        *(float *)((long)*pauVar52 + lVar63) = fVar77;
        lVar63 = lVar63 + 4;
      }
    }
    break;
  case 4:
    iVar47 = m->h * m->w * m->d * m->elempack;
    auVar138 = vbroadcastss_avx512f(auVar71);
    uVar35 = m->c;
    if (m->c < 1) {
      uVar35 = 0;
    }
    for (uVar42 = 0; uVar42 != uVar35; uVar42 = uVar42 + 1) {
      pauVar67 = (undefined1 (*) [64])(m->cstep * uVar42 * m->elemsize + (long)m->data);
      pauVar52 = (undefined1 (*) [64])
                 (pMVar159->cstep * uVar42 * pMVar159->elemsize + (long)pMVar159->data);
      for (iVar61 = 0; iVar61 + 0xf < iVar47; iVar61 = iVar61 + 0x10) {
        auVar73 = vmaxps_avx512f(auVar138,*pauVar67);
        *pauVar52 = auVar73;
        pauVar67 = pauVar67 + 1;
        pauVar52 = pauVar52 + 1;
      }
      for (; iVar61 + 7 < iVar47; iVar61 = iVar61 + 8) {
        auVar72 = vmaxps_avx(auVar138._0_32_,*(undefined1 (*) [32])*pauVar67);
        *(undefined1 (*) [32])*pauVar52 = auVar72;
        pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
        pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x20);
      }
      for (; iVar61 + 3 < iVar47; iVar61 = iVar61 + 4) {
        auVar78 = vmaxps_avx(auVar138._0_16_,*(undefined1 (*) [16])*pauVar67);
        *(undefined1 (*) [16])*pauVar52 = auVar78;
        pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
        pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x10);
      }
      lVar63 = 0;
      for (; iVar61 < iVar47; iVar61 = iVar61 + 1) {
        auVar78 = vmaxss_avx(auVar71,ZEXT416(*(uint *)(*pauVar67 + lVar63)));
        *(int *)((long)*pauVar52 + lVar63) = auVar78._0_4_;
        lVar63 = lVar63 + 4;
      }
    }
    break;
  case 5:
    iVar47 = m->h * m->w * m->d * m->elempack;
    auVar138 = vbroadcastss_avx512f(auVar71);
    uVar35 = m->c;
    if (m->c < 1) {
      uVar35 = 0;
    }
    for (uVar42 = 0; uVar42 != uVar35; uVar42 = uVar42 + 1) {
      pauVar67 = (undefined1 (*) [64])(m->cstep * uVar42 * m->elemsize + (long)m->data);
      pauVar52 = (undefined1 (*) [64])
                 (pMVar159->cstep * uVar42 * pMVar159->elemsize + (long)pMVar159->data);
      for (iVar61 = 0; iVar61 + 0xf < iVar47; iVar61 = iVar61 + 0x10) {
        auVar73 = vminps_avx512f(auVar138,*pauVar67);
        *pauVar52 = auVar73;
        pauVar67 = pauVar67 + 1;
        pauVar52 = pauVar52 + 1;
      }
      for (; iVar61 + 7 < iVar47; iVar61 = iVar61 + 8) {
        auVar72 = vminps_avx(auVar138._0_32_,*(undefined1 (*) [32])*pauVar67);
        *(undefined1 (*) [32])*pauVar52 = auVar72;
        pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
        pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x20);
      }
      for (; iVar61 + 3 < iVar47; iVar61 = iVar61 + 4) {
        auVar78 = vminps_avx(auVar138._0_16_,*(undefined1 (*) [16])*pauVar67);
        *(undefined1 (*) [16])*pauVar52 = auVar78;
        pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
        pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x10);
      }
      lVar63 = 0;
      for (; iVar61 < iVar47; iVar61 = iVar61 + 1) {
        auVar78 = vminss_avx(auVar71,ZEXT416(*(uint *)(*pauVar67 + lVar63)));
        *(int *)((long)*pauVar52 + lVar63) = auVar78._0_4_;
        lVar63 = lVar63 + 4;
      }
    }
    break;
  case 6:
    iVar47 = m->h * m->w * m->d * m->elempack;
    auVar138 = vbroadcastss_avx512f(auVar71);
    uVar37 = 0;
    uVar42 = (ulong)(uint)m->c;
    if (m->c < 1) {
      uVar42 = uVar37;
    }
    uVar155 = (undefined4)uVar42;
    uVar160 = 0;
    while (uVar37 != CONCAT44(uVar160,uVar155)) {
      pfVar59 = (float *)(m->cstep * uVar37 * m->elemsize + (long)m->data);
      uVar157 = (undefined4)uVar37;
      uVar156 = (undefined4)(uVar37 >> 0x20);
      pfVar64 = (float *)(pMVar159->cstep * uVar37 * pMVar159->elemsize + (long)pMVar159->data);
      local_180 = auVar138._0_8_;
      afStack_178 = auVar138._8_8_;
      afStack_170 = auVar138._16_8_;
      afStack_168 = auVar138._24_8_;
      uStack_160 = auVar138._32_8_;
      uStack_158 = auVar138._40_8_;
      uStack_150 = auVar138._48_8_;
      uStack_148 = auVar138._56_8_;
      local_100[0] = local_180[0];
      local_100[1] = local_180[1];
      afStack_f8[0] = afStack_178[0];
      afStack_f8[1] = afStack_178[1];
      afStack_f0[0] = afStack_170[0];
      afStack_f0[1] = afStack_170[1];
      afStack_e8[0] = afStack_168[0];
      afStack_e8[1] = afStack_168[1];
      afStack_e0[0] = (float)uStack_160;
      afStack_e0[1] = uStack_160._4_4_;
      afStack_d8[0] = (float)uStack_158;
      afStack_d8[1] = uStack_158._4_4_;
      afStack_d0[0] = (float)uStack_150;
      afStack_d0[1] = uStack_150._4_4_;
      afStack_c8[0] = (float)uStack_148;
      afStack_c8[1] = uStack_148._4_4_;
      for (iVar61 = 0; iVar61 + 0xf < iVar47; iVar61 = iVar61 + 0x10) {
        uVar123 = *(undefined8 *)pfVar59;
        uVar122 = *(undefined8 *)(pfVar59 + 2);
        uVar121 = *(undefined8 *)(pfVar59 + 4);
        uVar125 = *(undefined8 *)(pfVar59 + 6);
        uVar126 = *(undefined8 *)(pfVar59 + 8);
        uVar127 = *(undefined8 *)(pfVar59 + 10);
        uVar128 = *(undefined8 *)(pfVar59 + 0xc);
        uVar129 = *(undefined8 *)(pfVar59 + 0xe);
        local_140 = *(__m512 *)pfVar59;
        BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                  ((binary_op_pow *)&stack0xfffffffffffffe5f,&local_140,(__m512 *)local_100);
        *(undefined8 *)pfVar64 = uVar123;
        *(undefined8 *)(pfVar64 + 2) = uVar122;
        *(undefined8 *)(pfVar64 + 4) = uVar121;
        *(undefined8 *)(pfVar64 + 6) = uVar125;
        *(undefined8 *)(pfVar64 + 8) = uVar126;
        *(undefined8 *)(pfVar64 + 10) = uVar127;
        *(undefined8 *)(pfVar64 + 0xc) = uVar128;
        *(undefined8 *)(pfVar64 + 0xe) = uVar129;
        pfVar59 = pfVar59 + 0x10;
        pfVar64 = pfVar64 + 0x10;
      }
      local_140._0_32_ = auVar138._0_32_;
      for (; iVar61 + 7 < iVar47; iVar61 = iVar61 + 8) {
        uVar123 = *(undefined8 *)pfVar59;
        uVar122 = *(undefined8 *)(pfVar59 + 2);
        uVar121 = *(undefined8 *)(pfVar59 + 4);
        uVar125 = *(undefined8 *)(pfVar59 + 6);
        local_c0 = (binary_op_ratan2  [8])uVar123;
        afStack_b8 = (float  [2])uVar122;
        afStack_b0 = (float  [2])uVar121;
        afStack_a8._0_8_ = uVar125;
        BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                  ((binary_op_pow *)&stack0xfffffffffffffe5f,(__m256 *)local_c0,(__m256 *)local_140)
        ;
        *(undefined8 *)pfVar64 = uVar123;
        *(undefined8 *)(pfVar64 + 2) = uVar122;
        *(undefined8 *)(pfVar64 + 4) = uVar121;
        *(undefined8 *)(pfVar64 + 6) = uVar125;
        pfVar59 = pfVar59 + 8;
        pfVar64 = pfVar64 + 8;
      }
      local_c0 = (binary_op_ratan2  [8])local_180;
      afStack_b8[0] = afStack_178[0];
      afStack_b8[1] = afStack_178[1];
      for (; iVar61 + 3 < iVar47; iVar61 = iVar61 + 4) {
        local_90 = *(binary_op_ratan2 (*) [8])pfVar59;
        uVar123 = *(undefined8 *)(pfVar59 + 2);
        afStack_88._0_8_ = uVar123;
        afVar154 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                             ((binary_op_pow *)&stack0xfffffffffffffe5f,(__m128 *)local_90,
                              (__m128 *)local_c0);
        *(long *)pfVar64 = afVar154._0_8_;
        *(undefined8 *)(pfVar64 + 2) = uVar123;
        pfVar59 = pfVar59 + 4;
        pfVar64 = pfVar64 + 4;
      }
      lVar63 = 0;
      for (; iVar61 < iVar47; iVar61 = iVar61 + 1) {
        fVar76 = powf(*(float *)((long)pfVar59 + lVar63),fVar77);
        *(float *)((long)pfVar64 + lVar63) = fVar76;
        lVar63 = lVar63 + 4;
      }
      uVar37 = CONCAT44(uVar156,uVar157) + 1;
    }
    goto switchD_0034de27_default;
  case 7:
    iVar47 = m->h * m->w * m->d * m->elempack;
    auVar138 = vbroadcastss_avx512f(auVar71);
    uVar35 = m->c;
    if (m->c < 1) {
      uVar35 = 0;
    }
    for (uVar42 = 0; uVar42 != uVar35; uVar42 = uVar42 + 1) {
      pauVar67 = (undefined1 (*) [64])(m->cstep * uVar42 * m->elemsize + (long)m->data);
      pauVar52 = (undefined1 (*) [64])
                 (pMVar159->cstep * uVar42 * pMVar159->elemsize + (long)pMVar159->data);
      for (iVar61 = 0; iVar61 + 0xf < iVar47; iVar61 = iVar61 + 0x10) {
        auVar73 = vsubps_avx512f(auVar138,*pauVar67);
        *pauVar52 = auVar73;
        pauVar67 = pauVar67 + 1;
        pauVar52 = pauVar52 + 1;
      }
      for (; iVar61 + 7 < iVar47; iVar61 = iVar61 + 8) {
        auVar72 = vsubps_avx(auVar138._0_32_,*(undefined1 (*) [32])*pauVar67);
        *(undefined1 (*) [32])*pauVar52 = auVar72;
        pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
        pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x20);
      }
      for (; iVar61 + 3 < iVar47; iVar61 = iVar61 + 4) {
        auVar71 = vsubps_avx(auVar138._0_16_,*(undefined1 (*) [16])*pauVar67);
        *(undefined1 (*) [16])*pauVar52 = auVar71;
        pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
        pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x10);
      }
      lVar63 = 0;
      for (; iVar61 < iVar47; iVar61 = iVar61 + 1) {
        *(float *)((long)*pauVar52 + lVar63) = fVar77 - *(float *)(*pauVar67 + lVar63);
        lVar63 = lVar63 + 4;
      }
    }
    break;
  case 8:
    iVar47 = m->h * m->w * m->d * m->elempack;
    auVar138 = vbroadcastss_avx512f(auVar71);
    uVar35 = m->c;
    if (m->c < 1) {
      uVar35 = 0;
    }
    for (uVar42 = 0; uVar42 != uVar35; uVar42 = uVar42 + 1) {
      pauVar67 = (undefined1 (*) [64])(m->cstep * uVar42 * m->elemsize + (long)m->data);
      pauVar52 = (undefined1 (*) [64])
                 (pMVar159->cstep * uVar42 * pMVar159->elemsize + (long)pMVar159->data);
      for (iVar61 = 0; iVar61 + 0xf < iVar47; iVar61 = iVar61 + 0x10) {
        auVar73 = vrcp14ps_avx512f(*pauVar67);
        in_ZMM3 = vmulps_avx512f(auVar138,auVar73);
        auVar74 = vfmsub213ps_avx512f(*pauVar67,in_ZMM3,auVar138);
        auVar73 = vfnmadd213ps_avx512f(auVar74,auVar73,in_ZMM3);
        *pauVar52 = auVar73;
        pauVar67 = pauVar67 + 1;
        pauVar52 = pauVar52 + 1;
      }
      while( true ) {
        if (iVar47 <= iVar61 + 7) break;
        auVar72 = vrcpps_avx(*(undefined1 (*) [32])*pauVar67);
        auVar149._0_4_ = auVar138._0_4_ * auVar72._0_4_;
        auVar149._4_4_ = auVar138._4_4_ * auVar72._4_4_;
        auVar149._8_4_ = auVar138._8_4_ * auVar72._8_4_;
        auVar149._12_4_ = auVar138._12_4_ * auVar72._12_4_;
        auVar149._16_4_ = auVar138._16_4_ * auVar72._16_4_;
        auVar149._20_4_ = auVar138._20_4_ * auVar72._20_4_;
        auVar149._28_36_ = in_ZMM3._28_36_;
        auVar149._24_4_ = auVar138._24_4_ * auVar72._24_4_;
        auVar98 = auVar149._0_32_;
        in_ZMM3 = ZEXT3264(auVar98);
        auVar71 = vfmsub213ps_fma(*(undefined1 (*) [32])*pauVar67,auVar98,auVar138._0_32_);
        auVar71 = vfnmadd213ps_fma(ZEXT1632(auVar71),auVar72,auVar98);
        *(undefined1 (*) [32])*pauVar52 = ZEXT1632(auVar71);
        pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
        pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x20);
        iVar61 = iVar61 + 8;
      }
      for (; iVar61 + 3 < iVar47; iVar61 = iVar61 + 4) {
        auVar71 = vrcpps_avx(*(undefined1 (*) [16])*pauVar67);
        auVar144._0_4_ = auVar138._0_4_ * auVar71._0_4_;
        auVar144._4_4_ = auVar138._4_4_ * auVar71._4_4_;
        auVar144._8_4_ = auVar138._8_4_ * auVar71._8_4_;
        auVar144._12_4_ = auVar138._12_4_ * auVar71._12_4_;
        in_ZMM3 = ZEXT1664(auVar144);
        auVar78 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar67,auVar144,auVar138._0_16_);
        auVar71 = vfnmadd213ps_fma(auVar78,auVar71,auVar144);
        *(undefined1 (*) [16])*pauVar52 = auVar71;
        pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
        pauVar52 = (undefined1 (*) [64])((long)*pauVar52 + 0x10);
      }
      lVar63 = 0;
      for (; iVar61 < iVar47; iVar61 = iVar61 + 1) {
        *(float *)((long)*pauVar52 + lVar63) = fVar77 / *(float *)(*pauVar67 + lVar63);
        lVar63 = lVar63 + 4;
      }
    }
    break;
  case 9:
    iVar47 = m->h * m->w * m->d * m->elempack;
    auVar138 = vbroadcastss_avx512f(auVar71);
    uVar37 = 0;
    uVar42 = (ulong)(uint)m->c;
    if (m->c < 1) {
      uVar42 = uVar37;
    }
    uVar155 = (undefined4)uVar42;
    uVar160 = 0;
    while (uVar37 != CONCAT44(uVar160,uVar155)) {
      pfVar59 = (float *)(m->cstep * uVar37 * m->elemsize + (long)m->data);
      uVar157 = (undefined4)uVar37;
      uVar156 = (undefined4)(uVar37 >> 0x20);
      pfVar64 = (float *)(pMVar159->cstep * uVar37 * pMVar159->elemsize + (long)pMVar159->data);
      local_180 = auVar138._0_8_;
      afStack_178 = auVar138._8_8_;
      afStack_170 = auVar138._16_8_;
      afStack_168 = auVar138._24_8_;
      uStack_160 = auVar138._32_8_;
      uStack_158 = auVar138._40_8_;
      uStack_150 = auVar138._48_8_;
      uStack_148 = auVar138._56_8_;
      local_100[0] = local_180[0];
      local_100[1] = local_180[1];
      afStack_f8[0] = afStack_178[0];
      afStack_f8[1] = afStack_178[1];
      afStack_f0[0] = afStack_170[0];
      afStack_f0[1] = afStack_170[1];
      afStack_e8[0] = afStack_168[0];
      afStack_e8[1] = afStack_168[1];
      afStack_e0[0] = (float)uStack_160;
      afStack_e0[1] = uStack_160._4_4_;
      afStack_d8[0] = (float)uStack_158;
      afStack_d8[1] = uStack_158._4_4_;
      afStack_d0[0] = (float)uStack_150;
      afStack_d0[1] = uStack_150._4_4_;
      afStack_c8[0] = (float)uStack_148;
      afStack_c8[1] = uStack_148._4_4_;
      for (iVar61 = 0; iVar61 + 0xf < iVar47; iVar61 = iVar61 + 0x10) {
        uVar123 = *(undefined8 *)pfVar59;
        uVar122 = *(undefined8 *)(pfVar59 + 2);
        uVar121 = *(undefined8 *)(pfVar59 + 4);
        uVar125 = *(undefined8 *)(pfVar59 + 6);
        uVar126 = *(undefined8 *)(pfVar59 + 8);
        uVar127 = *(undefined8 *)(pfVar59 + 10);
        uVar128 = *(undefined8 *)(pfVar59 + 0xc);
        uVar129 = *(undefined8 *)(pfVar59 + 0xe);
        local_140 = *(__m512 *)pfVar59;
        BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16
                  ((binary_op_rpow *)&stack0xfffffffffffffe5f,&local_140,(__m512 *)local_100);
        *(undefined8 *)pfVar64 = uVar123;
        *(undefined8 *)(pfVar64 + 2) = uVar122;
        *(undefined8 *)(pfVar64 + 4) = uVar121;
        *(undefined8 *)(pfVar64 + 6) = uVar125;
        *(undefined8 *)(pfVar64 + 8) = uVar126;
        *(undefined8 *)(pfVar64 + 10) = uVar127;
        *(undefined8 *)(pfVar64 + 0xc) = uVar128;
        *(undefined8 *)(pfVar64 + 0xe) = uVar129;
        pfVar59 = pfVar59 + 0x10;
        pfVar64 = pfVar64 + 0x10;
      }
      local_140._0_32_ = auVar138._0_32_;
      for (; iVar61 + 7 < iVar47; iVar61 = iVar61 + 8) {
        uVar123 = *(undefined8 *)pfVar59;
        uVar122 = *(undefined8 *)(pfVar59 + 2);
        uVar121 = *(undefined8 *)(pfVar59 + 4);
        uVar125 = *(undefined8 *)(pfVar59 + 6);
        local_c0 = (binary_op_ratan2  [8])uVar123;
        afStack_b8 = (float  [2])uVar122;
        afStack_b0 = (float  [2])uVar121;
        afStack_a8._0_8_ = uVar125;
        BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8
                  ((binary_op_rpow *)&stack0xfffffffffffffe5f,(__m256 *)local_c0,(__m256 *)local_140
                  );
        *(undefined8 *)pfVar64 = uVar123;
        *(undefined8 *)(pfVar64 + 2) = uVar122;
        *(undefined8 *)(pfVar64 + 4) = uVar121;
        *(undefined8 *)(pfVar64 + 6) = uVar125;
        pfVar59 = pfVar59 + 8;
        pfVar64 = pfVar64 + 8;
      }
      local_c0 = (binary_op_ratan2  [8])local_180;
      afStack_b8[0] = afStack_178[0];
      afStack_b8[1] = afStack_178[1];
      for (; iVar61 + 3 < iVar47; iVar61 = iVar61 + 4) {
        local_90 = *(binary_op_ratan2 (*) [8])pfVar59;
        uVar123 = *(undefined8 *)(pfVar59 + 2);
        afStack_88._0_8_ = uVar123;
        afVar154 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                             ((binary_op_rpow *)&stack0xfffffffffffffe5f,(__m128 *)local_90,
                              (__m128 *)local_c0);
        *(long *)pfVar64 = afVar154._0_8_;
        *(undefined8 *)(pfVar64 + 2) = uVar123;
        pfVar59 = pfVar59 + 4;
        pfVar64 = pfVar64 + 4;
      }
      lVar63 = 0;
      for (; iVar61 < iVar47; iVar61 = iVar61 + 1) {
        fVar76 = powf(fVar77,*(float *)((long)pfVar59 + lVar63));
        *(float *)((long)pfVar64 + lVar63) = fVar76;
        lVar63 = lVar63 + 4;
      }
      uVar37 = CONCAT44(uVar156,uVar157) + 1;
    }
    goto switchD_0034de27_default;
  case 10:
    iVar61 = m->h * m->w * m->d * m->elempack;
    auVar138 = vbroadcastss_avx512f(auVar71);
    uVar37 = 0;
    uVar42 = (ulong)(uint)m->c;
    if (m->c < 1) {
      uVar42 = uVar37;
    }
    uVar157 = (undefined4)uVar42;
    fVar76 = 0.0;
    while (uVar37 != CONCAT44(fVar76,uVar157)) {
      pauVar68 = (undefined1 (*) [32])(m->cstep * uVar37 * m->elemsize + (long)m->data);
      uVar156 = (undefined4)uVar37;
      uVar158 = (undefined4)(uVar37 >> 0x20);
      puVar60 = (undefined8 *)(pMVar159->cstep * uVar37 * pMVar159->elemsize + (long)pMVar159->data)
      ;
      for (iVar44 = 0; iVar44 + 0xf < iVar61; iVar44 = iVar44 + 0x10) {
        uVar122 = *(undefined8 *)*pauVar68;
        uVar121 = *(undefined8 *)(*pauVar68 + 8);
        uVar125 = *(undefined8 *)(*pauVar68 + 0x10);
        uVar126 = *(undefined8 *)(*pauVar68 + 0x18);
        uVar127 = *(undefined8 *)pauVar68[1];
        uVar128 = *(undefined8 *)(pauVar68[1] + 8);
        uVar129 = *(undefined8 *)(pauVar68[1] + 0x10);
        uVar130 = *(undefined8 *)(pauVar68[1] + 0x18);
        vmovdqa64_avx512f(auVar138);
        y_01[4] = fVar77;
        y_01[0] = (float)in_stack_fffffffffffffe00._0_4_;
        y_01[1] = (float)in_stack_fffffffffffffe00._4_4_;
        y_01[2] = (float)in_stack_fffffffffffffe00._8_4_;
        y_01[3] = (float)in_stack_fffffffffffffe00._12_4_;
        y_01[5] = (float)uVar155;
        y_01[6] = (float)(int)uVar123;
        y_01[7] = (float)(int)((ulong)uVar123 >> 0x20);
        y_01[8] = (float)uVar156;
        y_01[9] = (float)uVar158;
        y_01._40_8_ = pMVar159;
        y_01[0xc] = (float)iVar47;
        y_01[0xd] = (float)uVar160;
        y_01[0xe] = (float)uVar157;
        y_01[0xf] = fVar76;
        x_00[2] = (float)(int)in_stack_fffffffffffffe48;
        x_00[3] = (float)(int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
        x_00._0_8_ = m;
        x_00[4] = (float)in_stack_fffffffffffffe50;
        x_00[5] = (float)in_stack_fffffffffffffe54;
        x_00[6] = (float)(int)in_stack_fffffffffffffe58;
        x_00[7] = (float)(int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
        x_00[8] = (float)in_stack_fffffffffffffe60;
        x_00[9] = (float)in_stack_fffffffffffffe64;
        x_00[10] = (float)in_stack_fffffffffffffe68;
        x_00[0xb] = (float)in_stack_fffffffffffffe6c;
        x_00[0xc] = (float)in_stack_fffffffffffffe70;
        x_00[0xd] = (float)in_stack_fffffffffffffe74;
        x_00[0xe] = (float)(int)in_stack_fffffffffffffe78;
        x_00[0xf] = (float)(int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
        atan2512_ps((__m512 *)pbVar51,y_01,x_00);
        *puVar60 = uVar122;
        puVar60[1] = uVar121;
        puVar60[2] = uVar125;
        puVar60[3] = uVar126;
        puVar60[4] = uVar127;
        puVar60[5] = uVar128;
        puVar60[6] = uVar129;
        puVar60[7] = uVar130;
        pauVar68 = pauVar68 + 2;
        puVar60 = puVar60 + 8;
      }
      local_180 = auVar138._0_8_;
      afStack_178 = auVar138._8_8_;
      afStack_170 = auVar138._16_8_;
      afStack_168 = auVar138._24_8_;
      local_100[0] = local_180[0];
      local_100[1] = local_180[1];
      afStack_f8[0] = afStack_178[0];
      afStack_f8[1] = afStack_178[1];
      afStack_f0[0] = afStack_170[0];
      afStack_f0[1] = afStack_170[1];
      afStack_e8[0] = afStack_168[0];
      afStack_e8[1] = afStack_168[1];
      for (; iVar44 + 7 < iVar61; iVar44 = iVar44 + 8) {
        uVar122 = *(undefined8 *)*pauVar68;
        uVar121 = *(undefined8 *)(*pauVar68 + 8);
        uVar125 = *(undefined8 *)(*pauVar68 + 0x10);
        uVar126 = *(undefined8 *)(*pauVar68 + 0x18);
        local_140._0_32_ = *pauVar68;
        pbVar51 = local_90;
        BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack8
                  ((binary_op_atan2 *)local_90,(__m256 *)local_140,(__m256 *)local_100);
        *puVar60 = uVar122;
        puVar60[1] = uVar121;
        puVar60[2] = uVar125;
        puVar60[3] = uVar126;
        pauVar68 = pauVar68 + 1;
        puVar60 = puVar60 + 4;
      }
      local_140._0_16_ = auVar138._0_16_;
      for (; iVar44 + 3 < iVar61; iVar44 = iVar44 + 4) {
        local_c0 = *(binary_op_ratan2 (*) [8])*pauVar68;
        uVar122 = *(undefined8 *)(*pauVar68 + 8);
        pbVar51 = local_90;
        afStack_b8 = (float  [2])uVar122;
        afVar154 = BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack4
                             ((binary_op_atan2 *)local_90,(__m128 *)local_c0,(__m128 *)local_140);
        *puVar60 = afVar154._0_8_;
        puVar60[1] = uVar122;
        pauVar68 = (undefined1 (*) [32])(*pauVar68 + 0x10);
        puVar60 = puVar60 + 2;
      }
      lVar63 = 0;
      for (; iVar44 < iVar61; iVar44 = iVar44 + 1) {
        fVar75 = atan2f(*(float *)(*pauVar68 + lVar63),fVar77);
        *(float *)((long)puVar60 + lVar63) = fVar75;
        lVar63 = lVar63 + 4;
      }
      uVar37 = CONCAT44(uVar158,uVar156) + 1;
    }
    goto switchD_0034de27_default;
  case 0xb:
    iVar61 = m->h * m->w * m->d * m->elempack;
    auVar138 = vbroadcastss_avx512f(ZEXT416((uint)fVar77));
    uVar37 = 0;
    uVar42 = (ulong)(uint)m->c;
    if (m->c < 1) {
      uVar42 = uVar37;
    }
    uVar157 = (undefined4)uVar42;
    fVar76 = 0.0;
    while (uVar37 != CONCAT44(fVar76,uVar157)) {
      pauVar67 = (undefined1 (*) [64])(m->cstep * uVar37 * m->elemsize + (long)m->data);
      uVar156 = (undefined4)uVar37;
      uVar158 = (undefined4)(uVar37 >> 0x20);
      pfVar59 = (float *)(pMVar159->cstep * uVar37 * pMVar159->elemsize + (long)pMVar159->data);
      iVar44 = 0;
      while( true ) {
        local_180 = auVar138._0_8_;
        afStack_178 = auVar138._8_8_;
        afStack_170 = auVar138._16_8_;
        afStack_168 = auVar138._24_8_;
        if (iVar61 <= iVar44 + 0xf) break;
        vmovdqu64_avx512f(*pauVar67);
        uStack_160 = auVar138._32_8_;
        uStack_158 = auVar138._40_8_;
        uStack_150 = auVar138._48_8_;
        uStack_148 = auVar138._56_8_;
        y_00[4] = fVar77;
        y_00[0] = (float)in_stack_fffffffffffffe00._0_4_;
        y_00[1] = (float)in_stack_fffffffffffffe00._4_4_;
        y_00[2] = (float)in_stack_fffffffffffffe00._8_4_;
        y_00[3] = (float)in_stack_fffffffffffffe00._12_4_;
        y_00[5] = (float)uVar155;
        y_00[6] = (float)(int)uVar123;
        y_00[7] = (float)(int)((ulong)uVar123 >> 0x20);
        y_00[8] = (float)uVar156;
        y_00[9] = (float)uVar158;
        y_00._40_8_ = pMVar159;
        y_00[0xc] = (float)iVar47;
        y_00[0xd] = (float)uVar160;
        y_00[0xe] = (float)uVar157;
        y_00[0xf] = fVar76;
        x[2] = (float)(int)in_stack_fffffffffffffe48;
        x[3] = (float)(int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
        x._0_8_ = m;
        x[4] = (float)in_stack_fffffffffffffe50;
        x[5] = (float)in_stack_fffffffffffffe54;
        x[6] = (float)(int)in_stack_fffffffffffffe58;
        x[7] = (float)(int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
        x[8] = (float)in_stack_fffffffffffffe60;
        x[9] = (float)in_stack_fffffffffffffe64;
        x[10] = (float)in_stack_fffffffffffffe68;
        x[0xb] = (float)in_stack_fffffffffffffe6c;
        x[0xc] = (float)in_stack_fffffffffffffe70;
        x[0xd] = (float)in_stack_fffffffffffffe74;
        x[0xe] = (float)(int)in_stack_fffffffffffffe78;
        x[0xf] = (float)(int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
        atan2512_ps((__m512 *)pbVar51,y_00,x);
        *(float (*) [2])pfVar59 = local_180;
        *(float (*) [2])(pfVar59 + 2) = afStack_178;
        *(float (*) [2])(pfVar59 + 4) = afStack_170;
        *(float (*) [2])(pfVar59 + 6) = afStack_168;
        *(undefined8 *)(pfVar59 + 8) = uStack_160;
        *(undefined8 *)(pfVar59 + 10) = uStack_158;
        *(undefined8 *)(pfVar59 + 0xc) = uStack_150;
        *(undefined8 *)(pfVar59 + 0xe) = uStack_148;
        pauVar67 = pauVar67 + 1;
        pfVar59 = pfVar59 + 0x10;
        iVar44 = iVar44 + 0x10;
      }
      local_100[0] = local_180[0];
      local_100[1] = local_180[1];
      afStack_f8[0] = afStack_178[0];
      afStack_f8[1] = afStack_178[1];
      afStack_f0[0] = afStack_170[0];
      afStack_f0[1] = afStack_170[1];
      afStack_e8[0] = afStack_168[0];
      afStack_e8[1] = afStack_168[1];
      for (; iVar44 + 7 < iVar61; iVar44 = iVar44 + 8) {
        uVar122 = *(undefined8 *)*pauVar67;
        uVar121 = *(undefined8 *)(*pauVar67 + 8);
        uVar125 = *(undefined8 *)(*pauVar67 + 0x10);
        uVar126 = *(undefined8 *)(*pauVar67 + 0x18);
        local_140._0_32_ = *(undefined1 (*) [32])*pauVar67;
        pbVar51 = local_90;
        BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack8
                  (local_90,(__m256 *)local_140,(__m256 *)local_100);
        *(undefined8 *)pfVar59 = uVar122;
        *(undefined8 *)(pfVar59 + 2) = uVar121;
        *(undefined8 *)(pfVar59 + 4) = uVar125;
        *(undefined8 *)(pfVar59 + 6) = uVar126;
        pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x20);
        pfVar59 = pfVar59 + 8;
      }
      local_140._0_16_ = auVar138._0_16_;
      for (; iVar44 + 3 < iVar61; iVar44 = iVar44 + 4) {
        local_c0 = *(binary_op_ratan2 (*) [8])*pauVar67;
        uVar122 = *(undefined8 *)(*pauVar67 + 8);
        pbVar51 = local_90;
        afStack_b8 = (float  [2])uVar122;
        afVar154 = BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack4
                             (local_90,(__m128 *)local_c0,(__m128 *)local_140);
        *(long *)pfVar59 = afVar154._0_8_;
        *(undefined8 *)(pfVar59 + 2) = uVar122;
        pauVar67 = (undefined1 (*) [64])(*pauVar67 + 0x10);
        pfVar59 = pfVar59 + 4;
      }
      lVar63 = 0;
      for (; iVar44 < iVar61; iVar44 = iVar44 + 1) {
        fVar75 = atan2f(fVar77,*(float *)(*pauVar67 + lVar63));
        *(float *)((long)pfVar59 + lVar63) = fVar75;
        lVar63 = lVar63 + 4;
      }
      uVar37 = CONCAT44(uVar158,uVar156) + 1;
    }
switchD_0034de27_default:
  }
  return 0;
}

Assistant:

int BinaryOp_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const bool b_is_scalar = bottom_blobs[1].w * bottom_blobs[1].h * bottom_blobs[1].d * bottom_blobs[1].c * bottom_blobs[1].elempack == 1;
    const bool a_rank_is_lower = bottom_blobs[0].dims < bottom_blobs[1].dims && !b_is_scalar;
    const bool a_size_is_lower = bottom_blobs[0].w * bottom_blobs[0].h * bottom_blobs[0].d * bottom_blobs[0].c * bottom_blobs[0].elempack < bottom_blobs[1].w * bottom_blobs[1].h * bottom_blobs[1].d * bottom_blobs[1].c * bottom_blobs[1].elempack;
    const bool a_is_lower = a_rank_is_lower || (!a_rank_is_lower && a_size_is_lower);
    const Mat& A = a_is_lower ? bottom_blobs[1] : bottom_blobs[0];
    const Mat& B = a_is_lower ? bottom_blobs[0] : bottom_blobs[1];
    const int op_type_r = a_is_lower ? get_reverse_op_type(op_type) : op_type;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(A, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // B is a scalar
    if (B.w * B.h * B.d * B.c * B.elempack == 1)
    {
        return binary_op_scalar(A, B[0], top_blob, op_type_r, opt);
    }

    // no broadcast
    if (A.dims == B.dims && A.w == B.w && A.h == B.h && A.d == B.d && A.c == B.c && A.elempack == B.elempack)
    {
        return binary_op_no_broadcast(A, B, top_blob, op_type_r, opt);
    }

    // broadcast B for inner axis
    if ((B.dims < A.dims)
            || (A.dims == 2 && B.w == 1 && B.h == A.h)
            || (A.dims == 3 && B.w == 1 && B.h == 1 && B.c == A.c)
            || (A.dims == 3 && B.w == 1 && B.h == A.h && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == 1 && B.d == 1 && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == 1 && B.d == A.d && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == A.h && B.d == A.d && B.c == A.c))
    {
        return binary_op_broadcast_inner(A, B, top_blob, op_type_r, opt);
    }

    // broadcast B for outer axis
    if (B.elempack == 1 && ((A.dims == 2 && B.w == A.w && B.h == 1) || (A.dims == 3 && B.w == A.w && B.h == 1 && B.c == 1) || (A.dims == 3 && B.w == A.w && B.h == A.h && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == 1 && B.d == 1 && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == A.h && B.d == 1 && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == A.h && B.d == A.d && B.c == 1)))
    {
        return binary_op_broadcast_outer(A, B, top_blob, op_type_r, opt);
    }

    // some special broadcast rule here
    if (A.dims == 3 && B.dims == 3 && A.w == B.w && B.h == 1 && A.c == B.c)
    {
        return binary_op_broadcast_20(A, B, top_blob, op_type_r, opt);
    }

    return 0;
}